

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Primitive PVar26;
  Geometry *pGVar27;
  __int_type_conflict _Var28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  uint uVar101;
  uint uVar102;
  ulong uVar103;
  undefined1 (*pauVar104) [32];
  uint uVar105;
  uint uVar106;
  uint uVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  int iVar111;
  ulong uVar112;
  __m128 a;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar123 [16];
  undefined1 auVar136 [32];
  float fVar162;
  float fVar163;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar164;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar167;
  float fVar168;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar165;
  float fVar166;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar173 [16];
  float fVar169;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar193;
  float fVar196;
  float fVar202;
  float fVar205;
  float fVar208;
  undefined1 auVar181 [32];
  float fVar211;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar174 [16];
  undefined1 auVar184 [32];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar194;
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar212;
  float fVar213;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar177 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar214;
  float fVar238;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [28];
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar241;
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar242;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar243;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar267;
  undefined1 auVar255 [28];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar268;
  float fVar278;
  float fVar279;
  undefined1 auVar269 [16];
  float fVar280;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar284;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar295;
  float fVar296;
  float fVar298;
  float fVar300;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar297;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar299;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar314;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar315;
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar322 [28];
  float fVar332;
  float fVar335;
  float fVar338;
  float fVar341;
  float fVar344;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  float fVar333;
  float fVar334;
  float fVar336;
  float fVar337;
  float fVar339;
  float fVar340;
  float fVar342;
  float fVar343;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar329 [32];
  undefined1 auVar328 [32];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  float s;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar359;
  float fVar362;
  float fVar366;
  float fVar370;
  float fVar374;
  float fVar378;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar360;
  float fVar361;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  undefined1 auVar358 [32];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar396;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [64];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar407;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [64];
  float fVar408;
  float fVar409;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar420;
  float fVar421;
  float fVar422;
  float in_register_0000151c;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar419;
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  float fVar423;
  float fVar424;
  float fVar431;
  float fVar433;
  float fVar435;
  float fVar437;
  float fVar439;
  float fVar441;
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  float fVar432;
  float fVar434;
  float fVar436;
  float fVar438;
  float fVar440;
  undefined1 auVar429 [32];
  undefined1 auVar430 [64];
  float fVar442;
  float fVar447;
  float fVar448;
  float fVar449;
  float fVar450;
  float fVar451;
  float fVar452;
  float in_register_0000159c;
  undefined1 auVar443 [32];
  float fVar453;
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  float fVar454;
  float fVar455;
  float fVar456;
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b0c;
  float local_b00;
  RTCFilterFunctionNArguments local_a58;
  int local_a24;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  undefined1 auStack_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [32];
  undefined8 local_8d0;
  float local_8c8;
  float local_8c4;
  undefined4 local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint local_8b0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [32];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_750 [16];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar26 = prim[1];
  uVar103 = (ulong)(byte)PVar26;
  lVar108 = uVar103 * 0x25;
  fVar214 = *(float *)(prim + lVar108 + 0x12);
  auVar225 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar108 + 6));
  auVar269._0_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar269._4_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar269._8_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar269._12_4_ = fVar214 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 6)));
  auVar137._0_4_ = fVar214 * auVar225._0_4_;
  auVar137._4_4_ = fVar214 * auVar225._4_4_;
  auVar137._8_4_ = fVar214 * auVar225._8_4_;
  auVar137._12_4_ = fVar214 * auVar225._12_4_;
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 10)));
  auVar124._16_16_ = auVar225;
  auVar124._0_16_ = auVar301;
  auVar124 = vcvtdq2ps_avx(auVar124);
  lVar29 = uVar103 * 5;
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar29 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar29 + 10)));
  auVar181._16_16_ = auVar225;
  auVar181._0_16_ = auVar301;
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 10)));
  auVar185 = vcvtdq2ps_avx(auVar181);
  auVar229._16_16_ = auVar225;
  auVar229._0_16_ = auVar301;
  auVar31 = vcvtdq2ps_avx(auVar229);
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 10)));
  auVar230._16_16_ = auVar225;
  auVar230._0_16_ = auVar301;
  auVar32 = vcvtdq2ps_avx(auVar230);
  lVar110 = (ulong)(byte)PVar26 * 0x10;
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + 10)));
  auVar288._16_16_ = auVar225;
  auVar288._0_16_ = auVar301;
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + uVar103 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar288);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar110 + uVar103 + 10)));
  auVar303._16_16_ = auVar225;
  auVar303._0_16_ = auVar301;
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 6)));
  auVar34 = vcvtdq2ps_avx(auVar303);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 10)));
  auVar304._16_16_ = auVar225;
  auVar304._0_16_ = auVar301;
  auVar35 = vcvtdq2ps_avx(auVar304);
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 10)));
  auVar354._16_16_ = auVar225;
  auVar354._0_16_ = auVar301;
  auVar301 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 6)));
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 10)));
  auVar36 = vcvtdq2ps_avx(auVar354);
  auVar385._16_16_ = auVar225;
  auVar385._0_16_ = auVar301;
  auVar37 = vcvtdq2ps_avx(auVar385);
  auVar301 = vshufps_avx(auVar269,auVar269,0);
  auVar225 = vshufps_avx(auVar269,auVar269,0x55);
  auVar250 = vshufps_avx(auVar269,auVar269,0xaa);
  fVar214 = auVar250._0_4_;
  fVar162 = auVar250._4_4_;
  fVar237 = auVar250._8_4_;
  fVar166 = auVar250._12_4_;
  fVar211 = auVar225._0_4_;
  fVar170 = auVar225._4_4_;
  fVar238 = auVar225._8_4_;
  fVar167 = auVar225._12_4_;
  fVar239 = auVar301._0_4_;
  fVar240 = auVar301._4_4_;
  fVar241 = auVar301._8_4_;
  fVar243 = auVar301._12_4_;
  auVar410._0_4_ = fVar239 * auVar124._0_4_ + fVar211 * auVar185._0_4_ + fVar214 * auVar31._0_4_;
  auVar410._4_4_ = fVar240 * auVar124._4_4_ + fVar170 * auVar185._4_4_ + fVar162 * auVar31._4_4_;
  auVar410._8_4_ = fVar241 * auVar124._8_4_ + fVar238 * auVar185._8_4_ + fVar237 * auVar31._8_4_;
  auVar410._12_4_ = fVar243 * auVar124._12_4_ + fVar167 * auVar185._12_4_ + fVar166 * auVar31._12_4_
  ;
  auVar410._16_4_ = fVar239 * auVar124._16_4_ + fVar211 * auVar185._16_4_ + fVar214 * auVar31._16_4_
  ;
  auVar410._20_4_ = fVar240 * auVar124._20_4_ + fVar170 * auVar185._20_4_ + fVar162 * auVar31._20_4_
  ;
  auVar410._24_4_ = fVar241 * auVar124._24_4_ + fVar238 * auVar185._24_4_ + fVar237 * auVar31._24_4_
  ;
  auVar410._28_4_ = fVar167 + in_register_000015dc + in_register_0000151c;
  auVar397._0_4_ = fVar239 * auVar32._0_4_ + fVar211 * auVar33._0_4_ + auVar34._0_4_ * fVar214;
  auVar397._4_4_ = fVar240 * auVar32._4_4_ + fVar170 * auVar33._4_4_ + auVar34._4_4_ * fVar162;
  auVar397._8_4_ = fVar241 * auVar32._8_4_ + fVar238 * auVar33._8_4_ + auVar34._8_4_ * fVar237;
  auVar397._12_4_ = fVar243 * auVar32._12_4_ + fVar167 * auVar33._12_4_ + auVar34._12_4_ * fVar166;
  auVar397._16_4_ = fVar239 * auVar32._16_4_ + fVar211 * auVar33._16_4_ + auVar34._16_4_ * fVar214;
  auVar397._20_4_ = fVar240 * auVar32._20_4_ + fVar170 * auVar33._20_4_ + auVar34._20_4_ * fVar162;
  auVar397._24_4_ = fVar241 * auVar32._24_4_ + fVar238 * auVar33._24_4_ + auVar34._24_4_ * fVar237;
  auVar397._28_4_ = fVar167 + in_register_000015dc + in_register_0000159c;
  auVar274._0_4_ = fVar239 * auVar35._0_4_ + fVar211 * auVar36._0_4_ + auVar37._0_4_ * fVar214;
  auVar274._4_4_ = fVar240 * auVar35._4_4_ + fVar170 * auVar36._4_4_ + auVar37._4_4_ * fVar162;
  auVar274._8_4_ = fVar241 * auVar35._8_4_ + fVar238 * auVar36._8_4_ + auVar37._8_4_ * fVar237;
  auVar274._12_4_ = fVar243 * auVar35._12_4_ + fVar167 * auVar36._12_4_ + auVar37._12_4_ * fVar166;
  auVar274._16_4_ = fVar239 * auVar35._16_4_ + fVar211 * auVar36._16_4_ + auVar37._16_4_ * fVar214;
  auVar274._20_4_ = fVar240 * auVar35._20_4_ + fVar170 * auVar36._20_4_ + auVar37._20_4_ * fVar162;
  auVar274._24_4_ = fVar241 * auVar35._24_4_ + fVar238 * auVar36._24_4_ + auVar37._24_4_ * fVar237;
  auVar274._28_4_ = fVar243 + fVar167 + fVar166;
  auVar301 = vshufps_avx(auVar137,auVar137,0);
  auVar225 = vshufps_avx(auVar137,auVar137,0x55);
  auVar250 = vshufps_avx(auVar137,auVar137,0xaa);
  fVar214 = auVar250._0_4_;
  fVar162 = auVar250._4_4_;
  fVar237 = auVar250._8_4_;
  fVar166 = auVar250._12_4_;
  fVar240 = auVar225._0_4_;
  fVar241 = auVar225._4_4_;
  fVar243 = auVar225._8_4_;
  fVar261 = auVar225._12_4_;
  fVar211 = auVar185._28_4_ + auVar31._28_4_;
  fVar170 = auVar301._0_4_;
  fVar238 = auVar301._4_4_;
  fVar167 = auVar301._8_4_;
  fVar239 = auVar301._12_4_;
  auVar151._0_4_ = fVar170 * auVar124._0_4_ + fVar240 * auVar185._0_4_ + fVar214 * auVar31._0_4_;
  auVar151._4_4_ = fVar238 * auVar124._4_4_ + fVar241 * auVar185._4_4_ + fVar162 * auVar31._4_4_;
  auVar151._8_4_ = fVar167 * auVar124._8_4_ + fVar243 * auVar185._8_4_ + fVar237 * auVar31._8_4_;
  auVar151._12_4_ = fVar239 * auVar124._12_4_ + fVar261 * auVar185._12_4_ + fVar166 * auVar31._12_4_
  ;
  auVar151._16_4_ = fVar170 * auVar124._16_4_ + fVar240 * auVar185._16_4_ + fVar214 * auVar31._16_4_
  ;
  auVar151._20_4_ = fVar238 * auVar124._20_4_ + fVar241 * auVar185._20_4_ + fVar162 * auVar31._20_4_
  ;
  auVar151._24_4_ = fVar167 * auVar124._24_4_ + fVar243 * auVar185._24_4_ + fVar237 * auVar31._24_4_
  ;
  auVar151._28_4_ = auVar124._28_4_ + fVar211;
  auVar125._0_4_ = fVar170 * auVar32._0_4_ + auVar34._0_4_ * fVar214 + fVar240 * auVar33._0_4_;
  auVar125._4_4_ = fVar238 * auVar32._4_4_ + auVar34._4_4_ * fVar162 + fVar241 * auVar33._4_4_;
  auVar125._8_4_ = fVar167 * auVar32._8_4_ + auVar34._8_4_ * fVar237 + fVar243 * auVar33._8_4_;
  auVar125._12_4_ = fVar239 * auVar32._12_4_ + auVar34._12_4_ * fVar166 + fVar261 * auVar33._12_4_;
  auVar125._16_4_ = fVar170 * auVar32._16_4_ + auVar34._16_4_ * fVar214 + fVar240 * auVar33._16_4_;
  auVar125._20_4_ = fVar238 * auVar32._20_4_ + auVar34._20_4_ * fVar162 + fVar241 * auVar33._20_4_;
  auVar125._24_4_ = fVar167 * auVar32._24_4_ + auVar34._24_4_ * fVar237 + fVar243 * auVar33._24_4_;
  auVar125._28_4_ = auVar124._28_4_ + auVar34._28_4_ + auVar31._28_4_;
  auVar305._8_4_ = 0x7fffffff;
  auVar305._0_8_ = 0x7fffffff7fffffff;
  auVar305._12_4_ = 0x7fffffff;
  auVar305._16_4_ = 0x7fffffff;
  auVar305._20_4_ = 0x7fffffff;
  auVar305._24_4_ = 0x7fffffff;
  auVar305._28_4_ = 0x7fffffff;
  auVar323._8_4_ = 0x219392ef;
  auVar323._0_8_ = 0x219392ef219392ef;
  auVar323._12_4_ = 0x219392ef;
  auVar323._16_4_ = 0x219392ef;
  auVar323._20_4_ = 0x219392ef;
  auVar323._24_4_ = 0x219392ef;
  auVar323._28_4_ = 0x219392ef;
  auVar124 = vandps_avx(auVar410,auVar305);
  auVar124 = vcmpps_avx(auVar124,auVar323,1);
  auVar185 = vblendvps_avx(auVar410,auVar323,auVar124);
  auVar124 = vandps_avx(auVar397,auVar305);
  auVar124 = vcmpps_avx(auVar124,auVar323,1);
  auVar31 = vblendvps_avx(auVar397,auVar323,auVar124);
  auVar124 = vandps_avx(auVar274,auVar305);
  auVar124 = vcmpps_avx(auVar124,auVar323,1);
  auVar124 = vblendvps_avx(auVar274,auVar323,auVar124);
  auVar182._0_4_ = fVar170 * auVar35._0_4_ + fVar240 * auVar36._0_4_ + auVar37._0_4_ * fVar214;
  auVar182._4_4_ = fVar238 * auVar35._4_4_ + fVar241 * auVar36._4_4_ + auVar37._4_4_ * fVar162;
  auVar182._8_4_ = fVar167 * auVar35._8_4_ + fVar243 * auVar36._8_4_ + auVar37._8_4_ * fVar237;
  auVar182._12_4_ = fVar239 * auVar35._12_4_ + fVar261 * auVar36._12_4_ + auVar37._12_4_ * fVar166;
  auVar182._16_4_ = fVar170 * auVar35._16_4_ + fVar240 * auVar36._16_4_ + auVar37._16_4_ * fVar214;
  auVar182._20_4_ = fVar238 * auVar35._20_4_ + fVar241 * auVar36._20_4_ + auVar37._20_4_ * fVar162;
  auVar182._24_4_ = fVar167 * auVar35._24_4_ + fVar243 * auVar36._24_4_ + auVar37._24_4_ * fVar237;
  auVar182._28_4_ = fVar211 + auVar33._28_4_ + fVar166;
  auVar32 = vrcpps_avx(auVar185);
  fVar214 = auVar32._0_4_;
  fVar237 = auVar32._4_4_;
  auVar33._4_4_ = auVar185._4_4_ * fVar237;
  auVar33._0_4_ = auVar185._0_4_ * fVar214;
  fVar211 = auVar32._8_4_;
  auVar33._8_4_ = auVar185._8_4_ * fVar211;
  fVar238 = auVar32._12_4_;
  auVar33._12_4_ = auVar185._12_4_ * fVar238;
  fVar239 = auVar32._16_4_;
  auVar33._16_4_ = auVar185._16_4_ * fVar239;
  fVar240 = auVar32._20_4_;
  auVar33._20_4_ = auVar185._20_4_ * fVar240;
  fVar241 = auVar32._24_4_;
  auVar33._24_4_ = auVar185._24_4_ * fVar241;
  auVar33._28_4_ = auVar185._28_4_;
  auVar324._8_4_ = 0x3f800000;
  auVar324._0_8_ = 0x3f8000003f800000;
  auVar324._12_4_ = 0x3f800000;
  auVar324._16_4_ = 0x3f800000;
  auVar324._20_4_ = 0x3f800000;
  auVar324._24_4_ = 0x3f800000;
  auVar324._28_4_ = 0x3f800000;
  auVar34 = vsubps_avx(auVar324,auVar33);
  auVar33 = vrcpps_avx(auVar31);
  fVar214 = fVar214 + fVar214 * auVar34._0_4_;
  fVar237 = fVar237 + fVar237 * auVar34._4_4_;
  fVar211 = fVar211 + fVar211 * auVar34._8_4_;
  fVar238 = fVar238 + fVar238 * auVar34._12_4_;
  fVar239 = fVar239 + fVar239 * auVar34._16_4_;
  fVar240 = fVar240 + fVar240 * auVar34._20_4_;
  fVar241 = fVar241 + fVar241 * auVar34._24_4_;
  fVar243 = auVar33._0_4_;
  fVar261 = auVar33._4_4_;
  auVar185._4_4_ = fVar261 * auVar31._4_4_;
  auVar185._0_4_ = fVar243 * auVar31._0_4_;
  fVar262 = auVar33._8_4_;
  auVar185._8_4_ = fVar262 * auVar31._8_4_;
  fVar263 = auVar33._12_4_;
  auVar185._12_4_ = fVar263 * auVar31._12_4_;
  fVar264 = auVar33._16_4_;
  auVar185._16_4_ = fVar264 * auVar31._16_4_;
  fVar265 = auVar33._20_4_;
  auVar185._20_4_ = fVar265 * auVar31._20_4_;
  fVar266 = auVar33._24_4_;
  auVar185._24_4_ = fVar266 * auVar31._24_4_;
  auVar185._28_4_ = auVar31._28_4_;
  auVar31 = vsubps_avx(auVar324,auVar185);
  fVar243 = fVar243 + fVar243 * auVar31._0_4_;
  fVar261 = fVar261 + fVar261 * auVar31._4_4_;
  fVar262 = fVar262 + fVar262 * auVar31._8_4_;
  fVar263 = fVar263 + fVar263 * auVar31._12_4_;
  fVar264 = fVar264 + fVar264 * auVar31._16_4_;
  fVar265 = fVar265 + fVar265 * auVar31._20_4_;
  fVar266 = fVar266 + fVar266 * auVar31._24_4_;
  auVar185 = vrcpps_avx(auVar124);
  fVar268 = auVar185._0_4_;
  fVar278 = auVar185._4_4_;
  auVar35._4_4_ = fVar278 * auVar124._4_4_;
  auVar35._0_4_ = fVar268 * auVar124._0_4_;
  fVar279 = auVar185._8_4_;
  auVar35._8_4_ = fVar279 * auVar124._8_4_;
  fVar280 = auVar185._12_4_;
  auVar35._12_4_ = fVar280 * auVar124._12_4_;
  fVar281 = auVar185._16_4_;
  auVar35._16_4_ = fVar281 * auVar124._16_4_;
  fVar282 = auVar185._20_4_;
  auVar35._20_4_ = fVar282 * auVar124._20_4_;
  fVar283 = auVar185._24_4_;
  auVar35._24_4_ = fVar283 * auVar124._24_4_;
  auVar35._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar324,auVar35);
  fVar268 = fVar268 + fVar268 * auVar124._0_4_;
  fVar278 = fVar278 + fVar278 * auVar124._4_4_;
  fVar279 = fVar279 + fVar279 * auVar124._8_4_;
  fVar280 = fVar280 + fVar280 * auVar124._12_4_;
  fVar281 = fVar281 + fVar281 * auVar124._16_4_;
  fVar282 = fVar282 + fVar282 * auVar124._20_4_;
  fVar283 = fVar283 + fVar283 * auVar124._24_4_;
  auVar301 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar108 + 0x16)) * *(float *)(prim + lVar108 + 0x1a)))
  ;
  auVar120 = vshufps_avx(auVar301,auVar301,0);
  auVar301._8_8_ = 0;
  auVar301._0_8_ = *(ulong *)(prim + uVar103 * 7 + 6);
  auVar301 = vpmovsxwd_avx(auVar301);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar103 * 7 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar225);
  auVar306._16_16_ = auVar225;
  auVar306._0_16_ = auVar301;
  auVar124 = vcvtdq2ps_avx(auVar306);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar301 = vpmovsxwd_avx(auVar250);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 0xe);
  auVar225 = vpmovsxwd_avx(auVar146);
  auVar325._16_16_ = auVar225;
  auVar325._0_16_ = auVar301;
  auVar185 = vcvtdq2ps_avx(auVar325);
  auVar185 = vsubps_avx(auVar185,auVar124);
  fVar162 = auVar120._0_4_;
  fVar166 = auVar120._4_4_;
  fVar170 = auVar120._8_4_;
  fVar167 = auVar120._12_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar103 * 9 + 6);
  auVar301 = vpmovsxwd_avx(auVar120);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar103 * 9 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar116);
  auVar307._0_4_ = auVar185._0_4_ * fVar162 + auVar124._0_4_;
  auVar307._4_4_ = auVar185._4_4_ * fVar166 + auVar124._4_4_;
  auVar307._8_4_ = auVar185._8_4_ * fVar170 + auVar124._8_4_;
  auVar307._12_4_ = auVar185._12_4_ * fVar167 + auVar124._12_4_;
  auVar307._16_4_ = auVar185._16_4_ * fVar162 + auVar124._16_4_;
  auVar307._20_4_ = auVar185._20_4_ * fVar166 + auVar124._20_4_;
  auVar307._24_4_ = auVar185._24_4_ * fVar170 + auVar124._24_4_;
  auVar307._28_4_ = auVar185._28_4_ + auVar124._28_4_;
  auVar326._16_16_ = auVar225;
  auVar326._0_16_ = auVar301;
  auVar124 = vcvtdq2ps_avx(auVar326);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar301 = vpmovsxwd_avx(auVar145);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 0xe);
  auVar225 = vpmovsxwd_avx(auVar140);
  auVar355._16_16_ = auVar225;
  auVar355._0_16_ = auVar301;
  auVar185 = vcvtdq2ps_avx(auVar355);
  auVar185 = vsubps_avx(auVar185,auVar124);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar301 = vpmovsxwd_avx(auVar122);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar118);
  auVar327._0_4_ = auVar124._0_4_ + auVar185._0_4_ * fVar162;
  auVar327._4_4_ = auVar124._4_4_ + auVar185._4_4_ * fVar166;
  auVar327._8_4_ = auVar124._8_4_ + auVar185._8_4_ * fVar170;
  auVar327._12_4_ = auVar124._12_4_ + auVar185._12_4_ * fVar167;
  auVar327._16_4_ = auVar124._16_4_ + auVar185._16_4_ * fVar162;
  auVar327._20_4_ = auVar124._20_4_ + auVar185._20_4_ * fVar166;
  auVar327._24_4_ = auVar124._24_4_ + auVar185._24_4_ * fVar170;
  auVar327._28_4_ = auVar124._28_4_ + auVar185._28_4_;
  auVar356._16_16_ = auVar225;
  auVar356._0_16_ = auVar301;
  auVar124 = vcvtdq2ps_avx(auVar356);
  uVar112 = (ulong)(uint)((int)lVar29 << 2);
  lVar108 = uVar103 * 2 + uVar112;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar108 + 6);
  auVar301 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar108 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar13);
  auVar386._16_16_ = auVar225;
  auVar386._0_16_ = auVar301;
  auVar185 = vcvtdq2ps_avx(auVar386);
  auVar185 = vsubps_avx(auVar185,auVar124);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar112 + 6);
  auVar301 = vpmovsxwd_avx(auVar14);
  auVar357._0_4_ = auVar124._0_4_ + auVar185._0_4_ * fVar162;
  auVar357._4_4_ = auVar124._4_4_ + auVar185._4_4_ * fVar166;
  auVar357._8_4_ = auVar124._8_4_ + auVar185._8_4_ * fVar170;
  auVar357._12_4_ = auVar124._12_4_ + auVar185._12_4_ * fVar167;
  auVar357._16_4_ = auVar124._16_4_ + auVar185._16_4_ * fVar162;
  auVar357._20_4_ = auVar124._20_4_ + auVar185._20_4_ * fVar166;
  auVar357._24_4_ = auVar124._24_4_ + auVar185._24_4_ * fVar170;
  auVar357._28_4_ = auVar124._28_4_ + auVar185._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar112 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar15);
  auVar387._16_16_ = auVar225;
  auVar387._0_16_ = auVar301;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 6);
  auVar301 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar17);
  auVar124 = vcvtdq2ps_avx(auVar387);
  auVar398._16_16_ = auVar225;
  auVar398._0_16_ = auVar301;
  auVar185 = vcvtdq2ps_avx(auVar398);
  auVar185 = vsubps_avx(auVar185,auVar124);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 6);
  auVar301 = vpmovsxwd_avx(auVar18);
  auVar388._0_4_ = auVar124._0_4_ + auVar185._0_4_ * fVar162;
  auVar388._4_4_ = auVar124._4_4_ + auVar185._4_4_ * fVar166;
  auVar388._8_4_ = auVar124._8_4_ + auVar185._8_4_ * fVar170;
  auVar388._12_4_ = auVar124._12_4_ + auVar185._12_4_ * fVar167;
  auVar388._16_4_ = auVar124._16_4_ + auVar185._16_4_ * fVar162;
  auVar388._20_4_ = auVar124._20_4_ + auVar185._20_4_ * fVar166;
  auVar388._24_4_ = auVar124._24_4_ + auVar185._24_4_ * fVar170;
  auVar388._28_4_ = auVar124._28_4_ + auVar185._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 0xe);
  auVar225 = vpmovsxwd_avx(auVar19);
  lVar108 = uVar103 + (ulong)(byte)PVar26 * 0x20;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar108 + 6);
  auVar250 = vpmovsxwd_avx(auVar20);
  auVar399._16_16_ = auVar225;
  auVar399._0_16_ = auVar301;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar108 + 0xe);
  auVar301 = vpmovsxwd_avx(auVar21);
  auVar411._16_16_ = auVar301;
  auVar411._0_16_ = auVar250;
  auVar124 = vcvtdq2ps_avx(auVar399);
  auVar185 = vcvtdq2ps_avx(auVar411);
  auVar185 = vsubps_avx(auVar185,auVar124);
  auVar400._0_4_ = auVar124._0_4_ + auVar185._0_4_ * fVar162;
  auVar400._4_4_ = auVar124._4_4_ + auVar185._4_4_ * fVar166;
  auVar400._8_4_ = auVar124._8_4_ + auVar185._8_4_ * fVar170;
  auVar400._12_4_ = auVar124._12_4_ + auVar185._12_4_ * fVar167;
  auVar400._16_4_ = auVar124._16_4_ + auVar185._16_4_ * fVar162;
  auVar400._20_4_ = auVar124._20_4_ + auVar185._20_4_ * fVar166;
  auVar400._24_4_ = auVar124._24_4_ + auVar185._24_4_ * fVar170;
  auVar400._28_4_ = auVar124._28_4_ + auVar185._28_4_;
  lVar108 = (ulong)(byte)PVar26 * 0x20 - uVar103;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar108 + 6);
  auVar301 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar108 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar23);
  auVar412._16_16_ = auVar225;
  auVar412._0_16_ = auVar301;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 6);
  auVar301 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 0xe);
  auVar225 = vpmovsxwd_avx(auVar25);
  auVar425._16_16_ = auVar225;
  auVar425._0_16_ = auVar301;
  auVar124 = vcvtdq2ps_avx(auVar412);
  auVar185 = vcvtdq2ps_avx(auVar425);
  auVar185 = vsubps_avx(auVar185,auVar124);
  auVar413._0_4_ = auVar124._0_4_ + auVar185._0_4_ * fVar162;
  auVar413._4_4_ = auVar124._4_4_ + auVar185._4_4_ * fVar166;
  auVar413._8_4_ = auVar124._8_4_ + auVar185._8_4_ * fVar170;
  auVar413._12_4_ = auVar124._12_4_ + auVar185._12_4_ * fVar167;
  auVar413._16_4_ = auVar124._16_4_ + auVar185._16_4_ * fVar162;
  auVar413._20_4_ = auVar124._20_4_ + auVar185._20_4_ * fVar166;
  auVar413._24_4_ = auVar124._24_4_ + auVar185._24_4_ * fVar170;
  auVar413._28_4_ = auVar124._28_4_ + fVar167;
  auVar124 = vsubps_avx(auVar307,auVar151);
  auVar285._0_4_ = fVar214 * auVar124._0_4_;
  auVar285._4_4_ = fVar237 * auVar124._4_4_;
  auVar285._8_4_ = fVar211 * auVar124._8_4_;
  auVar285._12_4_ = fVar238 * auVar124._12_4_;
  auVar36._16_4_ = fVar239 * auVar124._16_4_;
  auVar36._0_16_ = auVar285;
  auVar36._20_4_ = fVar240 * auVar124._20_4_;
  auVar36._24_4_ = fVar241 * auVar124._24_4_;
  auVar36._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar327,auVar151);
  auVar215._0_4_ = fVar214 * auVar124._0_4_;
  auVar215._4_4_ = fVar237 * auVar124._4_4_;
  auVar215._8_4_ = fVar211 * auVar124._8_4_;
  auVar215._12_4_ = fVar238 * auVar124._12_4_;
  auVar37._16_4_ = fVar239 * auVar124._16_4_;
  auVar37._0_16_ = auVar215;
  auVar37._20_4_ = fVar240 * auVar124._20_4_;
  auVar37._24_4_ = fVar241 * auVar124._24_4_;
  auVar37._28_4_ = auVar32._28_4_ + auVar34._28_4_;
  auVar124 = vsubps_avx(auVar357,auVar125);
  auVar138._0_4_ = fVar243 * auVar124._0_4_;
  auVar138._4_4_ = fVar261 * auVar124._4_4_;
  auVar138._8_4_ = fVar262 * auVar124._8_4_;
  auVar138._12_4_ = fVar263 * auVar124._12_4_;
  auVar32._16_4_ = fVar264 * auVar124._16_4_;
  auVar32._0_16_ = auVar138;
  auVar32._20_4_ = fVar265 * auVar124._20_4_;
  auVar32._24_4_ = fVar266 * auVar124._24_4_;
  auVar32._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar388,auVar125);
  auVar244._0_4_ = fVar243 * auVar124._0_4_;
  auVar244._4_4_ = fVar261 * auVar124._4_4_;
  auVar244._8_4_ = fVar262 * auVar124._8_4_;
  auVar244._12_4_ = fVar263 * auVar124._12_4_;
  auVar34._16_4_ = fVar264 * auVar124._16_4_;
  auVar34._0_16_ = auVar244;
  auVar34._20_4_ = fVar265 * auVar124._20_4_;
  auVar34._24_4_ = fVar266 * auVar124._24_4_;
  auVar34._28_4_ = auVar33._28_4_ + auVar31._28_4_;
  auVar124 = vsubps_avx(auVar400,auVar182);
  auVar113._0_4_ = fVar268 * auVar124._0_4_;
  auVar113._4_4_ = fVar278 * auVar124._4_4_;
  auVar113._8_4_ = fVar279 * auVar124._8_4_;
  auVar113._12_4_ = fVar280 * auVar124._12_4_;
  auVar31._16_4_ = fVar281 * auVar124._16_4_;
  auVar31._0_16_ = auVar113;
  auVar31._20_4_ = fVar282 * auVar124._20_4_;
  auVar31._24_4_ = fVar283 * auVar124._24_4_;
  auVar31._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar413,auVar182);
  auVar173._0_4_ = fVar268 * auVar124._0_4_;
  auVar173._4_4_ = fVar278 * auVar124._4_4_;
  auVar173._8_4_ = fVar279 * auVar124._8_4_;
  auVar173._12_4_ = fVar280 * auVar124._12_4_;
  auVar405._16_4_ = fVar281 * auVar124._16_4_;
  auVar405._0_16_ = auVar173;
  auVar405._20_4_ = fVar282 * auVar124._20_4_;
  auVar405._24_4_ = fVar283 * auVar124._24_4_;
  auVar405._28_4_ = auVar124._28_4_;
  auVar301 = vpminsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar225 = vpminsd_avx(auVar285,auVar215);
  auVar328._16_16_ = auVar301;
  auVar328._0_16_ = auVar225;
  auVar301 = vpminsd_avx(auVar32._16_16_,auVar34._16_16_);
  auVar225 = vpminsd_avx(auVar138,auVar244);
  auVar401._16_16_ = auVar301;
  auVar401._0_16_ = auVar225;
  auVar124 = vmaxps_avx(auVar328,auVar401);
  auVar301 = vpminsd_avx(auVar31._16_16_,auVar405._16_16_);
  auVar225 = vpminsd_avx(auVar113,auVar173);
  auVar426._16_16_ = auVar301;
  auVar426._0_16_ = auVar225;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar443._4_4_ = uVar8;
  auVar443._0_4_ = uVar8;
  auVar443._8_4_ = uVar8;
  auVar443._12_4_ = uVar8;
  auVar443._16_4_ = uVar8;
  auVar443._20_4_ = uVar8;
  auVar443._24_4_ = uVar8;
  auVar443._28_4_ = uVar8;
  auVar185 = vmaxps_avx(auVar426,auVar443);
  auVar124 = vmaxps_avx(auVar124,auVar185);
  local_2a0._4_4_ = auVar124._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar124._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar124._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar124._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar124._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar124._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar124._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar124._28_4_;
  auVar301 = vpmaxsd_avx(auVar36._16_16_,auVar37._16_16_);
  auVar225 = vpmaxsd_avx(auVar285,auVar215);
  auVar231._16_16_ = auVar301;
  auVar231._0_16_ = auVar225;
  auVar301 = vpmaxsd_avx(auVar32._16_16_,auVar34._16_16_);
  auVar225 = vpmaxsd_avx(auVar138,auVar244);
  auVar152._16_16_ = auVar301;
  auVar152._0_16_ = auVar225;
  auVar124 = vminps_avx(auVar231,auVar152);
  auVar301 = vpmaxsd_avx(auVar31._16_16_,auVar405._16_16_);
  auVar225 = vpmaxsd_avx(auVar113,auVar173);
  fVar214 = (ray->super_RayK<1>).tfar;
  auVar183._4_4_ = fVar214;
  auVar183._0_4_ = fVar214;
  auVar183._8_4_ = fVar214;
  auVar183._12_4_ = fVar214;
  auVar183._16_4_ = fVar214;
  auVar183._20_4_ = fVar214;
  auVar183._24_4_ = fVar214;
  auVar183._28_4_ = fVar214;
  auVar126._16_16_ = auVar301;
  auVar126._0_16_ = auVar225;
  auVar185 = vminps_avx(auVar126,auVar183);
  auVar124 = vminps_avx(auVar124,auVar185);
  auVar38._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar38._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar38._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar38._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar38._16_4_ = auVar124._16_4_ * 1.0000004;
  auVar38._20_4_ = auVar124._20_4_ * 1.0000004;
  auVar38._24_4_ = auVar124._24_4_ * 1.0000004;
  auVar38._28_4_ = auVar124._28_4_;
  auVar124 = vcmpps_avx(local_2a0,auVar38,2);
  auVar301 = vpshufd_avx(ZEXT116((byte)PVar26),0);
  auVar153._16_16_ = auVar301;
  auVar153._0_16_ = auVar301;
  auVar185 = vcvtdq2ps_avx(auVar153);
  auVar185 = vcmpps_avx(_DAT_01faff40,auVar185,1);
  auVar124 = vandps_avx(auVar124,auVar185);
  uVar101 = vmovmskps_avx(auVar124);
  if (uVar101 == 0) {
    return;
  }
  uVar101 = uVar101 & 0xff;
  auVar127._16_16_ = mm_lookupmask_ps._240_16_;
  auVar127._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar127,ZEXT832(0) << 0x20,0x80);
LAB_0119eafb:
  lVar108 = 0;
  if (uVar101 != 0) {
    for (; (uVar101 >> lVar108 & 1) == 0; lVar108 = lVar108 + 1) {
    }
  }
  uVar107 = *(uint *)(prim + 2);
  pGVar27 = (context->scene->geometries).items[uVar107].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar27->field_0x58 +
                            (ulong)*(uint *)(prim + lVar108 * 4 + 6) *
                            pGVar27[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar214 = (pGVar27->time_range).lower;
  fVar214 = pGVar27->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar214) /
            ((pGVar27->time_range).upper - fVar214));
  auVar301 = vroundss_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),9);
  auVar301 = vminss_avx(auVar301,ZEXT416((uint)(pGVar27->fnumTimeSegments + -1.0)));
  auVar301 = vmaxss_avx(ZEXT816(0) << 0x20,auVar301);
  fVar214 = fVar214 - auVar301._0_4_;
  _Var28 = pGVar27[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar109 = (long)(int)auVar301._0_4_ * 0x38;
  lVar29 = *(long *)(_Var28 + lVar109);
  lVar110 = *(long *)(_Var28 + 0x10 + lVar109);
  auVar301 = vshufps_avx(ZEXT416((uint)(1.0 - fVar214)),ZEXT416((uint)(1.0 - fVar214)),0);
  pfVar1 = (float *)(lVar29 + lVar110 * uVar103);
  fVar162 = auVar301._0_4_;
  fVar237 = auVar301._4_4_;
  fVar211 = auVar301._8_4_;
  fVar238 = auVar301._12_4_;
  pfVar2 = (float *)(lVar29 + lVar110 * (uVar103 + 1));
  pfVar3 = (float *)(lVar29 + lVar110 * (uVar103 + 2));
  pfVar4 = (float *)(lVar29 + lVar110 * (uVar103 + 3));
  lVar29 = *(long *)(_Var28 + 0x38 + lVar109);
  lVar110 = *(long *)(_Var28 + 0x48 + lVar109);
  auVar301 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
  pfVar5 = (float *)(lVar29 + uVar103 * lVar110);
  fVar167 = auVar301._0_4_;
  fVar239 = auVar301._4_4_;
  fVar240 = auVar301._8_4_;
  fVar241 = auVar301._12_4_;
  pfVar6 = (float *)(lVar29 + (uVar103 + 1) * lVar110);
  pfVar7 = (float *)(lVar29 + (uVar103 + 2) * lVar110);
  auVar216._0_4_ = fVar167 * *pfVar5 + fVar162 * *pfVar1;
  auVar216._4_4_ = fVar239 * pfVar5[1] + fVar237 * pfVar1[1];
  auVar216._8_4_ = fVar240 * pfVar5[2] + fVar211 * pfVar1[2];
  auVar216._12_4_ = fVar241 * pfVar5[3] + fVar238 * pfVar1[3];
  auVar245._0_4_ = fVar162 * *pfVar2 + fVar167 * *pfVar6;
  auVar245._4_4_ = fVar237 * pfVar2[1] + fVar239 * pfVar6[1];
  auVar245._8_4_ = fVar211 * pfVar2[2] + fVar240 * pfVar6[2];
  auVar245._12_4_ = fVar238 * pfVar2[3] + fVar241 * pfVar6[3];
  auVar270._0_4_ = fVar162 * *pfVar3 + fVar167 * *pfVar7;
  auVar270._4_4_ = fVar237 * pfVar3[1] + fVar239 * pfVar7[1];
  auVar270._8_4_ = fVar211 * pfVar3[2] + fVar240 * pfVar7[2];
  auVar270._12_4_ = fVar238 * pfVar3[3] + fVar241 * pfVar7[3];
  auVar114._0_4_ = (auVar216._0_4_ + auVar245._0_4_) * 0.5;
  auVar114._4_4_ = (auVar216._4_4_ + auVar245._4_4_) * 0.5;
  auVar114._8_4_ = (auVar216._8_4_ + auVar245._8_4_) * 0.5;
  auVar114._12_4_ = (auVar216._12_4_ + auVar245._12_4_) * 0.5;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar301 = vsubps_avx(auVar114,(undefined1  [16])aVar10);
  auVar301 = vdpps_avx(auVar301,(undefined1  [16])aVar11,0x7f);
  auVar225 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar250 = vrcpss_avx(auVar225,auVar225);
  auVar395 = ZEXT464(0x40000000);
  fVar214 = auVar250._0_4_ * (2.0 - auVar225._0_4_ * auVar250._0_4_) * auVar301._0_4_;
  local_750 = ZEXT416((uint)fVar214);
  auVar225 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
  fVar214 = aVar11.x;
  fVar166 = aVar11.y;
  fVar170 = aVar11.z;
  aVar164 = aVar11.field_3;
  auVar302._0_4_ = fVar214 * auVar225._0_4_ + aVar10.x;
  auVar302._4_4_ = fVar166 * auVar225._4_4_ + aVar10.y;
  auVar302._8_4_ = fVar170 * auVar225._8_4_ + aVar10.z;
  auVar302._12_4_ = aVar164.w * auVar225._12_4_ + aVar10.field_3.w;
  auVar301 = vblendps_avx(auVar302,_DAT_01f7aa10,8);
  _local_990 = vsubps_avx(auVar216,auVar301);
  auVar330 = ZEXT1664(_local_990);
  pfVar1 = (float *)(lVar29 + lVar110 * (uVar103 + 3));
  _local_9a0 = vsubps_avx(auVar270,auVar301);
  auVar174._0_4_ = fVar162 * *pfVar4 + fVar167 * *pfVar1;
  auVar174._4_4_ = fVar237 * pfVar4[1] + fVar239 * pfVar1[1];
  auVar174._8_4_ = fVar211 * pfVar4[2] + fVar240 * pfVar1[2];
  auVar174._12_4_ = fVar238 * pfVar4[3] + fVar241 * pfVar1[3];
  _local_9b0 = vsubps_avx(auVar245,auVar301);
  _local_9c0 = vsubps_avx(auVar174,auVar301);
  auVar301 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar301;
  _local_2e0 = auVar301;
  auVar301 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar301;
  _local_1e0 = auVar301;
  auVar301 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar301;
  _local_200 = auVar301;
  auVar301 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001290 = auVar301;
  _local_220 = auVar301;
  auVar301 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001290 = auVar301;
  _local_300 = auVar301;
  auVar301 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001290 = auVar301;
  _local_320 = auVar301;
  auVar301 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001290 = auVar301;
  _local_340 = auVar301;
  auVar139._0_4_ = fVar214 * fVar214;
  auVar139._4_4_ = fVar166 * fVar166;
  auVar139._8_4_ = fVar170 * fVar170;
  auVar139._12_4_ = aVar164.w * aVar164.w;
  auVar301 = vshufps_avx(auVar139,auVar139,0xaa);
  auVar250 = vshufps_avx(auVar139,auVar139,0x55);
  auVar146 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x000012d0 = auVar146;
  _local_240 = auVar146;
  auVar146 = vshufps_avx(auVar139,auVar139,0);
  local_260._0_4_ = auVar146._0_4_ + auVar250._0_4_ + auVar301._0_4_;
  local_260._4_4_ = auVar146._4_4_ + auVar250._4_4_ + auVar301._4_4_;
  local_260._8_4_ = auVar146._8_4_ + auVar250._8_4_ + auVar301._8_4_;
  local_260._12_4_ = auVar146._12_4_ + auVar250._12_4_ + auVar301._12_4_;
  local_260._16_4_ = auVar146._0_4_ + auVar250._0_4_ + auVar301._0_4_;
  local_260._20_4_ = auVar146._4_4_ + auVar250._4_4_ + auVar301._4_4_;
  local_260._24_4_ = auVar146._8_4_ + auVar250._8_4_ + auVar301._8_4_;
  local_260._28_4_ = auVar146._12_4_ + auVar250._12_4_ + auVar301._12_4_;
  auVar301 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001550 = auVar301;
  _local_a20 = auVar301;
  auVar430 = ZEXT3264(_local_a20);
  auVar301 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar301;
  _local_360 = auVar301;
  auVar301 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar301;
  _local_380 = auVar301;
  auVar301 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar301;
  _local_3a0 = auVar301;
  auVar301 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x000014d0 = auVar301;
  _local_840 = auVar301;
  auVar406 = ZEXT3264(_local_840);
  auVar301 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  auVar250 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001250 = auVar250;
  _local_3c0 = auVar250;
  auVar250 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001250 = auVar250;
  _local_280 = auVar250;
  register0x00001210 = auVar225;
  _local_6a0 = auVar225;
  local_b0c = 1;
  uVar112 = 0;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_3e0 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_6e0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_6dc = local_6e0;
  fStack_6d8 = local_6e0;
  fStack_6d4 = local_6e0;
  fStack_6d0 = local_6e0;
  fStack_6cc = local_6e0;
  fStack_6c8 = local_6e0;
  fStack_6c4 = local_6e0;
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  local_420 = vandps_avx(local_260,auVar128);
  local_4d0 = ZEXT816(0x3f80000000000000);
  uVar103 = (ulong)*(uint *)(prim + lVar108 * 4 + 6);
  do {
    auVar256._8_4_ = 0x3f800000;
    auVar256._0_8_ = 0x3f8000003f800000;
    auVar256._12_4_ = 0x3f800000;
    auVar256._16_4_ = 0x3f800000;
    auVar256._20_4_ = 0x3f800000;
    iVar111 = (int)uVar112;
    auVar256._24_4_ = 0x3f800000;
    auVar256._28_4_ = 0x3f800000;
    auVar225 = vmovshdup_avx(local_4d0);
    auVar146 = vsubps_avx(auVar225,local_4d0);
    auVar225 = vshufps_avx(local_4d0,local_4d0,0);
    local_880._16_16_ = auVar225;
    local_880._0_16_ = auVar225;
    auVar250 = vshufps_avx(auVar146,auVar146,0);
    local_7a0._16_16_ = auVar250;
    local_7a0._0_16_ = auVar250;
    fVar438 = auVar250._0_4_;
    fVar440 = auVar250._4_4_;
    fVar163 = auVar250._8_4_;
    fVar165 = auVar250._12_4_;
    fVar424 = auVar225._0_4_;
    auVar232._0_4_ = fVar424 + fVar438 * 0.0;
    fVar432 = auVar225._4_4_;
    auVar232._4_4_ = fVar432 + fVar440 * 0.14285715;
    fVar434 = auVar225._8_4_;
    auVar232._8_4_ = fVar434 + fVar163 * 0.2857143;
    fVar436 = auVar225._12_4_;
    auVar232._12_4_ = fVar436 + fVar165 * 0.42857146;
    auVar232._16_4_ = fVar424 + fVar438 * 0.5714286;
    auVar232._20_4_ = fVar432 + fVar440 * 0.71428573;
    auVar232._24_4_ = fVar434 + fVar163 * 0.8571429;
    auVar232._28_4_ = fVar436 + fVar165;
    auVar124 = vsubps_avx(auVar256,auVar232);
    auVar184._0_4_ = auVar232._0_4_ * auVar232._0_4_;
    auVar184._4_4_ = auVar232._4_4_ * auVar232._4_4_;
    auVar184._8_4_ = auVar232._8_4_ * auVar232._8_4_;
    auVar184._12_4_ = auVar232._12_4_ * auVar232._12_4_;
    auVar184._16_4_ = auVar232._16_4_ * auVar232._16_4_;
    auVar184._20_4_ = auVar232._20_4_ * auVar232._20_4_;
    auVar184._24_4_ = auVar232._24_4_ * auVar232._24_4_;
    auVar184._28_4_ = 0;
    fVar240 = auVar232._0_4_ * 3.0;
    fVar241 = auVar232._4_4_ * 3.0;
    fVar243 = auVar232._8_4_ * 3.0;
    fVar261 = auVar232._12_4_ * 3.0;
    fVar262 = auVar232._16_4_ * 3.0;
    fVar263 = auVar232._20_4_ * 3.0;
    fVar264 = auVar232._24_4_ * 3.0;
    fVar162 = auVar124._0_4_;
    auVar331._0_4_ = fVar162 * fVar162;
    fVar237 = auVar124._4_4_;
    auVar331._4_4_ = fVar237 * fVar237;
    fVar166 = auVar124._8_4_;
    auVar331._8_4_ = fVar166 * fVar166;
    fVar211 = auVar124._12_4_;
    auVar331._12_4_ = fVar211 * fVar211;
    fVar170 = auVar124._16_4_;
    auVar331._16_4_ = fVar170 * fVar170;
    fVar238 = auVar124._20_4_;
    auVar331._20_4_ = fVar238 * fVar238;
    fVar167 = auVar124._24_4_;
    auVar331._28_36_ = auVar330._28_36_;
    auVar331._24_4_ = fVar167 * fVar167;
    fVar239 = auVar124._28_4_;
    fVar265 = (auVar331._0_4_ * (fVar162 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar266 = (auVar331._4_4_ * (fVar237 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar268 = (auVar331._8_4_ * (fVar166 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar278 = (auVar331._12_4_ * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar279 = (auVar331._16_4_ * (fVar170 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar280 = (auVar331._20_4_ * (fVar238 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar281 = (auVar331._24_4_ * (fVar167 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar282 = -fVar162 * auVar232._0_4_ * auVar232._0_4_ * 0.5;
    fVar283 = -fVar237 * auVar232._4_4_ * auVar232._4_4_ * 0.5;
    fVar362 = -fVar166 * auVar232._8_4_ * auVar232._8_4_ * 0.5;
    fVar366 = -fVar211 * auVar232._12_4_ * auVar232._12_4_ * 0.5;
    fVar370 = -fVar170 * auVar232._16_4_ * auVar232._16_4_ * 0.5;
    fVar374 = -fVar238 * auVar232._20_4_ * auVar232._20_4_ * 0.5;
    fVar378 = -fVar167 * auVar232._24_4_ * auVar232._24_4_ * 0.5;
    fVar408 = auVar301._0_4_;
    fVar267 = auVar301._4_4_;
    fVar299 = auVar301._8_4_;
    fVar418 = auVar301._12_4_;
    fVar214 = auVar430._28_4_;
    fVar396 = auVar395._28_4_ + fVar214;
    fVar407 = auVar406._28_4_ + fVar214;
    fVar423 = (auVar184._0_4_ * (fVar240 + -5.0) + 2.0) * 0.5;
    fVar431 = (auVar184._4_4_ * (fVar241 + -5.0) + 2.0) * 0.5;
    fVar433 = (auVar184._8_4_ * (fVar243 + -5.0) + 2.0) * 0.5;
    fVar435 = (auVar184._12_4_ * (fVar261 + -5.0) + 2.0) * 0.5;
    fVar437 = (auVar184._16_4_ * (fVar262 + -5.0) + 2.0) * 0.5;
    fVar439 = (auVar184._20_4_ * (fVar263 + -5.0) + 2.0) * 0.5;
    fVar441 = (auVar184._24_4_ * (fVar264 + -5.0) + 2.0) * 0.5;
    fVar409 = -auVar232._0_4_ * fVar162 * fVar162 * 0.5;
    fVar416 = -auVar232._4_4_ * fVar237 * fVar237 * 0.5;
    fVar417 = -auVar232._8_4_ * fVar166 * fVar166 * 0.5;
    fVar419 = -auVar232._12_4_ * fVar211 * fVar211 * 0.5;
    fVar420 = -auVar232._16_4_ * fVar170 * fVar170 * 0.5;
    fVar421 = -auVar232._20_4_ * fVar238 * fVar238 * 0.5;
    fVar422 = -auVar232._24_4_ * fVar167 * fVar167 * 0.5;
    local_800 = fVar409 * (float)local_2e0._0_4_ +
                fVar423 * (float)local_300._0_4_ +
                auVar406._0_4_ * fVar282 + auVar430._0_4_ * fVar265;
    fStack_7fc = fVar416 * (float)local_2e0._4_4_ +
                 fVar431 * (float)local_300._4_4_ +
                 auVar406._4_4_ * fVar283 + auVar430._4_4_ * fVar266;
    fStack_7f8 = fVar417 * fStack_2d8 +
                 fVar433 * fStack_2f8 + auVar406._8_4_ * fVar362 + auVar430._8_4_ * fVar268;
    aStack_7f4.w = fVar419 * fStack_2d4 +
                   fVar435 * fStack_2f4 + auVar406._12_4_ * fVar366 + auVar430._12_4_ * fVar278;
    fStack_7f0 = fVar420 * fStack_2d0 +
                 fVar437 * fStack_2f0 + auVar406._16_4_ * fVar370 + auVar430._16_4_ * fVar279;
    fStack_7ec = fVar421 * fStack_2cc +
                 fVar439 * fStack_2ec + auVar406._20_4_ * fVar374 + auVar430._20_4_ * fVar280;
    fStack_7e8 = fVar422 * fStack_2c8 +
                 fVar441 * fStack_2e8 + auVar406._24_4_ * fVar378 + auVar430._24_4_ * fVar281;
    fStack_7e4 = fVar214 + 2.0 + -fVar239 + fVar396;
    fVar351 = (float)local_1e0._0_4_ * fVar409 +
              fVar423 * (float)local_320._0_4_ +
              fVar408 * fVar282 + fVar265 * (float)local_360._0_4_;
    fVar359 = (float)local_1e0._4_4_ * fVar416 +
              fVar431 * (float)local_320._4_4_ +
              fVar267 * fVar283 + fVar266 * (float)local_360._4_4_;
    fVar363 = fStack_1d8 * fVar417 + fVar433 * fStack_318 + fVar299 * fVar362 + fVar268 * fStack_358
    ;
    fVar367 = fStack_1d4 * fVar419 + fVar435 * fStack_314 + fVar418 * fVar366 + fVar278 * fStack_354
    ;
    fVar371 = fStack_1d0 * fVar420 + fVar437 * fStack_310 + fVar408 * fVar370 + fVar279 * fStack_350
    ;
    fVar375 = fStack_1cc * fVar421 + fVar439 * fStack_30c + fVar267 * fVar374 + fVar280 * fStack_34c
    ;
    fVar379 = fStack_1c8 * fVar422 + fVar441 * fStack_308 + fVar299 * fVar378 + fVar281 * fStack_348
    ;
    fVar382 = fStack_7e4 + fVar396 + fVar407;
    fVar169 = (float)local_200._0_4_ * fVar409 +
              fVar423 * (float)local_340._0_4_ +
              fVar282 * (float)local_3c0._0_4_ + fVar265 * (float)local_380._0_4_;
    fVar193 = (float)local_200._4_4_ * fVar416 +
              fVar431 * (float)local_340._4_4_ +
              fVar283 * (float)local_3c0._4_4_ + fVar266 * (float)local_380._4_4_;
    fVar196 = fStack_1f8 * fVar417 +
              fVar433 * fStack_338 + fVar362 * fStack_3b8 + fVar268 * fStack_378;
    fVar199 = fStack_1f4 * fVar419 +
              fVar435 * fStack_334 + fVar366 * fStack_3b4 + fVar278 * fStack_374;
    fVar202 = fStack_1f0 * fVar420 +
              fVar437 * fStack_330 + fVar370 * fStack_3b0 + fVar279 * fStack_370;
    fVar205 = fStack_1ec * fVar421 +
              fVar439 * fStack_32c + fVar374 * fStack_3ac + fVar280 * fStack_36c;
    fVar208 = fStack_1e8 * fVar422 +
              fVar441 * fStack_328 + fVar378 * fStack_3a8 + fVar281 * fStack_368;
    fVar212 = fVar382 + fVar407 + fVar418 + fVar214;
    local_7c0._0_4_ =
         fVar409 * (float)local_220._0_4_ +
         (float)local_240._0_4_ * fVar423 +
         (float)local_280._0_4_ * fVar282 + fVar265 * (float)local_3a0._0_4_;
    local_7c0._4_4_ =
         fVar416 * (float)local_220._4_4_ +
         (float)local_240._4_4_ * fVar431 +
         (float)local_280._4_4_ * fVar283 + fVar266 * (float)local_3a0._4_4_;
    local_7c0._8_4_ =
         fVar417 * fStack_218 + fStack_238 * fVar433 + fStack_278 * fVar362 + fVar268 * fStack_398;
    local_7c0._12_4_ =
         fVar419 * fStack_214 + fStack_234 * fVar435 + fStack_274 * fVar366 + fVar278 * fStack_394;
    local_7c0._16_4_ =
         fVar420 * fStack_210 + fStack_230 * fVar437 + fStack_270 * fVar370 + fVar279 * fStack_390;
    local_7c0._20_4_ =
         fVar421 * fStack_20c + fStack_22c * fVar439 + fStack_26c * fVar374 + fVar280 * fStack_38c;
    local_7c0._24_4_ =
         fVar422 * fStack_208 + fStack_228 * fVar441 + fStack_268 * fVar378 + fVar281 * fStack_388;
    local_7c0._28_4_ = fVar382 + fVar214 + 2.0 + -fVar239 + fVar436 + -5.0 + 2.0;
    fVar409 = fVar239 + fVar239;
    auVar39._4_4_ = (fVar237 + fVar237) * auVar232._4_4_;
    auVar39._0_4_ = (fVar162 + fVar162) * auVar232._0_4_;
    auVar39._8_4_ = (fVar166 + fVar166) * auVar232._8_4_;
    auVar39._12_4_ = (fVar211 + fVar211) * auVar232._12_4_;
    auVar39._16_4_ = (fVar170 + fVar170) * auVar232._16_4_;
    auVar39._20_4_ = (fVar238 + fVar238) * auVar232._20_4_;
    auVar39._24_4_ = (fVar167 + fVar167) * auVar232._24_4_;
    auVar39._28_4_ = auVar232._28_4_ + auVar232._28_4_;
    auVar124 = vsubps_avx(auVar39,auVar331._0_32_);
    auVar40._4_4_ = (fVar237 + fVar237) * (fVar241 + 2.0);
    auVar40._0_4_ = (fVar162 + fVar162) * (fVar240 + 2.0);
    auVar40._8_4_ = (fVar166 + fVar166) * (fVar243 + 2.0);
    auVar40._12_4_ = (fVar211 + fVar211) * (fVar261 + 2.0);
    auVar40._16_4_ = (fVar170 + fVar170) * (fVar262 + 2.0);
    auVar40._20_4_ = (fVar238 + fVar238) * (fVar263 + 2.0);
    auVar40._24_4_ = (fVar167 + fVar167) * (fVar264 + 2.0);
    auVar40._28_4_ = 0x40400000;
    auVar41._4_4_ = fVar237 * fVar237 * 3.0;
    auVar41._0_4_ = fVar162 * fVar162 * 3.0;
    auVar41._8_4_ = fVar166 * fVar166 * 3.0;
    auVar41._12_4_ = fVar211 * fVar211 * 3.0;
    auVar41._16_4_ = fVar170 * fVar170 * 3.0;
    auVar41._20_4_ = fVar238 * fVar238 * 3.0;
    auVar41._24_4_ = fVar167 * fVar167 * 3.0;
    auVar41._28_4_ = fVar239;
    auVar185 = vsubps_avx(auVar40,auVar41);
    auVar31 = vsubps_avx(auVar184,auVar39);
    fVar362 = auVar124._0_4_ * 0.5;
    fVar366 = auVar124._4_4_ * 0.5;
    fVar370 = auVar124._8_4_ * 0.5;
    fVar374 = auVar124._12_4_ * 0.5;
    fVar378 = auVar124._16_4_ * 0.5;
    fVar396 = auVar124._20_4_ * 0.5;
    fVar407 = auVar124._24_4_ * 0.5;
    fVar266 = (auVar232._0_4_ * fVar240 + (auVar232._0_4_ + auVar232._0_4_) * (fVar240 + -5.0)) *
              0.5;
    fVar278 = (auVar232._4_4_ * fVar241 + (auVar232._4_4_ + auVar232._4_4_) * (fVar241 + -5.0)) *
              0.5;
    fVar279 = (auVar232._8_4_ * fVar243 + (auVar232._8_4_ + auVar232._8_4_) * (fVar243 + -5.0)) *
              0.5;
    fVar280 = (auVar232._12_4_ * fVar261 + (auVar232._12_4_ + auVar232._12_4_) * (fVar261 + -5.0)) *
              0.5;
    fVar281 = (auVar232._16_4_ * fVar262 + (auVar232._16_4_ + auVar232._16_4_) * (fVar262 + -5.0)) *
              0.5;
    fVar282 = (auVar232._20_4_ * fVar263 + (auVar232._20_4_ + auVar232._20_4_) * (fVar263 + -5.0)) *
              0.5;
    fVar283 = (auVar232._24_4_ * fVar264 + (auVar232._24_4_ + auVar232._24_4_) * (fVar264 + -5.0)) *
              0.5;
    fVar214 = auVar185._0_4_ * 0.5;
    fVar162 = auVar185._4_4_ * 0.5;
    fVar237 = auVar185._8_4_ * 0.5;
    fVar166 = auVar185._12_4_ * 0.5;
    fVar167 = auVar185._16_4_ * 0.5;
    fVar239 = auVar185._20_4_ * 0.5;
    fVar240 = auVar185._24_4_ * 0.5;
    fVar170 = auVar31._0_4_ * 0.5;
    fVar241 = auVar31._4_4_ * 0.5;
    fVar261 = auVar31._8_4_ * 0.5;
    fVar262 = auVar31._12_4_ * 0.5;
    fVar263 = auVar31._16_4_ * 0.5;
    fVar264 = auVar31._20_4_ * 0.5;
    fVar268 = auVar31._24_4_ * 0.5;
    fVar350 = fVar409 + auVar124._28_4_;
    fVar213 = auVar232._28_4_ + -4.0 + auVar31._28_4_ + fVar409 + 0.5;
    auVar225 = vpermilps_avx(ZEXT416((uint)(auVar146._0_4_ * 0.04761905)),0);
    fVar211 = auVar225._0_4_;
    fVar319 = fVar211 * (fVar362 * (float)local_2e0._0_4_ +
                        fVar266 * (float)local_300._0_4_ +
                        fVar214 * (float)local_a20._0_4_ + fVar170 * (float)local_840._0_4_);
    fVar238 = auVar225._4_4_;
    fVar332 = fVar238 * (fVar366 * (float)local_2e0._4_4_ +
                        fVar278 * (float)local_300._4_4_ +
                        fVar162 * (float)local_a20._4_4_ + fVar241 * (float)local_840._4_4_);
    auVar42._4_4_ = fVar332;
    auVar42._0_4_ = fVar319;
    fVar243 = auVar225._8_4_;
    fVar335 = fVar243 * (fVar370 * fStack_2d8 +
                        fVar279 * fStack_2f8 + fVar237 * fStack_a18 + fVar261 * fStack_838);
    auVar42._8_4_ = fVar335;
    fVar265 = auVar225._12_4_;
    fVar338 = fVar265 * (fVar374 * fStack_2d4 +
                        fVar280 * fStack_2f4 + fVar166 * fStack_a14 + fVar262 * fStack_834);
    auVar42._12_4_ = fVar338;
    fVar341 = fVar211 * (fVar378 * fStack_2d0 +
                        fVar281 * fStack_2f0 + fVar167 * fStack_a10 + fVar263 * fStack_830);
    auVar42._16_4_ = fVar341;
    fVar344 = fVar238 * (fVar396 * fStack_2cc +
                        fVar282 * fStack_2ec + fVar239 * fStack_a0c + fVar264 * fStack_82c);
    auVar42._20_4_ = fVar344;
    fVar347 = fVar243 * (fVar407 * fStack_2c8 +
                        fVar283 * fStack_2e8 + fVar240 * fStack_a08 + fVar268 * fStack_828);
    auVar42._24_4_ = fVar347;
    auVar42._28_4_ = fVar350;
    fVar171 = fVar211 * ((float)local_1e0._0_4_ * fVar362 +
                        fVar266 * (float)local_320._0_4_ +
                        fVar214 * (float)local_360._0_4_ + fVar170 * fVar408);
    fVar194 = fVar238 * ((float)local_1e0._4_4_ * fVar366 +
                        fVar278 * (float)local_320._4_4_ +
                        fVar162 * (float)local_360._4_4_ + fVar241 * fVar267);
    local_780._4_4_ = fVar194;
    local_780._0_4_ = fVar171;
    fVar197 = fVar243 * (fStack_1d8 * fVar370 +
                        fVar279 * fStack_318 + fVar237 * fStack_358 + fVar261 * fVar299);
    local_780._8_4_ = fVar197;
    fVar200 = fVar265 * (fStack_1d4 * fVar374 +
                        fVar280 * fStack_314 + fVar166 * fStack_354 + fVar262 * fVar418);
    local_780._12_4_ = fVar200;
    fVar203 = fVar211 * (fStack_1d0 * fVar378 +
                        fVar281 * fStack_310 + fVar167 * fStack_350 + fVar263 * fVar408);
    local_780._16_4_ = fVar203;
    fVar206 = fVar238 * (fStack_1cc * fVar396 +
                        fVar282 * fStack_30c + fVar239 * fStack_34c + fVar264 * fVar267);
    local_780._20_4_ = fVar206;
    fVar209 = fVar243 * (fStack_1c8 * fVar407 +
                        fVar283 * fStack_308 + fVar240 * fStack_348 + fVar268 * fVar299);
    local_780._24_4_ = fVar209;
    local_780._28_4_ = fVar213;
    fVar352 = fVar211 * ((float)local_200._0_4_ * fVar362 +
                        fVar214 * (float)local_380._0_4_ + fVar170 * (float)local_3c0._0_4_ +
                        fVar266 * (float)local_340._0_4_);
    fVar360 = fVar238 * ((float)local_200._4_4_ * fVar366 +
                        fVar162 * (float)local_380._4_4_ + fVar241 * (float)local_3c0._4_4_ +
                        fVar278 * (float)local_340._4_4_);
    local_a00._4_4_ = fVar360;
    local_a00._0_4_ = fVar352;
    fVar364 = fVar243 * (fStack_1f8 * fVar370 +
                        fVar237 * fStack_378 + fVar261 * fStack_3b8 + fVar279 * fStack_338);
    local_a00._8_4_ = fVar364;
    fVar368 = fVar265 * (fStack_1f4 * fVar374 +
                        fVar166 * fStack_374 + fVar262 * fStack_3b4 + fVar280 * fStack_334);
    local_a00._12_4_ = fVar368;
    fVar372 = fVar211 * (fStack_1f0 * fVar378 +
                        fVar167 * fStack_370 + fVar263 * fStack_3b0 + fVar281 * fStack_330);
    local_a00._16_4_ = fVar372;
    fVar376 = fVar238 * (fStack_1ec * fVar396 +
                        fVar239 * fStack_36c + fVar264 * fStack_3ac + fVar282 * fStack_32c);
    local_a00._20_4_ = fVar376;
    fVar380 = fVar243 * (fStack_1e8 * fVar407 +
                        fVar240 * fStack_368 + fVar268 * fStack_3a8 + fVar283 * fStack_328);
    local_a00._24_4_ = fVar380;
    local_a00._28_4_ = fVar409;
    fVar170 = fVar211 * ((float)local_220._0_4_ * fVar362 +
                        (float)local_240._0_4_ * fVar266 +
                        fVar214 * (float)local_3a0._0_4_ + (float)local_280._0_4_ * fVar170);
    fVar241 = fVar238 * ((float)local_220._4_4_ * fVar366 +
                        (float)local_240._4_4_ * fVar278 +
                        fVar162 * (float)local_3a0._4_4_ + (float)local_280._4_4_ * fVar241);
    auVar43._4_4_ = fVar241;
    auVar43._0_4_ = fVar170;
    fVar261 = fVar243 * (fStack_218 * fVar370 +
                        fStack_238 * fVar279 + fVar237 * fStack_398 + fStack_278 * fVar261);
    auVar43._8_4_ = fVar261;
    fVar266 = fVar265 * (fStack_214 * fVar374 +
                        fStack_234 * fVar280 + fVar166 * fStack_394 + fStack_274 * fVar262);
    auVar43._12_4_ = fVar266;
    fVar211 = fVar211 * (fStack_210 * fVar378 +
                        fStack_230 * fVar281 + fVar167 * fStack_390 + fStack_270 * fVar263);
    auVar43._16_4_ = fVar211;
    fVar238 = fVar238 * (fStack_20c * fVar396 +
                        fStack_22c * fVar282 + fVar239 * fStack_38c + fStack_26c * fVar264);
    auVar43._20_4_ = fVar238;
    fVar243 = fVar243 * (fStack_208 * fVar407 +
                        fStack_228 * fVar283 + fVar240 * fStack_388 + fStack_268 * fVar268);
    auVar43._24_4_ = fVar243;
    auVar43._28_4_ = fVar265;
    auVar93._4_4_ = fVar359;
    auVar93._0_4_ = fVar351;
    auVar93._8_4_ = fVar363;
    auVar93._12_4_ = fVar367;
    auVar93._16_4_ = fVar371;
    auVar93._20_4_ = fVar375;
    auVar93._24_4_ = fVar379;
    auVar93._28_4_ = fVar382;
    auVar124 = vperm2f128_avx(auVar93,auVar93,1);
    auVar124 = vshufps_avx(auVar124,auVar93,0x30);
    _local_920 = vshufps_avx(auVar93,auVar124,0x29);
    auVar91._4_4_ = fVar193;
    auVar91._0_4_ = fVar169;
    auVar91._8_4_ = fVar196;
    auVar91._12_4_ = fVar199;
    auVar91._16_4_ = fVar202;
    auVar91._20_4_ = fVar205;
    auVar91._24_4_ = fVar208;
    auVar91._28_4_ = fVar212;
    auVar124 = vperm2f128_avx(auVar91,auVar91,1);
    auVar124 = vshufps_avx(auVar124,auVar91,0x30);
    _local_940 = vshufps_avx(auVar91,auVar124,0x29);
    auVar185 = vsubps_avx(local_7c0,auVar43);
    auVar124 = vperm2f128_avx(auVar185,auVar185,1);
    auVar124 = vshufps_avx(auVar124,auVar185,0x30);
    local_7e0 = vshufps_avx(auVar185,auVar124,0x29);
    local_8a0 = vsubps_avx(_local_920,auVar93);
    _local_640 = vsubps_avx(_local_940,auVar91);
    fVar162 = local_8a0._0_4_;
    fVar167 = local_8a0._4_4_;
    auVar44._4_4_ = fVar360 * fVar167;
    auVar44._0_4_ = fVar352 * fVar162;
    fVar262 = local_8a0._8_4_;
    auVar44._8_4_ = fVar364 * fVar262;
    fVar278 = local_8a0._12_4_;
    auVar44._12_4_ = fVar368 * fVar278;
    fVar362 = local_8a0._16_4_;
    auVar44._16_4_ = fVar372 * fVar362;
    fVar407 = local_8a0._20_4_;
    auVar44._20_4_ = fVar376 * fVar407;
    fVar417 = local_8a0._24_4_;
    auVar44._24_4_ = fVar380 * fVar417;
    auVar44._28_4_ = auVar185._28_4_;
    fVar237 = local_640._0_4_;
    fVar239 = local_640._4_4_;
    auVar45._4_4_ = fVar194 * fVar239;
    auVar45._0_4_ = fVar171 * fVar237;
    fVar263 = local_640._8_4_;
    auVar45._8_4_ = fVar197 * fVar263;
    fVar279 = local_640._12_4_;
    auVar45._12_4_ = fVar200 * fVar279;
    fVar366 = local_640._16_4_;
    auVar45._16_4_ = fVar203 * fVar366;
    fVar409 = local_640._20_4_;
    auVar45._20_4_ = fVar206 * fVar409;
    fVar419 = local_640._24_4_;
    auVar45._24_4_ = fVar209 * fVar419;
    auVar45._28_4_ = auVar124._28_4_;
    auVar31 = vsubps_avx(auVar45,auVar44);
    auVar97._4_4_ = fStack_7fc;
    auVar97._0_4_ = local_800;
    auVar97._8_4_ = fStack_7f8;
    auVar97._12_4_ = aStack_7f4;
    auVar97._16_4_ = fStack_7f0;
    auVar97._20_4_ = fStack_7ec;
    auVar97._24_4_ = fStack_7e8;
    auVar97._28_4_ = fStack_7e4;
    auVar124 = vperm2f128_avx(auVar97,auVar97,1);
    auVar124 = vshufps_avx(auVar124,auVar97,0x30);
    local_9e0 = vshufps_avx(auVar97,auVar124,0x29);
    local_560 = vsubps_avx(local_9e0,auVar97);
    auVar46._4_4_ = fVar332 * fVar239;
    auVar46._0_4_ = fVar319 * fVar237;
    auVar46._8_4_ = fVar335 * fVar263;
    auVar46._12_4_ = fVar338 * fVar279;
    auVar46._16_4_ = fVar341 * fVar366;
    auVar46._20_4_ = fVar344 * fVar409;
    auVar46._24_4_ = fVar347 * fVar419;
    auVar46._28_4_ = local_9e0._28_4_;
    fVar166 = local_560._0_4_;
    fVar240 = local_560._4_4_;
    auVar47._4_4_ = fVar360 * fVar240;
    auVar47._0_4_ = fVar352 * fVar166;
    fVar264 = local_560._8_4_;
    auVar47._8_4_ = fVar364 * fVar264;
    fVar280 = local_560._12_4_;
    auVar47._12_4_ = fVar368 * fVar280;
    fVar370 = local_560._16_4_;
    auVar47._16_4_ = fVar372 * fVar370;
    fVar408 = local_560._20_4_;
    auVar47._20_4_ = fVar376 * fVar408;
    fVar420 = local_560._24_4_;
    auVar47._24_4_ = fVar380 * fVar420;
    auVar47._28_4_ = fStack_7e4;
    auVar32 = vsubps_avx(auVar47,auVar46);
    auVar48._4_4_ = fVar240 * fVar194;
    auVar48._0_4_ = fVar166 * fVar171;
    auVar48._8_4_ = fVar264 * fVar197;
    auVar48._12_4_ = fVar280 * fVar200;
    auVar48._16_4_ = fVar370 * fVar203;
    auVar48._20_4_ = fVar408 * fVar206;
    auVar48._24_4_ = fVar420 * fVar209;
    auVar48._28_4_ = fStack_7e4;
    auVar49._4_4_ = fVar332 * fVar167;
    auVar49._0_4_ = fVar319 * fVar162;
    auVar49._8_4_ = fVar335 * fVar262;
    auVar49._12_4_ = fVar338 * fVar278;
    auVar49._16_4_ = fVar341 * fVar362;
    auVar49._20_4_ = fVar344 * fVar407;
    auVar49._24_4_ = fVar347 * fVar417;
    auVar49._28_4_ = fVar212;
    auVar33 = vsubps_avx(auVar49,auVar48);
    fVar214 = auVar33._28_4_;
    fVar268 = auVar32._28_4_ + fVar214;
    auVar233._0_4_ = fVar166 * fVar166 + fVar162 * fVar162 + fVar237 * fVar237;
    auVar233._4_4_ = fVar240 * fVar240 + fVar167 * fVar167 + fVar239 * fVar239;
    auVar233._8_4_ = fVar264 * fVar264 + fVar262 * fVar262 + fVar263 * fVar263;
    auVar233._12_4_ = fVar280 * fVar280 + fVar278 * fVar278 + fVar279 * fVar279;
    auVar233._16_4_ = fVar370 * fVar370 + fVar362 * fVar362 + fVar366 * fVar366;
    auVar233._20_4_ = fVar408 * fVar408 + fVar407 * fVar407 + fVar409 * fVar409;
    auVar233._24_4_ = fVar420 * fVar420 + fVar417 * fVar417 + fVar419 * fVar419;
    auVar233._28_4_ = fVar214 + fVar214 + fVar268;
    auVar124 = vrcpps_avx(auVar233);
    fVar281 = auVar124._0_4_;
    fVar282 = auVar124._4_4_;
    auVar50._4_4_ = fVar282 * auVar233._4_4_;
    auVar50._0_4_ = fVar281 * auVar233._0_4_;
    fVar283 = auVar124._8_4_;
    auVar50._8_4_ = fVar283 * auVar233._8_4_;
    fVar374 = auVar124._12_4_;
    auVar50._12_4_ = fVar374 * auVar233._12_4_;
    fVar378 = auVar124._16_4_;
    auVar50._16_4_ = fVar378 * auVar233._16_4_;
    fVar396 = auVar124._20_4_;
    auVar50._20_4_ = fVar396 * auVar233._20_4_;
    fVar267 = auVar124._24_4_;
    auVar50._24_4_ = fVar267 * auVar233._24_4_;
    auVar50._28_4_ = fVar212;
    auVar402._8_4_ = 0x3f800000;
    auVar402._0_8_ = 0x3f8000003f800000;
    auVar402._12_4_ = 0x3f800000;
    auVar402._16_4_ = 0x3f800000;
    auVar402._20_4_ = 0x3f800000;
    auVar402._24_4_ = 0x3f800000;
    auVar402._28_4_ = 0x3f800000;
    auVar34 = vsubps_avx(auVar402,auVar50);
    fVar281 = auVar34._0_4_ * fVar281 + fVar281;
    fVar282 = auVar34._4_4_ * fVar282 + fVar282;
    fVar283 = auVar34._8_4_ * fVar283 + fVar283;
    fVar374 = auVar34._12_4_ * fVar374 + fVar374;
    fVar378 = auVar34._16_4_ * fVar378 + fVar378;
    fVar396 = auVar34._20_4_ * fVar396 + fVar396;
    fVar267 = auVar34._24_4_ * fVar267 + fVar267;
    auVar185 = vperm2f128_avx(local_780,local_780,1);
    auVar185 = vshufps_avx(auVar185,local_780,0x30);
    local_820 = vshufps_avx(local_780,auVar185,0x29);
    auVar185 = vperm2f128_avx(local_a00,local_a00,1);
    auVar185 = vshufps_avx(auVar185,local_a00,0x30);
    _local_960 = vshufps_avx(local_a00,auVar185,0x29);
    fVar353 = local_960._0_4_;
    fVar361 = local_960._4_4_;
    auVar51._4_4_ = fVar361 * fVar167;
    auVar51._0_4_ = fVar353 * fVar162;
    fVar365 = local_960._8_4_;
    auVar51._8_4_ = fVar365 * fVar262;
    fVar369 = local_960._12_4_;
    auVar51._12_4_ = fVar369 * fVar278;
    fVar373 = local_960._16_4_;
    auVar51._16_4_ = fVar373 * fVar362;
    fVar377 = local_960._20_4_;
    auVar51._20_4_ = fVar377 * fVar407;
    fVar381 = local_960._24_4_;
    auVar51._24_4_ = fVar381 * fVar417;
    auVar51._28_4_ = auVar185._28_4_;
    fVar172 = local_820._0_4_;
    fVar195 = local_820._4_4_;
    auVar52._4_4_ = fVar195 * fVar239;
    auVar52._0_4_ = fVar172 * fVar237;
    fVar198 = local_820._8_4_;
    auVar52._8_4_ = fVar198 * fVar263;
    fVar201 = local_820._12_4_;
    auVar52._12_4_ = fVar201 * fVar279;
    fVar204 = local_820._16_4_;
    auVar52._16_4_ = fVar204 * fVar366;
    fVar207 = local_820._20_4_;
    auVar52._20_4_ = fVar207 * fVar409;
    fVar210 = local_820._24_4_;
    auVar52._24_4_ = fVar210 * fVar419;
    auVar52._28_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar52,auVar51);
    auVar185 = vperm2f128_avx(auVar42,auVar42,1);
    auVar185 = vshufps_avx(auVar185,auVar42,0x30);
    local_860 = vshufps_avx(auVar42,auVar185,0x29);
    fVar320 = local_860._0_4_;
    fVar333 = local_860._4_4_;
    auVar53._4_4_ = fVar333 * fVar239;
    auVar53._0_4_ = fVar320 * fVar237;
    fVar336 = local_860._8_4_;
    auVar53._8_4_ = fVar336 * fVar263;
    fVar339 = local_860._12_4_;
    auVar53._12_4_ = fVar339 * fVar279;
    fVar342 = local_860._16_4_;
    auVar53._16_4_ = fVar342 * fVar366;
    fVar345 = local_860._20_4_;
    auVar53._20_4_ = fVar345 * fVar409;
    fVar348 = local_860._24_4_;
    auVar53._24_4_ = fVar348 * fVar419;
    auVar53._28_4_ = auVar185._28_4_;
    auVar37 = _local_960;
    auVar54._4_4_ = fVar361 * fVar240;
    auVar54._0_4_ = fVar353 * fVar166;
    auVar54._8_4_ = fVar365 * fVar264;
    auVar54._12_4_ = fVar369 * fVar280;
    auVar54._16_4_ = fVar373 * fVar370;
    auVar54._20_4_ = fVar377 * fVar408;
    auVar54._24_4_ = fVar381 * fVar420;
    auVar54._28_4_ = -auVar232._28_4_;
    auVar36 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ = fVar240 * fVar195;
    auVar55._0_4_ = fVar166 * fVar172;
    auVar55._8_4_ = fVar264 * fVar198;
    auVar55._12_4_ = fVar280 * fVar201;
    auVar55._16_4_ = fVar370 * fVar204;
    auVar55._20_4_ = fVar408 * fVar207;
    auVar55._24_4_ = fVar420 * fVar210;
    auVar55._28_4_ = -auVar232._28_4_;
    auVar56._4_4_ = fVar333 * fVar167;
    auVar56._0_4_ = fVar320 * fVar162;
    auVar56._8_4_ = fVar336 * fVar262;
    auVar56._12_4_ = fVar339 * fVar278;
    auVar56._16_4_ = fVar342 * fVar362;
    auVar56._20_4_ = fVar345 * fVar407;
    auVar56._24_4_ = fVar348 * fVar417;
    auVar56._28_4_ = fStack_1c4;
    auVar185 = vsubps_avx(auVar56,auVar55);
    fVar214 = auVar185._28_4_;
    auVar57._4_4_ =
         (auVar31._4_4_ * auVar31._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar33._4_4_ * auVar33._4_4_) * fVar282;
    auVar57._0_4_ =
         (auVar31._0_4_ * auVar31._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar33._0_4_ * auVar33._0_4_) * fVar281;
    auVar57._8_4_ =
         (auVar31._8_4_ * auVar31._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar33._8_4_ * auVar33._8_4_) * fVar283;
    auVar57._12_4_ =
         (auVar31._12_4_ * auVar31._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar33._12_4_ * auVar33._12_4_) * fVar374;
    auVar57._16_4_ =
         (auVar31._16_4_ * auVar31._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar33._16_4_ * auVar33._16_4_) * fVar378;
    auVar57._20_4_ =
         (auVar31._20_4_ * auVar31._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar33._20_4_ * auVar33._20_4_) * fVar396;
    auVar57._24_4_ =
         (auVar31._24_4_ * auVar31._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar33._24_4_ * auVar33._24_4_) * fVar267;
    auVar57._28_4_ = auVar31._28_4_ + fVar268;
    auVar58._4_4_ =
         (auVar35._4_4_ * auVar35._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar185._4_4_ * auVar185._4_4_) * fVar282;
    auVar58._0_4_ =
         (auVar35._0_4_ * auVar35._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar185._0_4_ * auVar185._0_4_) * fVar281;
    auVar58._8_4_ =
         (auVar35._8_4_ * auVar35._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar185._8_4_ * auVar185._8_4_) * fVar283;
    auVar58._12_4_ =
         (auVar35._12_4_ * auVar35._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar185._12_4_ * auVar185._12_4_) * fVar374;
    auVar58._16_4_ =
         (auVar35._16_4_ * auVar35._16_4_ +
         auVar36._16_4_ * auVar36._16_4_ + auVar185._16_4_ * auVar185._16_4_) * fVar378;
    auVar58._20_4_ =
         (auVar35._20_4_ * auVar35._20_4_ +
         auVar36._20_4_ * auVar36._20_4_ + auVar185._20_4_ * auVar185._20_4_) * fVar396;
    auVar58._24_4_ =
         (auVar35._24_4_ * auVar35._24_4_ +
         auVar36._24_4_ * auVar36._24_4_ + auVar185._24_4_ * auVar185._24_4_) * fVar267;
    auVar58._28_4_ = auVar34._28_4_ + auVar124._28_4_;
    auVar124 = vmaxps_avx(auVar57,auVar58);
    auVar185 = vperm2f128_avx(local_7c0,local_7c0,1);
    auVar185 = vshufps_avx(auVar185,local_7c0,0x30);
    _local_6c0 = vshufps_avx(local_7c0,auVar185,0x29);
    local_740._0_4_ = (float)local_7c0._0_4_ + fVar170;
    local_740._4_4_ = local_7c0._4_4_ + fVar241;
    local_740._8_4_ = local_7c0._8_4_ + fVar261;
    local_740._12_4_ = local_7c0._12_4_ + fVar266;
    local_740._16_4_ = local_7c0._16_4_ + fVar211;
    local_740._20_4_ = local_7c0._20_4_ + fVar238;
    local_740._24_4_ = local_7c0._24_4_ + fVar243;
    local_740._28_4_ = local_7c0._28_4_ + fVar265;
    auVar185 = vmaxps_avx(local_7c0,local_740);
    auVar31 = vmaxps_avx(local_7e0,_local_6c0);
    auVar31 = vmaxps_avx(auVar185,auVar31);
    auVar32 = vrsqrtps_avx(auVar233);
    fVar211 = auVar32._0_4_;
    fVar170 = auVar32._4_4_;
    fVar238 = auVar32._8_4_;
    fVar241 = auVar32._12_4_;
    fVar243 = auVar32._16_4_;
    fVar261 = auVar32._20_4_;
    fVar265 = auVar32._24_4_;
    auVar59._4_4_ = fVar170 * fVar170 * fVar170 * auVar233._4_4_ * 0.5;
    auVar59._0_4_ = fVar211 * fVar211 * fVar211 * auVar233._0_4_ * 0.5;
    auVar59._8_4_ = fVar238 * fVar238 * fVar238 * auVar233._8_4_ * 0.5;
    auVar59._12_4_ = fVar241 * fVar241 * fVar241 * auVar233._12_4_ * 0.5;
    auVar59._16_4_ = fVar243 * fVar243 * fVar243 * auVar233._16_4_ * 0.5;
    auVar59._20_4_ = fVar261 * fVar261 * fVar261 * auVar233._20_4_ * 0.5;
    auVar59._24_4_ = fVar265 * fVar265 * fVar265 * auVar233._24_4_ * 0.5;
    auVar59._28_4_ = auVar233._28_4_;
    auVar60._4_4_ = fVar170 * 1.5;
    auVar60._0_4_ = fVar211 * 1.5;
    auVar60._8_4_ = fVar238 * 1.5;
    auVar60._12_4_ = fVar241 * 1.5;
    auVar60._16_4_ = fVar243 * 1.5;
    auVar60._20_4_ = fVar261 * 1.5;
    auVar60._24_4_ = fVar265 * 1.5;
    auVar60._28_4_ = auVar32._28_4_;
    local_540 = vsubps_avx(auVar60,auVar59);
    auVar94._4_4_ = fVar359;
    auVar94._0_4_ = fVar351;
    auVar94._8_4_ = fVar363;
    auVar94._12_4_ = fVar367;
    auVar94._16_4_ = fVar371;
    auVar94._20_4_ = fVar375;
    auVar94._24_4_ = fVar379;
    auVar94._28_4_ = fVar382;
    auVar185 = ZEXT1232(ZEXT812(0)) << 0x20;
    _local_980 = vsubps_avx(auVar185,auVar94);
    auVar92._4_4_ = fVar193;
    auVar92._0_4_ = fVar169;
    auVar92._8_4_ = fVar196;
    auVar92._12_4_ = fVar199;
    auVar92._16_4_ = fVar202;
    auVar92._20_4_ = fVar205;
    auVar92._24_4_ = fVar208;
    auVar92._28_4_ = fVar212;
    auVar185 = vsubps_avx(auVar185,auVar92);
    fVar321 = auVar185._0_4_;
    fVar334 = auVar185._4_4_;
    fVar337 = auVar185._8_4_;
    fVar340 = auVar185._12_4_;
    fVar343 = auVar185._16_4_;
    fVar346 = auVar185._20_4_;
    fVar349 = auVar185._24_4_;
    fVar211 = local_980._0_4_;
    fVar241 = local_980._4_4_;
    fVar265 = local_980._8_4_;
    fVar281 = local_980._12_4_;
    fVar374 = local_980._16_4_;
    fVar267 = local_980._20_4_;
    fVar421 = local_980._24_4_;
    auVar98._4_4_ = fStack_7fc;
    auVar98._0_4_ = local_800;
    auVar98._8_4_ = fStack_7f8;
    auVar98._12_4_ = aStack_7f4;
    auVar98._16_4_ = fStack_7f0;
    auVar98._20_4_ = fStack_7ec;
    auVar98._24_4_ = fStack_7e8;
    auVar98._28_4_ = fStack_7e4;
    auVar33 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar98);
    fVar170 = auVar33._0_4_;
    fVar243 = auVar33._4_4_;
    fVar266 = auVar33._8_4_;
    fVar282 = auVar33._12_4_;
    fVar378 = auVar33._16_4_;
    fVar416 = auVar33._20_4_;
    fVar422 = auVar33._24_4_;
    auVar389._0_4_ = local_520 * fVar170 + local_3e0 * fVar211 + fVar321 * local_6e0;
    auVar389._4_4_ = fStack_51c * fVar243 + fStack_3dc * fVar241 + fVar334 * fStack_6dc;
    auVar389._8_4_ = fStack_518 * fVar266 + fStack_3d8 * fVar265 + fVar337 * fStack_6d8;
    auVar389._12_4_ = fStack_514 * fVar282 + fStack_3d4 * fVar281 + fVar340 * fStack_6d4;
    auVar389._16_4_ = fStack_510 * fVar378 + fStack_3d0 * fVar374 + fVar343 * fStack_6d0;
    auVar389._20_4_ = fStack_50c * fVar416 + fStack_3cc * fVar267 + fVar346 * fStack_6cc;
    auVar389._24_4_ = fStack_508 * fVar422 + fStack_3c8 * fVar421 + fVar349 * fStack_6c8;
    auVar389._28_4_ = fVar214 + auVar35._28_4_ + auVar36._28_4_ + fVar214 + auVar32._28_4_;
    auVar414._0_4_ = fVar170 * fVar170 + fVar211 * fVar211 + fVar321 * fVar321;
    auVar414._4_4_ = fVar243 * fVar243 + fVar241 * fVar241 + fVar334 * fVar334;
    auVar414._8_4_ = fVar266 * fVar266 + fVar265 * fVar265 + fVar337 * fVar337;
    auVar414._12_4_ = fVar282 * fVar282 + fVar281 * fVar281 + fVar340 * fVar340;
    auVar414._16_4_ = fVar378 * fVar378 + fVar374 * fVar374 + fVar343 * fVar343;
    auVar414._20_4_ = fVar416 * fVar416 + fVar267 * fVar267 + fVar346 * fVar346;
    auVar414._24_4_ = fVar422 * fVar422 + fVar421 * fVar421 + fVar349 * fVar349;
    auVar414._28_4_ = fStack_1c4 + fStack_1c4 + fVar214;
    fVar238 = local_540._0_4_;
    fVar261 = local_540._4_4_;
    fVar268 = local_540._8_4_;
    fVar283 = local_540._12_4_;
    fVar396 = local_540._16_4_;
    fVar299 = local_540._20_4_;
    fVar423 = local_540._24_4_;
    fVar214 = local_640._28_4_;
    local_720._0_4_ =
         local_520 * fVar166 * fVar238 +
         local_3e0 * fVar162 * fVar238 + fVar237 * fVar238 * local_6e0;
    local_720._4_4_ =
         fStack_51c * fVar240 * fVar261 +
         fStack_3dc * fVar167 * fVar261 + fVar239 * fVar261 * fStack_6dc;
    fStack_718 = fStack_518 * fVar264 * fVar268 +
                 fStack_3d8 * fVar262 * fVar268 + fVar263 * fVar268 * fStack_6d8;
    fStack_714 = fStack_514 * fVar280 * fVar283 +
                 fStack_3d4 * fVar278 * fVar283 + fVar279 * fVar283 * fStack_6d4;
    fStack_710 = fStack_510 * fVar370 * fVar396 +
                 fStack_3d0 * fVar362 * fVar396 + fVar366 * fVar396 * fStack_6d0;
    fStack_70c = fStack_50c * fVar408 * fVar299 +
                 fStack_3cc * fVar407 * fVar299 + fVar409 * fVar299 * fStack_6cc;
    fStack_708 = fStack_508 * fVar420 * fVar423 +
                 fStack_3c8 * fVar417 * fVar423 + fVar419 * fVar423 * fStack_6c8;
    local_900 = auVar185;
    fVar431 = local_8a0._28_4_ + fVar214 + fStack_6c4;
    fVar442 = fVar170 * fVar166 * fVar238 +
              fVar162 * fVar238 * fVar211 + fVar321 * fVar237 * fVar238;
    fVar447 = fVar243 * fVar240 * fVar261 +
              fVar167 * fVar261 * fVar241 + fVar334 * fVar239 * fVar261;
    fVar448 = fVar266 * fVar264 * fVar268 +
              fVar262 * fVar268 * fVar265 + fVar337 * fVar263 * fVar268;
    fVar449 = fVar282 * fVar280 * fVar283 +
              fVar278 * fVar283 * fVar281 + fVar340 * fVar279 * fVar283;
    fVar450 = fVar378 * fVar370 * fVar396 +
              fVar362 * fVar396 * fVar374 + fVar343 * fVar366 * fVar396;
    fVar451 = fVar416 * fVar408 * fVar299 +
              fVar407 * fVar299 * fVar267 + fVar346 * fVar409 * fVar299;
    fVar452 = fVar422 * fVar420 * fVar423 +
              fVar417 * fVar423 * fVar421 + fVar349 * fVar419 * fVar423;
    fVar453 = fVar214 + fVar431;
    auVar61._4_4_ = (float)local_720._4_4_ * fVar447;
    auVar61._0_4_ = (float)local_720._0_4_ * fVar442;
    auVar61._8_4_ = fStack_718 * fVar448;
    auVar61._12_4_ = fStack_714 * fVar449;
    auVar61._16_4_ = fStack_710 * fVar450;
    auVar61._20_4_ = fStack_70c * fVar451;
    auVar61._24_4_ = fStack_708 * fVar452;
    auVar61._28_4_ = fVar431;
    auVar32 = vsubps_avx(auVar389,auVar61);
    auVar62._4_4_ = fVar447 * fVar447;
    auVar62._0_4_ = fVar442 * fVar442;
    auVar62._8_4_ = fVar448 * fVar448;
    auVar62._12_4_ = fVar449 * fVar449;
    auVar62._16_4_ = fVar450 * fVar450;
    auVar62._20_4_ = fVar451 * fVar451;
    auVar62._24_4_ = fVar452 * fVar452;
    auVar62._28_4_ = fVar214;
    local_5a0 = vsubps_avx(auVar414,auVar62);
    _local_620 = vsqrtps_avx(auVar124);
    fVar431 = (auVar31._0_4_ + local_620._0_4_) * 1.0000002;
    fVar433 = (auVar31._4_4_ + local_620._4_4_) * 1.0000002;
    fVar435 = (auVar31._8_4_ + local_620._8_4_) * 1.0000002;
    fVar437 = (auVar31._12_4_ + local_620._12_4_) * 1.0000002;
    fVar439 = (auVar31._16_4_ + local_620._16_4_) * 1.0000002;
    fVar441 = (auVar31._20_4_ + local_620._20_4_) * 1.0000002;
    fVar168 = (auVar31._24_4_ + local_620._24_4_) * 1.0000002;
    auVar63._4_4_ = fVar433 * fVar433;
    auVar63._0_4_ = fVar431 * fVar431;
    auVar63._8_4_ = fVar435 * fVar435;
    auVar63._12_4_ = fVar437 * fVar437;
    auVar63._16_4_ = fVar439 * fVar439;
    auVar63._20_4_ = fVar441 * fVar441;
    auVar63._24_4_ = fVar168 * fVar168;
    auVar63._28_4_ = auVar31._28_4_ + local_620._28_4_;
    fVar433 = auVar32._0_4_ + auVar32._0_4_;
    fVar435 = auVar32._4_4_ + auVar32._4_4_;
    local_2c0._0_8_ = CONCAT44(fVar435,fVar433);
    local_2c0._8_4_ = auVar32._8_4_ + auVar32._8_4_;
    local_2c0._12_4_ = auVar32._12_4_ + auVar32._12_4_;
    local_2c0._16_4_ = auVar32._16_4_ + auVar32._16_4_;
    local_2c0._20_4_ = auVar32._20_4_ + auVar32._20_4_;
    local_2c0._24_4_ = auVar32._24_4_ + auVar32._24_4_;
    local_2c0._28_4_ = auVar32._28_4_ + auVar32._28_4_;
    auVar32 = vsubps_avx(local_5a0,auVar63);
    local_660._4_4_ = (float)local_720._4_4_ * (float)local_720._4_4_;
    local_660._0_4_ = (float)local_720._0_4_ * (float)local_720._0_4_;
    fStack_658 = fStack_718 * fStack_718;
    fStack_654 = fStack_714 * fStack_714;
    fStack_650 = fStack_710 * fStack_710;
    fStack_64c = fStack_70c * fStack_70c;
    fStack_648 = fStack_708 * fStack_708;
    fStack_644 = auVar31._28_4_;
    local_440 = vsubps_avx(local_260,_local_660);
    local_5c0._4_4_ = (uint)(fVar435 * fVar435);
    local_5c0._0_4_ = (uint)(fVar433 * fVar433);
    local_5c0._8_4_ = (uint)(local_2c0._8_4_ * local_2c0._8_4_);
    local_5c0._12_4_ = (uint)(local_2c0._12_4_ * local_2c0._12_4_);
    local_5c0._16_4_ = (uint)(local_2c0._16_4_ * local_2c0._16_4_);
    local_5c0._20_4_ = (uint)(local_2c0._20_4_ * local_2c0._20_4_);
    fVar431 = local_540._28_4_;
    local_5c0._24_4_ = (uint)(local_2c0._24_4_ * local_2c0._24_4_);
    local_5c0._28_4_ = (uint)fVar431;
    fVar437 = local_440._0_4_;
    local_700._0_4_ = fVar437 * 4.0;
    fVar439 = local_440._4_4_;
    local_700._4_4_ = fVar439 * 4.0;
    fVar441 = local_440._8_4_;
    fStack_6f8 = fVar441 * 4.0;
    fVar168 = local_440._12_4_;
    fStack_6f4 = fVar168 * 4.0;
    fVar454 = local_440._16_4_;
    fStack_6f0 = fVar454 * 4.0;
    fVar455 = local_440._20_4_;
    fStack_6ec = fVar455 * 4.0;
    fVar456 = local_440._24_4_;
    fStack_6e8 = fVar456 * 4.0;
    fStack_6e4 = 4.0;
    auVar64._4_4_ = auVar32._4_4_ * (float)local_700._4_4_;
    auVar64._0_4_ = auVar32._0_4_ * (float)local_700._0_4_;
    auVar64._8_4_ = auVar32._8_4_ * fStack_6f8;
    auVar64._12_4_ = auVar32._12_4_ * fStack_6f4;
    auVar64._16_4_ = auVar32._16_4_ * fStack_6f0;
    auVar64._20_4_ = auVar32._20_4_ * fStack_6ec;
    auVar64._24_4_ = auVar32._24_4_ * fStack_6e8;
    auVar64._28_4_ = 0x40800000;
    auVar31 = vsubps_avx(local_5c0,auVar64);
    auVar124 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,5);
    fStack_704 = local_8a0._28_4_ + fVar214 + fStack_6c4;
    fVar214 = local_440._28_4_;
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      auVar427._8_4_ = 0x7f800000;
      auVar427._0_8_ = 0x7f8000007f800000;
      auVar427._12_4_ = 0x7f800000;
      auVar427._16_4_ = 0x7f800000;
      auVar427._20_4_ = 0x7f800000;
      auVar427._24_4_ = 0x7f800000;
      auVar427._28_4_ = 0x7f800000;
      auVar403._8_4_ = 0xff800000;
      auVar403._0_8_ = 0xff800000ff800000;
      auVar403._12_4_ = 0xff800000;
      auVar403._16_4_ = 0xff800000;
      auVar403._20_4_ = 0xff800000;
      auVar403._24_4_ = 0xff800000;
      auVar403._28_4_ = 0xff800000;
    }
    else {
      auVar185 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,5);
      auVar34 = vsqrtps_avx(auVar31);
      auVar289._0_4_ = fVar437 + fVar437;
      auVar289._4_4_ = fVar439 + fVar439;
      auVar289._8_4_ = fVar441 + fVar441;
      auVar289._12_4_ = fVar168 + fVar168;
      auVar289._16_4_ = fVar454 + fVar454;
      auVar289._20_4_ = fVar455 + fVar455;
      auVar289._24_4_ = fVar456 + fVar456;
      auVar289._28_4_ = fVar214 + fVar214;
      auVar31 = vrcpps_avx(auVar289);
      fVar284 = auVar31._0_4_;
      fVar295 = auVar31._4_4_;
      auVar65._4_4_ = auVar289._4_4_ * fVar295;
      auVar65._0_4_ = auVar289._0_4_ * fVar284;
      fVar296 = auVar31._8_4_;
      auVar65._8_4_ = auVar289._8_4_ * fVar296;
      fVar297 = auVar31._12_4_;
      auVar65._12_4_ = auVar289._12_4_ * fVar297;
      fVar242 = auVar31._16_4_;
      auVar65._16_4_ = auVar289._16_4_ * fVar242;
      fVar298 = auVar31._20_4_;
      auVar65._20_4_ = auVar289._20_4_ * fVar298;
      fVar300 = auVar31._24_4_;
      auVar65._24_4_ = auVar289._24_4_ * fVar300;
      auVar65._28_4_ = auVar289._28_4_;
      auVar390._8_4_ = 0x3f800000;
      auVar390._0_8_ = 0x3f8000003f800000;
      auVar390._12_4_ = 0x3f800000;
      auVar390._16_4_ = 0x3f800000;
      auVar390._20_4_ = 0x3f800000;
      auVar390._24_4_ = 0x3f800000;
      auVar390._28_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar390,auVar65);
      fVar284 = fVar284 + fVar284 * auVar35._0_4_;
      fVar295 = fVar295 + fVar295 * auVar35._4_4_;
      fVar296 = fVar296 + fVar296 * auVar35._8_4_;
      fVar297 = fVar297 + fVar297 * auVar35._12_4_;
      fVar242 = fVar242 + fVar242 * auVar35._16_4_;
      fVar298 = fVar298 + fVar298 * auVar35._20_4_;
      fVar300 = fVar300 + fVar300 * auVar35._24_4_;
      auVar308._0_8_ = CONCAT44(fVar435,fVar433) ^ 0x8000000080000000;
      auVar308._8_4_ = -local_2c0._8_4_;
      auVar308._12_4_ = -local_2c0._12_4_;
      auVar308._16_4_ = -local_2c0._16_4_;
      auVar308._20_4_ = -local_2c0._20_4_;
      auVar308._24_4_ = -local_2c0._24_4_;
      auVar308._28_4_ = -local_2c0._28_4_;
      auVar36 = vsubps_avx(auVar308,auVar34);
      fVar433 = auVar36._0_4_ * fVar284;
      fVar435 = auVar36._4_4_ * fVar295;
      auVar66._4_4_ = fVar435;
      auVar66._0_4_ = fVar433;
      fVar314 = auVar36._8_4_ * fVar296;
      auVar66._8_4_ = fVar314;
      fVar315 = auVar36._12_4_ * fVar297;
      auVar66._12_4_ = fVar315;
      fVar316 = auVar36._16_4_ * fVar242;
      auVar66._16_4_ = fVar316;
      fVar317 = auVar36._20_4_ * fVar298;
      auVar66._20_4_ = fVar317;
      fVar318 = auVar36._24_4_ * fVar300;
      auVar66._24_4_ = fVar318;
      auVar66._28_4_ = auVar36._28_4_;
      auVar34 = vsubps_avx(auVar34,local_2c0);
      fVar284 = auVar34._0_4_ * fVar284;
      fVar295 = auVar34._4_4_ * fVar295;
      auVar67._4_4_ = fVar295;
      auVar67._0_4_ = fVar284;
      fVar296 = auVar34._8_4_ * fVar296;
      auVar67._8_4_ = fVar296;
      fVar297 = auVar34._12_4_ * fVar297;
      auVar67._12_4_ = fVar297;
      fVar242 = auVar34._16_4_ * fVar242;
      auVar67._16_4_ = fVar242;
      fVar298 = auVar34._20_4_ * fVar298;
      auVar67._20_4_ = fVar298;
      fVar300 = auVar34._24_4_ * fVar300;
      auVar67._24_4_ = fVar300;
      auVar67._28_4_ = auVar34._28_4_;
      local_5e0._4_4_ = fVar261 * (fVar447 + (float)local_720._4_4_ * fVar435);
      local_5e0._0_4_ = fVar238 * (fVar442 + (float)local_720._0_4_ * fVar433);
      fStack_5d8 = fVar268 * (fVar448 + fStack_718 * fVar314);
      fStack_5d4 = fVar283 * (fVar449 + fStack_714 * fVar315);
      fStack_5d0 = fVar396 * (fVar450 + fStack_710 * fVar316);
      fStack_5cc = fVar299 * (fVar451 + fStack_70c * fVar317);
      fStack_5c8 = fVar423 * (fVar452 + fStack_708 * fVar318);
      fStack_5c4 = fVar453 + auVar31._28_4_ + auVar35._28_4_;
      auVar391._8_4_ = 0x7fffffff;
      auVar391._0_8_ = 0x7fffffff7fffffff;
      auVar391._12_4_ = 0x7fffffff;
      auVar391._16_4_ = 0x7fffffff;
      auVar391._20_4_ = 0x7fffffff;
      auVar391._24_4_ = 0x7fffffff;
      auVar391._28_4_ = 0x7fffffff;
      auVar31 = vandps_avx(_local_660,auVar391);
      auVar34 = vmaxps_avx(local_420,auVar31);
      auVar68._4_4_ = auVar34._4_4_ * 1.9073486e-06;
      auVar68._0_4_ = auVar34._0_4_ * 1.9073486e-06;
      auVar68._8_4_ = auVar34._8_4_ * 1.9073486e-06;
      auVar68._12_4_ = auVar34._12_4_ * 1.9073486e-06;
      auVar68._16_4_ = auVar34._16_4_ * 1.9073486e-06;
      auVar68._20_4_ = auVar34._20_4_ * 1.9073486e-06;
      auVar68._24_4_ = auVar34._24_4_ * 1.9073486e-06;
      auVar68._28_4_ = auVar34._28_4_;
      auVar31 = vandps_avx(local_440,auVar391);
      auVar31 = vcmpps_avx(auVar31,auVar68,1);
      auVar404._8_4_ = 0x7f800000;
      auVar404._0_8_ = 0x7f8000007f800000;
      auVar404._12_4_ = 0x7f800000;
      auVar404._16_4_ = 0x7f800000;
      auVar404._20_4_ = 0x7f800000;
      auVar404._24_4_ = 0x7f800000;
      auVar404._28_4_ = 0x7f800000;
      auVar427 = vblendvps_avx(auVar404,auVar66,auVar185);
      local_600 = fVar238 * (fVar442 + (float)local_720._0_4_ * fVar284);
      fStack_5fc = fVar261 * (fVar447 + (float)local_720._4_4_ * fVar295);
      fStack_5f8 = fVar268 * (fVar448 + fStack_718 * fVar296);
      fStack_5f4 = fVar283 * (fVar449 + fStack_714 * fVar297);
      fStack_5f0 = fVar396 * (fVar450 + fStack_710 * fVar242);
      fStack_5ec = fVar299 * (fVar451 + fStack_70c * fVar298);
      fStack_5e8 = fVar423 * (fVar452 + fStack_708 * fVar300);
      fStack_5e4 = fVar453 + auVar34._28_4_;
      auVar290._8_4_ = 0xff800000;
      auVar290._0_8_ = 0xff800000ff800000;
      auVar290._12_4_ = 0xff800000;
      auVar290._16_4_ = 0xff800000;
      auVar290._20_4_ = 0xff800000;
      auVar290._24_4_ = 0xff800000;
      auVar290._28_4_ = 0xff800000;
      auVar403 = vblendvps_avx(auVar290,auVar67,auVar185);
      auVar34 = auVar185 & auVar31;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar31,auVar185);
        auVar225 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar32 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,2);
        auVar445._8_4_ = 0xff800000;
        auVar445._0_8_ = 0xff800000ff800000;
        auVar445._12_4_ = 0xff800000;
        auVar445._16_4_ = 0xff800000;
        auVar445._20_4_ = 0xff800000;
        auVar445._24_4_ = 0xff800000;
        auVar445._28_4_ = 0xff800000;
        auVar415._8_4_ = 0x7f800000;
        auVar415._0_8_ = 0x7f8000007f800000;
        auVar415._12_4_ = 0x7f800000;
        auVar415._16_4_ = 0x7f800000;
        auVar415._20_4_ = 0x7f800000;
        auVar415._24_4_ = 0x7f800000;
        auVar415._28_4_ = 0x7f800000;
        auVar31 = vblendvps_avx(auVar415,auVar445,auVar32);
        auVar250 = vpmovsxwd_avx(auVar225);
        auVar225 = vpunpckhwd_avx(auVar225,auVar225);
        auVar277._16_16_ = auVar225;
        auVar277._0_16_ = auVar250;
        auVar427 = vblendvps_avx(auVar427,auVar31,auVar277);
        auVar31 = vblendvps_avx(auVar445,auVar415,auVar32);
        auVar403 = vblendvps_avx(auVar403,auVar31,auVar277);
        auVar31 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar161._0_4_ = auVar124._0_4_ ^ auVar31._0_4_;
        auVar161._4_4_ = auVar124._4_4_ ^ auVar31._4_4_;
        auVar161._8_4_ = auVar124._8_4_ ^ auVar31._8_4_;
        auVar161._12_4_ = auVar124._12_4_ ^ auVar31._12_4_;
        auVar161._16_4_ = auVar124._16_4_ ^ auVar31._16_4_;
        auVar161._20_4_ = auVar124._20_4_ ^ auVar31._20_4_;
        auVar161._24_4_ = auVar124._24_4_ ^ auVar31._24_4_;
        auVar161._28_4_ = auVar124._28_4_ ^ auVar31._28_4_;
        auVar124 = vorps_avx(auVar32,auVar161);
        auVar124 = vandps_avx(auVar185,auVar124);
      }
    }
    auVar395 = ZEXT3264(CONCAT428(fStack_6c4,
                                  CONCAT424(fStack_6c8,
                                            CONCAT420(fStack_6cc,
                                                      CONCAT416(fStack_6d0,
                                                                CONCAT412(fStack_6d4,
                                                                          CONCAT48(fStack_6d8,
                                                                                   CONCAT44(
                                                  fStack_6dc,local_6e0))))))));
    auVar330 = ZEXT3264(auVar185);
    auVar185 = local_400 & auVar124;
    local_8a0._0_8_ = uVar103;
    if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar185 >> 0x7f,0) == '\0') &&
          (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar185 >> 0xbf,0) == '\0') &&
        (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar185[0x1f])
    {
      auVar430 = ZEXT3264(_local_a20);
      auVar406 = ZEXT3264(_local_840);
    }
    else {
      auVar225 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_750._0_4_));
      auVar225 = vshufps_avx(auVar225,auVar225,0);
      auVar275._16_16_ = auVar225;
      auVar275._0_16_ = auVar225;
      auVar32 = vmaxps_avx(auVar275,auVar427);
      auVar225 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_750._0_4_));
      auVar225 = vshufps_avx(auVar225,auVar225,0);
      auVar276._16_16_ = auVar225;
      auVar276._0_16_ = auVar225;
      auVar34 = vminps_avx(auVar276,auVar403);
      fVar242 = fVar431 + local_5a0._28_4_;
      auVar186._0_4_ = local_520 * fVar319 + local_3e0 * fVar171 + local_6e0 * fVar352;
      auVar186._4_4_ = fStack_51c * fVar332 + fStack_3dc * fVar194 + fStack_6dc * fVar360;
      auVar186._8_4_ = fStack_518 * fVar335 + fStack_3d8 * fVar197 + fStack_6d8 * fVar364;
      auVar186._12_4_ = fStack_514 * fVar338 + fStack_3d4 * fVar200 + fStack_6d4 * fVar368;
      auVar186._16_4_ = fStack_510 * fVar341 + fStack_3d0 * fVar203 + fStack_6d0 * fVar372;
      auVar186._20_4_ = fStack_50c * fVar344 + fStack_3cc * fVar206 + fStack_6cc * fVar376;
      auVar186._24_4_ = fStack_508 * fVar347 + fStack_3c8 * fVar209 + fStack_6c8 * fVar380;
      auVar186._28_4_ = fVar242 + fVar213 + fVar242;
      auVar185 = vrcpps_avx(auVar186);
      fVar433 = auVar185._0_4_;
      fVar435 = auVar185._4_4_;
      auVar69._4_4_ = auVar186._4_4_ * fVar435;
      auVar69._0_4_ = auVar186._0_4_ * fVar433;
      fVar213 = auVar185._8_4_;
      auVar69._8_4_ = auVar186._8_4_ * fVar213;
      fVar284 = auVar185._12_4_;
      auVar69._12_4_ = auVar186._12_4_ * fVar284;
      fVar295 = auVar185._16_4_;
      auVar69._16_4_ = auVar186._16_4_ * fVar295;
      fVar296 = auVar185._20_4_;
      auVar69._20_4_ = auVar186._20_4_ * fVar296;
      fVar297 = auVar185._24_4_;
      auVar69._24_4_ = auVar186._24_4_ * fVar297;
      auVar69._28_4_ = fVar350;
      auVar392._8_4_ = 0x3f800000;
      auVar392._0_8_ = 0x3f8000003f800000;
      auVar392._12_4_ = 0x3f800000;
      auVar392._16_4_ = 0x3f800000;
      auVar392._20_4_ = 0x3f800000;
      auVar392._24_4_ = 0x3f800000;
      auVar392._28_4_ = 0x3f800000;
      auVar31 = vsubps_avx(auVar392,auVar69);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar185 = vandps_avx(auVar186,auVar309);
      auVar358._8_4_ = 0x219392ef;
      auVar358._0_8_ = 0x219392ef219392ef;
      auVar358._12_4_ = 0x219392ef;
      auVar358._16_4_ = 0x219392ef;
      auVar358._20_4_ = 0x219392ef;
      auVar358._24_4_ = 0x219392ef;
      auVar358._28_4_ = 0x219392ef;
      auVar185 = vcmpps_avx(auVar185,auVar358,1);
      auVar395 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar70._4_4_ =
           (fVar435 + fVar435 * auVar31._4_4_) *
           -(fVar332 * fVar243 + fVar194 * fVar241 + fVar360 * fVar334);
      auVar70._0_4_ =
           (fVar433 + fVar433 * auVar31._0_4_) *
           -(fVar319 * fVar170 + fVar171 * fVar211 + fVar352 * fVar321);
      auVar70._8_4_ =
           (fVar213 + fVar213 * auVar31._8_4_) *
           -(fVar335 * fVar266 + fVar197 * fVar265 + fVar364 * fVar337);
      auVar70._12_4_ =
           (fVar284 + fVar284 * auVar31._12_4_) *
           -(fVar338 * fVar282 + fVar200 * fVar281 + fVar368 * fVar340);
      auVar70._16_4_ =
           (fVar295 + fVar295 * auVar31._16_4_) *
           -(fVar341 * fVar378 + fVar203 * fVar374 + fVar372 * fVar343);
      auVar70._20_4_ =
           (fVar296 + fVar296 * auVar31._20_4_) *
           -(fVar344 * fVar416 + fVar206 * fVar267 + fVar376 * fVar346);
      auVar70._24_4_ =
           (fVar297 + fVar297 * auVar31._24_4_) *
           -(fVar347 * fVar422 + fVar209 * fVar421 + fVar380 * fVar349);
      auVar70._28_4_ = -(auVar33._28_4_ + fVar242);
      auVar31 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,1);
      auVar33 = vorps_avx(auVar185,auVar31);
      auVar31 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,6);
      auVar31 = vorps_avx(auVar185,auVar31);
      auVar428._8_4_ = 0xff800000;
      auVar428._0_8_ = 0xff800000ff800000;
      auVar428._12_4_ = 0xff800000;
      auVar428._16_4_ = 0xff800000;
      auVar428._20_4_ = 0xff800000;
      auVar428._24_4_ = 0xff800000;
      auVar428._28_4_ = 0xff800000;
      auVar185 = vblendvps_avx(auVar70,auVar428,auVar33);
      auVar444._8_4_ = 0x7f800000;
      auVar444._0_8_ = 0x7f8000007f800000;
      auVar444._12_4_ = 0x7f800000;
      auVar444._16_4_ = 0x7f800000;
      auVar444._20_4_ = 0x7f800000;
      auVar444._24_4_ = 0x7f800000;
      auVar444._28_4_ = 0x7f800000;
      auVar31 = vblendvps_avx(auVar70,auVar444,auVar31);
      auVar32 = vmaxps_avx(auVar32,auVar185);
      auVar33 = vminps_avx(auVar34,auVar31);
      auVar405 = ZEXT832(0) << 0x20;
      auVar185 = vsubps_avx(auVar405,_local_920);
      auVar31 = vsubps_avx(auVar405,_local_940);
      auVar71._4_4_ = auVar31._4_4_ * -fVar361;
      auVar71._0_4_ = auVar31._0_4_ * -fVar353;
      auVar71._8_4_ = auVar31._8_4_ * -fVar365;
      auVar71._12_4_ = auVar31._12_4_ * -fVar369;
      auVar71._16_4_ = auVar31._16_4_ * -fVar373;
      auVar71._20_4_ = auVar31._20_4_ * -fVar377;
      auVar71._24_4_ = auVar31._24_4_ * -fVar381;
      auVar71._28_4_ = auVar31._28_4_;
      auVar72._4_4_ = fVar195 * auVar185._4_4_;
      auVar72._0_4_ = fVar172 * auVar185._0_4_;
      auVar72._8_4_ = fVar198 * auVar185._8_4_;
      auVar72._12_4_ = fVar201 * auVar185._12_4_;
      auVar72._16_4_ = fVar204 * auVar185._16_4_;
      auVar72._20_4_ = fVar207 * auVar185._20_4_;
      auVar72._24_4_ = fVar210 * auVar185._24_4_;
      auVar72._28_4_ = auVar185._28_4_;
      auVar185 = vsubps_avx(auVar71,auVar72);
      auVar31 = vsubps_avx(auVar405,local_9e0);
      auVar73._4_4_ = fVar333 * auVar31._4_4_;
      auVar73._0_4_ = fVar320 * auVar31._0_4_;
      auVar73._8_4_ = fVar336 * auVar31._8_4_;
      auVar73._12_4_ = fVar339 * auVar31._12_4_;
      auVar73._16_4_ = fVar342 * auVar31._16_4_;
      auVar73._20_4_ = fVar345 * auVar31._20_4_;
      uVar8 = auVar31._28_4_;
      auVar73._24_4_ = fVar348 * auVar31._24_4_;
      auVar73._28_4_ = uVar8;
      auVar34 = vsubps_avx(auVar185,auVar73);
      auVar74._4_4_ = fStack_6dc * -fVar361;
      auVar74._0_4_ = local_6e0 * -fVar353;
      auVar74._8_4_ = fStack_6d8 * -fVar365;
      auVar74._12_4_ = fStack_6d4 * -fVar369;
      auVar74._16_4_ = fStack_6d0 * -fVar373;
      auVar74._20_4_ = fStack_6cc * -fVar377;
      auVar74._24_4_ = fStack_6c8 * -fVar381;
      auVar74._28_4_ = (uint)fStack_944 ^ 0x80000000;
      auVar75._4_4_ = fStack_3dc * fVar195;
      auVar75._0_4_ = local_3e0 * fVar172;
      auVar75._8_4_ = fStack_3d8 * fVar198;
      auVar75._12_4_ = fStack_3d4 * fVar201;
      auVar75._16_4_ = fStack_3d0 * fVar204;
      auVar75._20_4_ = fStack_3cc * fVar207;
      auVar75._24_4_ = fStack_3c8 * fVar210;
      auVar75._28_4_ = uVar8;
      auVar329._8_4_ = 0x3f800000;
      auVar329._0_8_ = 0x3f8000003f800000;
      auVar329._12_4_ = 0x3f800000;
      auVar329._16_4_ = 0x3f800000;
      auVar329._20_4_ = 0x3f800000;
      auVar329._24_4_ = 0x3f800000;
      auVar329._28_4_ = 0x3f800000;
      auVar330 = ZEXT3264(auVar329);
      auVar185 = vsubps_avx(auVar74,auVar75);
      auVar76._4_4_ = fStack_51c * fVar333;
      auVar76._0_4_ = local_520 * fVar320;
      auVar76._8_4_ = fStack_518 * fVar336;
      auVar76._12_4_ = fStack_514 * fVar339;
      auVar76._16_4_ = fStack_510 * fVar342;
      auVar76._20_4_ = fStack_50c * fVar345;
      auVar76._24_4_ = fStack_508 * fVar348;
      auVar76._28_4_ = uVar8;
      auVar35 = vsubps_avx(auVar185,auVar76);
      auVar185 = vrcpps_avx(auVar35);
      fVar211 = auVar185._0_4_;
      fVar170 = auVar185._4_4_;
      auVar77._4_4_ = auVar35._4_4_ * fVar170;
      auVar77._0_4_ = auVar35._0_4_ * fVar211;
      fVar241 = auVar185._8_4_;
      auVar77._8_4_ = auVar35._8_4_ * fVar241;
      fVar243 = auVar185._12_4_;
      auVar77._12_4_ = auVar35._12_4_ * fVar243;
      fVar265 = auVar185._16_4_;
      auVar77._16_4_ = auVar35._16_4_ * fVar265;
      fVar266 = auVar185._20_4_;
      auVar77._20_4_ = auVar35._20_4_ * fVar266;
      fVar281 = auVar185._24_4_;
      auVar77._24_4_ = auVar35._24_4_ * fVar281;
      auVar77._28_4_ = fStack_504;
      auVar36 = vsubps_avx(auVar329,auVar77);
      auVar185 = vandps_avx(auVar35,auVar309);
      auVar129._8_4_ = 0x219392ef;
      auVar129._0_8_ = 0x219392ef219392ef;
      auVar129._12_4_ = 0x219392ef;
      auVar129._16_4_ = 0x219392ef;
      auVar129._20_4_ = 0x219392ef;
      auVar129._24_4_ = 0x219392ef;
      auVar129._28_4_ = 0x219392ef;
      auVar31 = vcmpps_avx(auVar185,auVar129,1);
      auVar78._4_4_ = (fVar170 + fVar170 * auVar36._4_4_) * -auVar34._4_4_;
      auVar78._0_4_ = (fVar211 + fVar211 * auVar36._0_4_) * -auVar34._0_4_;
      auVar78._8_4_ = (fVar241 + fVar241 * auVar36._8_4_) * -auVar34._8_4_;
      auVar78._12_4_ = (fVar243 + fVar243 * auVar36._12_4_) * -auVar34._12_4_;
      auVar78._16_4_ = (fVar265 + fVar265 * auVar36._16_4_) * -auVar34._16_4_;
      auVar78._20_4_ = (fVar266 + fVar266 * auVar36._20_4_) * -auVar34._20_4_;
      auVar78._24_4_ = (fVar281 + fVar281 * auVar36._24_4_) * -auVar34._24_4_;
      auVar78._28_4_ = auVar34._28_4_ ^ 0x80000000;
      auVar185 = vcmpps_avx(auVar35,auVar405,1);
      auVar185 = vorps_avx(auVar31,auVar185);
      auVar185 = vblendvps_avx(auVar78,auVar428,auVar185);
      _local_580 = vmaxps_avx(auVar32,auVar185);
      auVar185 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,6);
      auVar185 = vorps_avx(auVar31,auVar185);
      auVar185 = vblendvps_avx(auVar78,auVar444,auVar185);
      auVar124 = vandps_avx(auVar124,local_400);
      local_4a0 = vminps_avx(auVar33,auVar185);
      auVar185 = vcmpps_avx(_local_580,local_4a0,2);
      auVar31 = auVar124 & auVar185;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar31 >> 0x7f,0) == '\0') &&
            (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar31 >> 0xbf,0) == '\0') &&
          (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar31[0x1f])
      {
        auVar430 = ZEXT3264(_local_a20);
        auVar406 = ZEXT3264(_local_840);
      }
      else {
        auVar33 = _local_580;
        auVar31 = vminps_avx(local_7c0,local_740);
        auVar32 = vminps_avx(local_7e0,_local_6c0);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar31 = vsubps_avx(auVar31,_local_620);
        auVar124 = vandps_avx(auVar185,auVar124);
        auVar185 = vminps_avx(_local_5e0,auVar329);
        auVar185 = vmaxps_avx(auVar185,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar424 + fVar438 * (auVar185._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar432 + fVar440 * (auVar185._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar434 + fVar163 * (auVar185._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar436 + fVar165 * (auVar185._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar424 + fVar438 * (auVar185._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar432 + fVar440 * (auVar185._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar434 + fVar163 * (auVar185._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar436 + auVar185._28_4_ + 7.0;
        auVar100._4_4_ = fStack_5fc;
        auVar100._0_4_ = local_600;
        auVar100._8_4_ = fStack_5f8;
        auVar100._12_4_ = fStack_5f4;
        auVar100._16_4_ = fStack_5f0;
        auVar100._20_4_ = fStack_5ec;
        auVar100._24_4_ = fStack_5e8;
        auVar100._28_4_ = fStack_5e4;
        auVar185 = vminps_avx(auVar100,auVar329);
        auVar185 = vmaxps_avx(auVar185,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar424 + fVar438 * (auVar185._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar432 + fVar440 * (auVar185._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar434 + fVar163 * (auVar185._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar436 + fVar165 * (auVar185._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar424 + fVar438 * (auVar185._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar432 + fVar440 * (auVar185._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar434 + fVar163 * (auVar185._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar436 + auVar185._28_4_ + 7.0;
        auVar79._4_4_ = auVar31._4_4_ * 0.99999976;
        auVar79._0_4_ = auVar31._0_4_ * 0.99999976;
        auVar79._8_4_ = auVar31._8_4_ * 0.99999976;
        auVar79._12_4_ = auVar31._12_4_ * 0.99999976;
        auVar79._16_4_ = auVar31._16_4_ * 0.99999976;
        auVar79._20_4_ = auVar31._20_4_ * 0.99999976;
        auVar79._24_4_ = auVar31._24_4_ * 0.99999976;
        auVar79._28_4_ = 0x3f7ffffc;
        auVar185 = vmaxps_avx(ZEXT832(0) << 0x20,auVar79);
        auVar80._4_4_ = auVar185._4_4_ * auVar185._4_4_;
        auVar80._0_4_ = auVar185._0_4_ * auVar185._0_4_;
        auVar80._8_4_ = auVar185._8_4_ * auVar185._8_4_;
        auVar80._12_4_ = auVar185._12_4_ * auVar185._12_4_;
        auVar80._16_4_ = auVar185._16_4_ * auVar185._16_4_;
        auVar80._20_4_ = auVar185._20_4_ * auVar185._20_4_;
        auVar80._24_4_ = auVar185._24_4_ * auVar185._24_4_;
        auVar80._28_4_ = auVar185._28_4_;
        auVar31 = vsubps_avx(local_5a0,auVar80);
        auVar81._4_4_ = auVar31._4_4_ * (float)local_700._4_4_;
        auVar81._0_4_ = auVar31._0_4_ * (float)local_700._0_4_;
        auVar81._8_4_ = auVar31._8_4_ * fStack_6f8;
        auVar81._12_4_ = auVar31._12_4_ * fStack_6f4;
        auVar81._16_4_ = auVar31._16_4_ * fStack_6f0;
        auVar81._20_4_ = auVar31._20_4_ * fStack_6ec;
        auVar81._24_4_ = auVar31._24_4_ * fStack_6e8;
        auVar81._28_4_ = auVar185._28_4_;
        auVar32 = vsubps_avx(local_5c0,auVar81);
        auVar185 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,5);
        if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar185 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar185 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar185 >> 0x7f,0) == '\0') &&
              (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar185 >> 0xbf,0) == '\0') &&
            (auVar185 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar185[0x1f]) {
          _local_620 = ZEXT832(0) << 0x20;
          _local_720 = ZEXT832(0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          auVar228 = ZEXT1228(ZEXT812(0)) << 0x20;
          _local_920 = ZEXT832(0) << 0x20;
          auVar255 = ZEXT828(0) << 0x20;
          auVar291._8_4_ = 0x7f800000;
          auVar291._0_8_ = 0x7f8000007f800000;
          auVar291._12_4_ = 0x7f800000;
          auVar291._16_4_ = 0x7f800000;
          auVar291._20_4_ = 0x7f800000;
          auVar291._24_4_ = 0x7f800000;
          auVar291._28_4_ = 0x7f800000;
          auVar310._8_4_ = 0xff800000;
          auVar310._0_8_ = 0xff800000ff800000;
          auVar310._12_4_ = 0xff800000;
          auVar310._16_4_ = 0xff800000;
          auVar310._20_4_ = 0xff800000;
          auVar310._24_4_ = 0xff800000;
          auVar310._28_4_ = 0xff800000;
        }
        else {
          local_9e0 = auVar31;
          local_780 = auVar185;
          _local_940 = auVar124;
          auVar35 = vsqrtps_avx(auVar32);
          auVar234._0_4_ = fVar437 + fVar437;
          auVar234._4_4_ = fVar439 + fVar439;
          auVar234._8_4_ = fVar441 + fVar441;
          auVar234._12_4_ = fVar168 + fVar168;
          auVar234._16_4_ = fVar454 + fVar454;
          auVar234._20_4_ = fVar455 + fVar455;
          auVar234._24_4_ = fVar456 + fVar456;
          auVar234._28_4_ = fVar214 + fVar214;
          auVar34 = vrcpps_avx(auVar234);
          fVar214 = auVar34._0_4_;
          fVar211 = auVar34._4_4_;
          auVar82._4_4_ = auVar234._4_4_ * fVar211;
          auVar82._0_4_ = auVar234._0_4_ * fVar214;
          fVar170 = auVar34._8_4_;
          auVar82._8_4_ = auVar234._8_4_ * fVar170;
          fVar241 = auVar34._12_4_;
          auVar82._12_4_ = auVar234._12_4_ * fVar241;
          fVar243 = auVar34._16_4_;
          auVar82._16_4_ = auVar234._16_4_ * fVar243;
          fVar265 = auVar34._20_4_;
          auVar82._20_4_ = auVar234._20_4_ * fVar265;
          fVar266 = auVar34._24_4_;
          auVar82._24_4_ = auVar234._24_4_ * fVar266;
          auVar82._28_4_ = auVar234._28_4_;
          auVar36 = vsubps_avx(auVar329,auVar82);
          fVar214 = fVar214 + fVar214 * auVar36._0_4_;
          fVar211 = fVar211 + fVar211 * auVar36._4_4_;
          fVar170 = fVar170 + fVar170 * auVar36._8_4_;
          fVar241 = fVar241 + fVar241 * auVar36._12_4_;
          fVar243 = fVar243 + fVar243 * auVar36._16_4_;
          fVar265 = fVar265 + fVar265 * auVar36._20_4_;
          fVar266 = fVar266 + fVar266 * auVar36._24_4_;
          fVar281 = auVar34._28_4_ + auVar36._28_4_;
          auVar257._0_8_ = local_2c0._0_8_ ^ 0x8000000080000000;
          auVar257._8_4_ = -local_2c0._8_4_;
          auVar257._12_4_ = -local_2c0._12_4_;
          auVar257._16_4_ = -local_2c0._16_4_;
          auVar257._20_4_ = -local_2c0._20_4_;
          auVar257._24_4_ = -local_2c0._24_4_;
          auVar257._28_4_ = -local_2c0._28_4_;
          auVar34 = vsubps_avx(auVar257,auVar35);
          fVar424 = auVar34._0_4_ * fVar214;
          fVar432 = auVar34._4_4_ * fVar211;
          auVar83._4_4_ = fVar432;
          auVar83._0_4_ = fVar424;
          fVar434 = auVar34._8_4_ * fVar170;
          auVar83._8_4_ = fVar434;
          fVar436 = auVar34._12_4_ * fVar241;
          auVar83._12_4_ = fVar436;
          fVar438 = auVar34._16_4_ * fVar243;
          auVar83._16_4_ = fVar438;
          fVar440 = auVar34._20_4_ * fVar265;
          auVar83._20_4_ = fVar440;
          fVar433 = auVar34._24_4_ * fVar266;
          auVar83._24_4_ = fVar433;
          auVar83._28_4_ = local_a20._28_4_;
          auVar35 = vsubps_avx(auVar35,local_2c0);
          fVar214 = auVar35._0_4_ * fVar214;
          fVar211 = auVar35._4_4_ * fVar211;
          auVar84._4_4_ = fVar211;
          auVar84._0_4_ = fVar214;
          fVar170 = auVar35._8_4_ * fVar170;
          auVar84._8_4_ = fVar170;
          fVar241 = auVar35._12_4_ * fVar241;
          auVar84._12_4_ = fVar241;
          fVar243 = auVar35._16_4_ * fVar243;
          auVar84._16_4_ = fVar243;
          fVar265 = auVar35._20_4_ * fVar265;
          auVar84._20_4_ = fVar265;
          fVar266 = auVar35._24_4_ * fVar266;
          auVar84._24_4_ = fVar266;
          auVar84._28_4_ = fVar418;
          fVar282 = fVar238 * (fVar424 * (float)local_720._0_4_ + fVar442);
          fVar374 = fVar261 * (fVar432 * (float)local_720._4_4_ + fVar447);
          fVar378 = fVar268 * (fVar434 * fStack_718 + fVar448);
          fVar267 = fVar283 * (fVar436 * fStack_714 + fVar449);
          fVar416 = fVar396 * (fVar438 * fStack_710 + fVar450);
          fVar421 = fVar299 * (fVar440 * fStack_70c + fVar451);
          fVar422 = fVar423 * (fVar433 * fStack_708 + fVar452);
          auVar154._0_4_ = local_800 + fVar166 * fVar282;
          auVar154._4_4_ = fStack_7fc + fVar240 * fVar374;
          auVar154._8_4_ = fStack_7f8 + fVar264 * fVar378;
          auVar154._12_4_ = aStack_7f4.w + fVar280 * fVar267;
          auVar154._16_4_ = fStack_7f0 + fVar370 * fVar416;
          auVar154._20_4_ = fStack_7ec + fVar408 * fVar421;
          auVar154._24_4_ = fStack_7e8 + fVar420 * fVar422;
          auVar154._28_4_ = fStack_7e4 + auVar35._28_4_ + fVar453;
          auVar85._4_4_ = fStack_51c * fVar432;
          auVar85._0_4_ = local_520 * fVar424;
          auVar85._8_4_ = fStack_518 * fVar434;
          auVar85._12_4_ = fStack_514 * fVar436;
          auVar85._16_4_ = fStack_510 * fVar438;
          auVar85._20_4_ = fStack_50c * fVar440;
          auVar85._24_4_ = fStack_508 * fVar433;
          auVar85._28_4_ = fVar281;
          auVar35 = vsubps_avx(auVar85,auVar154);
          auVar235._0_4_ = fVar351 + fVar162 * fVar282;
          auVar235._4_4_ = fVar359 + fVar167 * fVar374;
          auVar235._8_4_ = fVar363 + fVar262 * fVar378;
          auVar235._12_4_ = fVar367 + fVar278 * fVar267;
          auVar235._16_4_ = fVar371 + fVar362 * fVar416;
          auVar235._20_4_ = fVar375 + fVar407 * fVar421;
          auVar235._24_4_ = fVar379 + fVar417 * fVar422;
          auVar235._28_4_ = fVar382 + fVar281;
          auVar292._0_4_ = local_3e0 * fVar424;
          auVar292._4_4_ = fStack_3dc * fVar432;
          auVar292._8_4_ = fStack_3d8 * fVar434;
          auVar292._12_4_ = fStack_3d4 * fVar436;
          auVar292._16_4_ = fStack_3d0 * fVar438;
          auVar292._20_4_ = fStack_3cc * fVar440;
          auVar292._24_4_ = fStack_3c8 * fVar433;
          auVar292._28_4_ = 0;
          _local_920 = vsubps_avx(auVar292,auVar235);
          auVar258._0_4_ = fVar169 + fVar237 * fVar282;
          auVar258._4_4_ = fVar193 + fVar239 * fVar374;
          auVar258._8_4_ = fVar196 + fVar263 * fVar378;
          auVar258._12_4_ = fVar199 + fVar279 * fVar267;
          auVar258._16_4_ = fVar202 + fVar366 * fVar416;
          auVar258._20_4_ = fVar205 + fVar409 * fVar421;
          auVar258._24_4_ = fVar208 + fVar419 * fVar422;
          auVar258._28_4_ = fVar212 + auVar34._28_4_;
          auVar86._4_4_ = fVar432 * fStack_6dc;
          auVar86._0_4_ = fVar424 * local_6e0;
          auVar86._8_4_ = fVar434 * fStack_6d8;
          auVar86._12_4_ = fVar436 * fStack_6d4;
          auVar86._16_4_ = fVar438 * fStack_6d0;
          auVar86._20_4_ = fVar440 * fStack_6cc;
          auVar86._24_4_ = fVar433 * fStack_6c8;
          auVar86._28_4_ = 0;
          auVar34 = vsubps_avx(auVar86,auVar258);
          auVar255 = auVar34._0_28_;
          fVar238 = fVar238 * (fVar214 * (float)local_720._0_4_ + fVar442);
          fVar261 = fVar261 * (fVar211 * (float)local_720._4_4_ + fVar447);
          fVar268 = fVar268 * (fVar170 * fStack_718 + fVar448);
          fVar283 = fVar283 * (fVar241 * fStack_714 + fVar449);
          fVar396 = fVar396 * (fVar243 * fStack_710 + fVar450);
          fVar299 = fVar299 * (fVar265 * fStack_70c + fVar451);
          fVar423 = fVar423 * (fVar266 * fStack_708 + fVar452);
          auVar311._0_4_ = local_800 + fVar166 * fVar238;
          auVar311._4_4_ = fStack_7fc + fVar240 * fVar261;
          auVar311._8_4_ = fStack_7f8 + fVar264 * fVar268;
          auVar311._12_4_ = aStack_7f4.w + fVar280 * fVar283;
          auVar311._16_4_ = fStack_7f0 + fVar370 * fVar396;
          auVar311._20_4_ = fStack_7ec + fVar408 * fVar299;
          auVar311._24_4_ = fStack_7e8 + fVar420 * fVar423;
          auVar311._28_4_ = fStack_7e4 + fVar431;
          auVar87._4_4_ = fStack_51c * fVar211;
          auVar87._0_4_ = local_520 * fVar214;
          auVar87._8_4_ = fStack_518 * fVar170;
          auVar87._12_4_ = fStack_514 * fVar241;
          auVar87._16_4_ = fStack_510 * fVar243;
          auVar87._20_4_ = fStack_50c * fVar265;
          auVar87._24_4_ = fStack_508 * fVar266;
          auVar87._28_4_ = local_560._28_4_;
          _local_620 = vsubps_avx(auVar87,auVar311);
          auVar312._0_4_ = fVar351 + fVar162 * fVar238;
          auVar312._4_4_ = fVar359 + fVar167 * fVar261;
          auVar312._8_4_ = fVar363 + fVar262 * fVar268;
          auVar312._12_4_ = fVar367 + fVar278 * fVar283;
          auVar312._16_4_ = fVar371 + fVar362 * fVar396;
          auVar312._20_4_ = fVar375 + fVar407 * fVar299;
          auVar312._24_4_ = fVar379 + fVar417 * fVar423;
          auVar312._28_4_ = fVar382 + local_620._28_4_;
          auVar88._4_4_ = fStack_3dc * fVar211;
          auVar88._0_4_ = local_3e0 * fVar214;
          auVar88._8_4_ = fStack_3d8 * fVar170;
          auVar88._12_4_ = fStack_3d4 * fVar241;
          auVar88._16_4_ = fStack_3d0 * fVar243;
          auVar88._20_4_ = fStack_3cc * fVar265;
          auVar88._24_4_ = fStack_3c8 * fVar266;
          auVar88._28_4_ = local_560._28_4_;
          _local_720 = vsubps_avx(auVar88,auVar312);
          auVar293._0_4_ = fVar169 + fVar237 * fVar238;
          auVar293._4_4_ = fVar193 + fVar239 * fVar261;
          auVar293._8_4_ = fVar196 + fVar263 * fVar268;
          auVar293._12_4_ = fVar199 + fVar279 * fVar283;
          auVar293._16_4_ = fVar202 + fVar366 * fVar396;
          auVar293._20_4_ = fVar205 + fVar409 * fVar299;
          auVar293._24_4_ = fVar208 + fVar419 * fVar423;
          auVar293._28_4_ = fVar212 + fVar453 + 0.0;
          auVar89._4_4_ = fVar211 * fStack_6dc;
          auVar89._0_4_ = fVar214 * local_6e0;
          auVar89._8_4_ = fVar170 * fStack_6d8;
          auVar89._12_4_ = fVar241 * fStack_6d4;
          auVar89._16_4_ = fVar243 * fStack_6d0;
          auVar89._20_4_ = fVar265 * fStack_6cc;
          auVar89._24_4_ = fVar266 * fStack_6c8;
          auVar89._28_4_ = local_720._28_4_;
          _local_640 = vsubps_avx(auVar89,auVar293);
          auVar34 = vcmpps_avx(auVar32,_DAT_01faff00,5);
          auVar294._8_4_ = 0x7f800000;
          auVar294._0_8_ = 0x7f8000007f800000;
          auVar294._12_4_ = 0x7f800000;
          auVar294._16_4_ = 0x7f800000;
          auVar294._20_4_ = 0x7f800000;
          auVar294._24_4_ = 0x7f800000;
          auVar294._28_4_ = 0x7f800000;
          auVar291 = vblendvps_avx(auVar294,auVar83,auVar34);
          auVar393._8_4_ = 0x7fffffff;
          auVar393._0_8_ = 0x7fffffff7fffffff;
          auVar393._12_4_ = 0x7fffffff;
          auVar393._16_4_ = 0x7fffffff;
          auVar393._20_4_ = 0x7fffffff;
          auVar393._24_4_ = 0x7fffffff;
          auVar393._28_4_ = 0x7fffffff;
          auVar32 = vandps_avx(auVar393,_local_660);
          auVar32 = vmaxps_avx(local_420,auVar32);
          auVar90._4_4_ = auVar32._4_4_ * 1.9073486e-06;
          auVar90._0_4_ = auVar32._0_4_ * 1.9073486e-06;
          auVar90._8_4_ = auVar32._8_4_ * 1.9073486e-06;
          auVar90._12_4_ = auVar32._12_4_ * 1.9073486e-06;
          auVar90._16_4_ = auVar32._16_4_ * 1.9073486e-06;
          auVar90._20_4_ = auVar32._20_4_ * 1.9073486e-06;
          auVar90._24_4_ = auVar32._24_4_ * 1.9073486e-06;
          auVar90._28_4_ = auVar32._28_4_;
          auVar32 = vandps_avx(auVar393,local_440);
          auVar32 = vcmpps_avx(auVar32,auVar90,1);
          auVar313._8_4_ = 0xff800000;
          auVar313._0_8_ = 0xff800000ff800000;
          auVar313._12_4_ = 0xff800000;
          auVar313._16_4_ = 0xff800000;
          auVar313._20_4_ = 0xff800000;
          auVar313._24_4_ = 0xff800000;
          auVar313._28_4_ = 0xff800000;
          auVar310 = vblendvps_avx(auVar313,auVar84,auVar34);
          auVar36 = auVar34 & auVar32;
          if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar36 >> 0x7f,0) != '\0') ||
                (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0xbf,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar36[0x1f] < '\0') {
            auVar185 = vandps_avx(auVar32,auVar34);
            auVar225 = vpackssdw_avx(auVar185._0_16_,auVar185._16_16_);
            auVar36 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,2);
            auVar446._8_4_ = 0xff800000;
            auVar446._0_8_ = 0xff800000ff800000;
            auVar446._12_4_ = 0xff800000;
            auVar446._16_4_ = 0xff800000;
            auVar446._20_4_ = 0xff800000;
            auVar446._24_4_ = 0xff800000;
            auVar446._28_4_ = 0xff800000;
            auVar429._8_4_ = 0x7f800000;
            auVar429._0_8_ = 0x7f8000007f800000;
            auVar429._12_4_ = 0x7f800000;
            auVar429._16_4_ = 0x7f800000;
            auVar429._20_4_ = 0x7f800000;
            auVar429._24_4_ = 0x7f800000;
            auVar429._28_4_ = 0x7f800000;
            auVar31 = vblendvps_avx(auVar429,auVar446,auVar36);
            auVar250 = vpmovsxwd_avx(auVar225);
            auVar225 = vpunpckhwd_avx(auVar225,auVar225);
            auVar394._16_16_ = auVar225;
            auVar394._0_16_ = auVar250;
            auVar291 = vblendvps_avx(auVar291,auVar31,auVar394);
            auVar31 = vblendvps_avx(auVar446,auVar429,auVar36);
            auVar310 = vblendvps_avx(auVar310,auVar31,auVar394);
            auVar32 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar136._0_4_ = auVar32._0_4_ ^ auVar185._0_4_;
            auVar136._4_4_ = auVar32._4_4_ ^ auVar185._4_4_;
            auVar136._8_4_ = auVar32._8_4_ ^ auVar185._8_4_;
            auVar136._12_4_ = auVar32._12_4_ ^ auVar185._12_4_;
            auVar136._16_4_ = auVar32._16_4_ ^ auVar185._16_4_;
            auVar136._20_4_ = auVar32._20_4_ ^ auVar185._20_4_;
            auVar136._24_4_ = auVar32._24_4_ ^ auVar185._24_4_;
            auVar136._28_4_ = auVar32._28_4_ ^ auVar185._28_4_;
            auVar185 = vorps_avx(auVar36,auVar136);
            auVar185 = vandps_avx(auVar34,auVar185);
          }
          auVar395 = ZEXT3264(auVar32);
          auVar228 = auVar35._0_28_;
        }
        auVar430 = ZEXT3264(_local_a20);
        fVar214 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar322._4_4_ = fVar214;
        auVar322._0_4_ = fVar214;
        auVar322._8_4_ = fVar214;
        auVar322._12_4_ = fVar214;
        auVar322._16_4_ = fVar214;
        auVar322._20_4_ = fVar214;
        auVar322._24_4_ = fVar214;
        local_740._28_4_ = fVar214;
        local_740._0_28_ = auVar322;
        auVar330 = ZEXT3264(local_740);
        fVar162 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar237 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_480 = _local_580;
        local_460 = vminps_avx(local_4a0,auVar291);
        _local_4c0 = vmaxps_avx(_local_580,auVar310);
        auVar31 = vcmpps_avx(_local_580,local_460,2);
        local_540 = vandps_avx(auVar31,auVar124);
        auVar31 = vcmpps_avx(_local_4c0,local_4a0,2);
        local_5a0 = vandps_avx(auVar31,auVar124);
        auVar124 = vorps_avx(local_5a0,local_540);
        auVar406 = ZEXT3264(_local_840);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          _local_660 = _local_4c0;
          auVar31 = _local_660;
          auVar124 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_5c0._0_4_ = auVar185._0_4_ ^ auVar124._0_4_;
          local_5c0._4_4_ = auVar185._4_4_ ^ auVar124._4_4_;
          local_5c0._8_4_ = auVar185._8_4_ ^ auVar124._8_4_;
          local_5c0._12_4_ = auVar185._12_4_ ^ auVar124._12_4_;
          local_5c0._16_4_ = auVar185._16_4_ ^ auVar124._16_4_;
          local_5c0._20_4_ = auVar185._20_4_ ^ auVar124._20_4_;
          local_5c0._24_4_ = auVar185._24_4_ ^ auVar124._24_4_;
          local_5c0._28_4_ = (uint)auVar185._28_4_ ^ (uint)auVar124._28_4_;
          auVar130._0_4_ =
               fVar214 * auVar228._0_4_ +
               fVar162 * (float)local_920._0_4_ + fVar237 * auVar255._0_4_;
          auVar130._4_4_ =
               fVar214 * auVar228._4_4_ +
               fVar162 * (float)local_920._4_4_ + fVar237 * auVar255._4_4_;
          auVar130._8_4_ =
               fVar214 * auVar228._8_4_ + fVar162 * fStack_918 + fVar237 * auVar255._8_4_;
          auVar130._12_4_ =
               fVar214 * auVar228._12_4_ + fVar162 * fStack_914 + fVar237 * auVar255._12_4_;
          auVar130._16_4_ =
               fVar214 * auVar228._16_4_ + fVar162 * fStack_910 + fVar237 * auVar255._16_4_;
          auVar130._20_4_ =
               fVar214 * auVar228._20_4_ + fVar162 * fStack_90c + fVar237 * auVar255._20_4_;
          auVar130._24_4_ =
               fVar214 * auVar228._24_4_ + fVar162 * fStack_908 + fVar237 * auVar255._24_4_;
          auVar130._28_4_ = auVar185._28_4_ + local_580._28_4_ + auVar124._28_4_;
          auVar155._8_4_ = 0x7fffffff;
          auVar155._0_8_ = 0x7fffffff7fffffff;
          auVar155._12_4_ = 0x7fffffff;
          auVar155._16_4_ = 0x7fffffff;
          auVar155._20_4_ = 0x7fffffff;
          auVar155._24_4_ = 0x7fffffff;
          auVar155._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar130,auVar155);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar156,1);
          auVar124 = vorps_avx(auVar124,local_5c0);
          auVar157._8_4_ = 3;
          auVar157._0_8_ = 0x300000003;
          auVar157._12_4_ = 3;
          auVar157._16_4_ = 3;
          auVar157._20_4_ = 3;
          auVar157._24_4_ = 3;
          auVar157._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar187,auVar157,auVar124);
          _local_5e0 = ZEXT432(local_b0c);
          auVar250 = vpshufd_avx(ZEXT416(local_b0c),0);
          fVar214 = 0.0;
          auVar225 = vpcmpgtd_avx(auVar124._16_16_,auVar250);
          local_600 = auVar250._0_4_;
          fStack_5fc = auVar250._4_4_;
          fStack_5f8 = auVar250._8_4_;
          fStack_5f4 = auVar250._12_4_;
          auVar250 = vpcmpgtd_avx(auVar124._0_16_,auVar250);
          auVar158._16_16_ = auVar225;
          auVar158._0_16_ = auVar250;
          local_560 = vblendps_avx(ZEXT1632(auVar250),auVar158,0xf0);
          local_500 = vandnps_avx(local_560,local_540);
          auVar330 = ZEXT3264(local_500);
          auVar124 = local_540 & ~local_560;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0x7f,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0xbf,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar124[0x1f]) {
            fVar166 = (ray->super_RayK<1>).tfar;
            auVar131._4_4_ = fVar166;
            auVar131._0_4_ = fVar166;
            auVar131._8_4_ = fVar166;
            auVar131._12_4_ = fVar166;
            auVar131._16_4_ = fVar166;
            auVar131._20_4_ = fVar166;
            auVar131._24_4_ = fVar166;
            auVar131._28_4_ = fVar166;
            local_660._0_4_ = local_4c0._0_4_;
            local_660._4_4_ = local_4c0._4_4_;
            fStack_658 = local_4c0._8_4_;
            fStack_654 = local_4c0._12_4_;
            fStack_650 = local_4c0._16_4_;
            fStack_64c = local_4c0._20_4_;
            fStack_648 = local_4c0._24_4_;
            fStack_644 = local_4c0._28_4_;
            local_7e0 = _local_4c0;
            fVar238 = (float)local_660._0_4_;
            fVar265 = (float)local_660._4_4_;
            fVar266 = fStack_658;
            fVar268 = fStack_654;
            fVar278 = fStack_650;
            fVar279 = fStack_64c;
            fVar280 = fStack_648;
            fVar281 = fStack_644;
            fVar166 = fVar237;
            fVar211 = fVar237;
            fVar170 = fVar237;
            fVar167 = fVar237;
            fVar239 = fVar237;
            fVar240 = fVar237;
            fVar241 = fVar162;
            fVar243 = fVar162;
            fVar261 = fVar162;
            fVar262 = fVar162;
            fVar263 = fVar162;
            fVar264 = fVar162;
            _local_960 = auVar37;
            _local_660 = auVar31;
          }
          else {
            local_700._4_4_ = (float)local_580._4_4_ + (float)local_6a0._4_4_;
            local_700._0_4_ = (float)local_580._0_4_ + (float)local_6a0._0_4_;
            fStack_6f8 = fStack_578 + fStack_698;
            fStack_6f4 = fStack_574 + fStack_694;
            fStack_6f0 = fStack_570 + fStack_690;
            fStack_6ec = fStack_56c + fStack_68c;
            fStack_6e8 = fStack_568 + fStack_688;
            fStack_6e4 = local_580._28_4_ + fStack_684;
            local_960._4_4_ = fVar162;
            local_960._0_4_ = fVar162;
            fStack_958 = fVar162;
            fStack_954 = fVar162;
            fStack_950 = fVar162;
            fStack_94c = fVar162;
            fStack_948 = fVar162;
            fStack_944 = fVar162;
            local_980._4_4_ = fVar237;
            local_980._0_4_ = fVar237;
            fStack_978 = fVar237;
            fStack_974 = fVar237;
            fStack_970 = fVar237;
            fStack_96c = fVar237;
            fStack_968 = fVar237;
            fStack_964 = fVar237;
            _local_580 = auVar33;
            do {
              auVar132._8_4_ = 0x7f800000;
              auVar132._0_8_ = 0x7f8000007f800000;
              auVar132._12_4_ = 0x7f800000;
              auVar132._16_4_ = 0x7f800000;
              auVar132._20_4_ = 0x7f800000;
              auVar132._24_4_ = 0x7f800000;
              auVar132._28_4_ = 0x7f800000;
              auVar124 = auVar330._0_32_;
              auVar185 = vblendvps_avx(auVar132,_local_580,auVar124);
              auVar31 = vshufps_avx(auVar185,auVar185,0xb1);
              auVar31 = vminps_avx(auVar185,auVar31);
              auVar32 = vshufpd_avx(auVar31,auVar31,5);
              auVar31 = vminps_avx(auVar31,auVar32);
              auVar32 = vperm2f128_avx(auVar31,auVar31,1);
              auVar31 = vminps_avx(auVar31,auVar32);
              auVar185 = vcmpps_avx(auVar185,auVar31,0);
              auVar31 = auVar124 & auVar185;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar185,auVar124);
              }
              uVar102 = vmovmskps_avx(auVar124);
              uVar105 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
                }
              }
              uVar103 = (ulong)uVar105;
              *(undefined4 *)(local_500 + uVar103 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_800 = aVar10.x;
              fStack_7fc = aVar10.y;
              fStack_7f8 = aVar10.z;
              aStack_7f4 = aVar10.field_3;
              auVar225 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar214 = local_1a0[uVar103];
              uVar105 = *(uint *)(local_480 + uVar103 * 4);
              if (auVar225._0_4_ < 0.0) {
                fVar162 = sqrtf(auVar225._0_4_);
              }
              else {
                auVar225 = vsqrtss_avx(auVar225,auVar225);
                fVar162 = auVar225._0_4_;
              }
              auVar250 = vminps_avx(_local_990,_local_9b0);
              auVar225 = vmaxps_avx(_local_990,_local_9b0);
              auVar146 = vminps_avx(_local_9a0,_local_9c0);
              auVar120 = vminps_avx(auVar250,auVar146);
              auVar250 = vmaxps_avx(_local_9a0,_local_9c0);
              auVar146 = vmaxps_avx(auVar225,auVar250);
              auVar217._8_4_ = 0x7fffffff;
              auVar217._0_8_ = 0x7fffffff7fffffff;
              auVar217._12_4_ = 0x7fffffff;
              auVar225 = vandps_avx(auVar120,auVar217);
              auVar250 = vandps_avx(auVar146,auVar217);
              auVar225 = vmaxps_avx(auVar225,auVar250);
              auVar250 = vmovshdup_avx(auVar225);
              auVar250 = vmaxss_avx(auVar250,auVar225);
              auVar225 = vshufpd_avx(auVar225,auVar225,1);
              auVar225 = vmaxss_avx(auVar225,auVar250);
              local_920._0_4_ = auVar225._0_4_ * 1.9073486e-06;
              local_860._0_4_ = fVar162 * 1.9073486e-06;
              _local_6c0 = vshufps_avx(auVar146,auVar146,0xff);
              auVar225 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar214),0x10);
              lVar108 = 5;
              do {
                auVar250 = vshufps_avx(auVar225,auVar225,0);
                auVar115._0_4_ = auVar250._0_4_ * local_800 + 0.0;
                auVar115._4_4_ = auVar250._4_4_ * fStack_7fc + 0.0;
                auVar115._8_4_ = auVar250._8_4_ * fStack_7f8 + 0.0;
                auVar115._12_4_ = auVar250._12_4_ * aStack_7f4.w + 0.0;
                local_b00 = auVar225._0_4_;
                auVar146 = vmovshdup_avx(auVar225);
                fVar167 = auVar146._0_4_;
                fVar170 = 1.0 - fVar167;
                fVar237 = fVar167 * fVar167;
                fVar166 = fVar167 * 3.0;
                fVar214 = fVar166 + -5.0;
                fVar211 = fVar170 * fVar170;
                auVar250 = ZEXT416((uint)(fVar167 * fVar167 * -fVar170 * 0.5));
                auVar250 = vshufps_avx(auVar250,auVar250,0);
                auVar120 = ZEXT416((uint)((fVar211 * (fVar170 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar116 = ZEXT416((uint)((fVar237 * fVar214 + 2.0) * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar145 = ZEXT416((uint)(fVar170 * fVar170 * -fVar167 * 0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar175._0_4_ =
                     auVar145._0_4_ * (float)local_990._0_4_ +
                     auVar116._0_4_ * (float)local_9b0._0_4_ +
                     auVar120._0_4_ * (float)local_9a0._0_4_ +
                     auVar250._0_4_ * (float)local_9c0._0_4_;
                auVar175._4_4_ =
                     auVar145._4_4_ * (float)local_990._4_4_ +
                     auVar116._4_4_ * (float)local_9b0._4_4_ +
                     auVar120._4_4_ * (float)local_9a0._4_4_ +
                     auVar250._4_4_ * (float)local_9c0._4_4_;
                auVar175._8_4_ =
                     auVar145._8_4_ * fStack_988 +
                     auVar116._8_4_ * fStack_9a8 +
                     auVar120._8_4_ * fStack_998 + auVar250._8_4_ * fStack_9b8;
                auVar175._12_4_ =
                     auVar145._12_4_ * fStack_984 +
                     auVar116._12_4_ * fStack_9a4 +
                     auVar120._12_4_ * fStack_994 + auVar250._12_4_ * fStack_9b4;
                local_780._0_16_ = auVar175;
                auVar250 = vsubps_avx(auVar115,auVar175);
                _local_940 = auVar250;
                auVar250 = vdpps_avx(auVar250,auVar250,0x7f);
                fVar162 = fVar167 * -9.0 + 4.0;
                fVar238 = auVar250._0_4_;
                local_9e0._0_4_ = fVar211;
                if (fVar238 < 0.0) {
                  local_a00._0_16_ = auVar146;
                  local_820._0_4_ = fVar237;
                  local_900._0_16_ = ZEXT416((uint)fVar170);
                  local_880._0_4_ = fVar167 * 9.0;
                  local_7a0._0_4_ = fVar214;
                  local_7c0._0_16_ = ZEXT416((uint)fVar162);
                  local_7e0._0_4_ = fVar170 * -2.0;
                  fVar211 = sqrtf(fVar238);
                  fVar214 = (float)local_7a0._0_4_;
                  fVar239 = (float)local_7e0._0_4_;
                  auVar146 = local_a00._0_16_;
                  fVar237 = (float)local_880._0_4_;
                  auVar120 = local_7c0._0_16_;
                  fVar170 = (float)local_900._0_4_;
                }
                else {
                  auVar120 = vsqrtss_avx(auVar250,auVar250);
                  fVar211 = auVar120._0_4_;
                  fVar239 = fVar170 * -2.0;
                  local_820._0_4_ = fVar237;
                  fVar237 = fVar167 * 9.0;
                  auVar120 = ZEXT416((uint)fVar162);
                }
                fVar162 = auVar146._0_4_;
                auVar146 = ZEXT416((uint)(((float)local_820._0_4_ + fVar162 * fVar239) * 0.5));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar116 = ZEXT416((uint)(((fVar170 + fVar170) * (fVar166 + 2.0) +
                                          fVar170 * fVar170 * -3.0) * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar145 = ZEXT416((uint)((fVar214 * (fVar162 + fVar162) + fVar162 * fVar166) * 0.5)
                                  );
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar140 = ZEXT416((uint)((fVar162 * (fVar170 + fVar170) - (float)local_9e0._0_4_) *
                                         0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar383._0_4_ =
                     (float)local_990._0_4_ * auVar140._0_4_ +
                     (float)local_9b0._0_4_ * auVar145._0_4_ +
                     (float)local_9c0._0_4_ * auVar146._0_4_ +
                     (float)local_9a0._0_4_ * auVar116._0_4_;
                auVar383._4_4_ =
                     (float)local_990._4_4_ * auVar140._4_4_ +
                     (float)local_9b0._4_4_ * auVar145._4_4_ +
                     (float)local_9c0._4_4_ * auVar146._4_4_ +
                     (float)local_9a0._4_4_ * auVar116._4_4_;
                auVar383._8_4_ =
                     fStack_988 * auVar140._8_4_ +
                     fStack_9a8 * auVar145._8_4_ +
                     fStack_9b8 * auVar146._8_4_ + fStack_998 * auVar116._8_4_;
                auVar383._12_4_ =
                     fStack_984 * auVar140._12_4_ +
                     fStack_9a4 * auVar145._12_4_ +
                     fStack_9b4 * auVar146._12_4_ + fStack_994 * auVar116._12_4_;
                auVar395 = ZEXT1664(auVar383);
                auVar140 = vpermilps_avx(ZEXT416((uint)(fVar166 + -1.0)),0);
                auVar146 = vshufps_avx(auVar120,auVar120,0);
                auVar116 = vshufps_avx(ZEXT416((uint)(fVar237 + -5.0)),
                                       ZEXT416((uint)(fVar237 + -5.0)),0);
                auVar120 = ZEXT416((uint)(fVar162 * -3.0 + 2.0));
                auVar145 = vshufps_avx(auVar120,auVar120,0);
                auVar120 = vdpps_avx(auVar383,auVar383,0x7f);
                auVar141._0_4_ =
                     (float)local_990._0_4_ * auVar145._0_4_ +
                     (float)local_9b0._0_4_ * auVar116._0_4_ +
                     (float)local_9a0._0_4_ * auVar146._0_4_ +
                     (float)local_9c0._0_4_ * auVar140._0_4_;
                auVar141._4_4_ =
                     (float)local_990._4_4_ * auVar145._4_4_ +
                     (float)local_9b0._4_4_ * auVar116._4_4_ +
                     (float)local_9a0._4_4_ * auVar146._4_4_ +
                     (float)local_9c0._4_4_ * auVar140._4_4_;
                auVar141._8_4_ =
                     fStack_988 * auVar145._8_4_ +
                     fStack_9a8 * auVar116._8_4_ +
                     fStack_998 * auVar146._8_4_ + fStack_9b8 * auVar140._8_4_;
                auVar141._12_4_ =
                     fStack_984 * auVar145._12_4_ +
                     fStack_9a4 * auVar116._12_4_ +
                     fStack_994 * auVar146._12_4_ + fStack_9b4 * auVar140._12_4_;
                auVar146 = vblendps_avx(auVar120,_DAT_01f7aa10,0xe);
                auVar116 = vrsqrtss_avx(auVar146,auVar146);
                fVar162 = auVar116._0_4_;
                fVar214 = auVar120._0_4_;
                auVar116 = vdpps_avx(auVar383,auVar141,0x7f);
                auVar145 = vshufps_avx(auVar120,auVar120,0);
                auVar142._0_4_ = auVar141._0_4_ * auVar145._0_4_;
                auVar142._4_4_ = auVar141._4_4_ * auVar145._4_4_;
                auVar142._8_4_ = auVar141._8_4_ * auVar145._8_4_;
                auVar142._12_4_ = auVar141._12_4_ * auVar145._12_4_;
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar246._0_4_ = auVar383._0_4_ * auVar116._0_4_;
                auVar246._4_4_ = auVar383._4_4_ * auVar116._4_4_;
                auVar246._8_4_ = auVar383._8_4_ * auVar116._8_4_;
                auVar246._12_4_ = auVar383._12_4_ * auVar116._12_4_;
                auVar140 = vsubps_avx(auVar142,auVar246);
                auVar116 = vrcpss_avx(auVar146,auVar146);
                auVar146 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                      ZEXT416((uint)((float)local_860._0_4_ * local_b00)));
                auVar116 = ZEXT416((uint)(auVar116._0_4_ * (2.0 - fVar214 * auVar116._0_4_)));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                uVar103 = CONCAT44(auVar383._4_4_,auVar383._0_4_);
                local_820._0_8_ = uVar103 ^ 0x8000000080000000;
                local_820._8_4_ = -auVar383._8_4_;
                local_820._12_4_ = -auVar383._12_4_;
                auVar145 = ZEXT416((uint)(fVar162 * 1.5 +
                                         fVar214 * -0.5 * fVar162 * fVar162 * fVar162));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar218._0_4_ = auVar145._0_4_ * auVar140._0_4_ * auVar116._0_4_;
                auVar218._4_4_ = auVar145._4_4_ * auVar140._4_4_ * auVar116._4_4_;
                auVar218._8_4_ = auVar145._8_4_ * auVar140._8_4_ * auVar116._8_4_;
                auVar218._12_4_ = auVar145._12_4_ * auVar140._12_4_ * auVar116._12_4_;
                auVar286._0_4_ = auVar383._0_4_ * auVar145._0_4_;
                auVar286._4_4_ = auVar383._4_4_ * auVar145._4_4_;
                auVar286._8_4_ = auVar383._8_4_ * auVar145._8_4_;
                auVar286._12_4_ = auVar383._12_4_ * auVar145._12_4_;
                local_9e0._0_4_ = auVar146._0_4_;
                if (fVar214 < 0.0) {
                  local_a00._0_4_ = fVar211;
                  local_900._0_16_ = auVar286;
                  auVar395 = ZEXT1664(auVar383);
                  fVar162 = sqrtf(fVar214);
                  auVar286 = local_900._0_16_;
                  fVar214 = (float)local_9e0._0_4_;
                  fVar211 = (float)local_a00._0_4_;
                }
                else {
                  auVar120 = vsqrtss_avx(auVar120,auVar120);
                  fVar162 = auVar120._0_4_;
                  fVar214 = auVar146._0_4_;
                }
                auVar146 = vdpps_avx(_local_940,auVar286,0x7f);
                local_a00._0_4_ =
                     ((float)local_920._0_4_ / fVar162) * (fVar211 + 1.0) +
                     fVar214 + fVar211 * (float)local_920._0_4_;
                auVar120 = vdpps_avx(local_820._0_16_,auVar286,0x7f);
                auVar116 = vdpps_avx(_local_940,auVar218,0x7f);
                auVar95._4_4_ = fStack_7fc;
                auVar95._0_4_ = local_800;
                auVar95._8_4_ = fStack_7f8;
                auVar95._12_4_ = aStack_7f4.a;
                auVar145 = vdpps_avx(auVar95,auVar286,0x7f);
                auVar140 = vdpps_avx(_local_940,local_820._0_16_,0x7f);
                fVar162 = auVar120._0_4_ + auVar116._0_4_;
                fVar237 = auVar146._0_4_;
                auVar117._0_4_ = fVar237 * fVar237;
                auVar117._4_4_ = auVar146._4_4_ * auVar146._4_4_;
                auVar117._8_4_ = auVar146._8_4_ * auVar146._8_4_;
                auVar117._12_4_ = auVar146._12_4_ * auVar146._12_4_;
                auVar116 = vsubps_avx(auVar250,auVar117);
                local_820._0_16_ = ZEXT416((uint)fVar162);
                auVar120 = vdpps_avx(_local_940,auVar95,0x7f);
                fVar166 = auVar140._0_4_ - fVar237 * fVar162;
                fVar237 = auVar120._0_4_ - fVar237 * auVar145._0_4_;
                auVar120 = vrsqrtss_avx(auVar116,auVar116);
                fVar211 = auVar116._0_4_;
                fVar162 = auVar120._0_4_;
                fVar162 = fVar162 * 1.5 + fVar211 * -0.5 * fVar162 * fVar162 * fVar162;
                if (fVar211 < 0.0) {
                  local_900._0_16_ = auVar146;
                  local_880._0_4_ = fVar166;
                  local_7a0._0_4_ = fVar237;
                  local_7c0._0_4_ = fVar162;
                  auVar395 = ZEXT1664(auVar395._0_16_);
                  fVar211 = sqrtf(fVar211);
                  fVar162 = (float)local_7c0._0_4_;
                  fVar166 = (float)local_880._0_4_;
                  fVar237 = (float)local_7a0._0_4_;
                  auVar146 = local_900._0_16_;
                  fVar214 = (float)local_9e0._0_4_;
                }
                else {
                  auVar120 = vsqrtss_avx(auVar116,auVar116);
                  fVar211 = auVar120._0_4_;
                }
                auVar140 = vpermilps_avx(local_780._0_16_,0xff);
                auVar122 = vpermilps_avx(auVar383,0xff);
                fVar166 = fVar166 * fVar162 - auVar122._0_4_;
                auVar247._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar247._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar271._0_4_ = -fVar166;
                auVar271._4_4_ = 0x80000000;
                auVar271._8_4_ = 0x80000000;
                auVar271._12_4_ = 0x80000000;
                auVar120 = vinsertps_avx(auVar271,ZEXT416((uint)(fVar237 * fVar162)),0x1c);
                auVar145 = vmovsldup_avx(ZEXT416((uint)(local_820._0_4_ * fVar237 * fVar162 -
                                                       auVar145._0_4_ * fVar166)));
                auVar120 = vdivps_avx(auVar120,auVar145);
                auVar116 = vinsertps_avx(local_820._0_16_,auVar247,0x10);
                auVar116 = vdivps_avx(auVar116,auVar145);
                auVar145 = vmovsldup_avx(auVar146);
                auVar118 = ZEXT416((uint)(fVar211 - auVar140._0_4_));
                auVar140 = vmovsldup_avx(auVar118);
                auVar176._0_4_ = auVar145._0_4_ * auVar120._0_4_ + auVar140._0_4_ * auVar116._0_4_;
                auVar176._4_4_ = auVar145._4_4_ * auVar120._4_4_ + auVar140._4_4_ * auVar116._4_4_;
                auVar176._8_4_ = auVar145._8_4_ * auVar120._8_4_ + auVar140._8_4_ * auVar116._8_4_;
                auVar176._12_4_ =
                     auVar145._12_4_ * auVar120._12_4_ + auVar140._12_4_ * auVar116._12_4_;
                auVar225 = vsubps_avx(auVar225,auVar176);
                auVar177._8_4_ = 0x7fffffff;
                auVar177._0_8_ = 0x7fffffff7fffffff;
                auVar177._12_4_ = 0x7fffffff;
                auVar146 = vandps_avx(auVar146,auVar177);
                fVar166 = (float)local_980._4_4_;
                fVar211 = fStack_978;
                fVar170 = fStack_974;
                fVar167 = fStack_970;
                fVar239 = fStack_96c;
                fVar240 = fStack_968;
                fVar237 = (float)local_980._0_4_;
                fVar241 = (float)local_960._4_4_;
                fVar243 = fStack_958;
                fVar261 = fStack_954;
                fVar262 = fStack_950;
                fVar263 = fStack_94c;
                fVar264 = fStack_948;
                fVar162 = (float)local_960._0_4_;
                if (auVar146._0_4_ < (float)local_a00._0_4_) {
                  auVar219._8_4_ = 0x7fffffff;
                  auVar219._0_8_ = 0x7fffffff7fffffff;
                  auVar219._12_4_ = 0x7fffffff;
                  auVar146 = vandps_avx(auVar118,auVar219);
                  if (auVar146._0_4_ <
                      (float)local_6c0._0_4_ * 1.9073486e-06 + fVar214 + (float)local_a00._0_4_) {
                    fVar214 = auVar225._0_4_ + (float)local_750._0_4_;
                    auVar430 = ZEXT3264(_local_a20);
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar214) &&
                       (fVar265 = (ray->super_RayK<1>).tfar, fVar214 <= fVar265)) {
                      auVar225 = vmovshdup_avx(auVar225);
                      fVar266 = auVar225._0_4_;
                      if ((0.0 <= fVar266) && (fVar266 <= 1.0)) {
                        auVar225 = vrsqrtss_avx(auVar250,auVar250);
                        fVar268 = auVar225._0_4_;
                        pGVar27 = (context->scene->geometries).items[uVar107].ptr;
                        if ((pGVar27->mask & (ray->super_RayK<1>).mask) != 0) {
                          auVar225 = ZEXT416((uint)(fVar268 * 1.5 +
                                                   fVar238 * -0.5 * fVar268 * fVar268 * fVar268));
                          auVar225 = vshufps_avx(auVar225,auVar225,0);
                          auVar220._0_4_ = auVar225._0_4_ * (float)local_940._0_4_;
                          auVar220._4_4_ = auVar225._4_4_ * (float)local_940._4_4_;
                          auVar220._8_4_ = auVar225._8_4_ * fStack_938;
                          auVar220._12_4_ = auVar225._12_4_ * fStack_934;
                          auVar143._0_4_ = auVar383._0_4_ + auVar122._0_4_ * auVar220._0_4_;
                          auVar143._4_4_ = auVar383._4_4_ + auVar122._4_4_ * auVar220._4_4_;
                          auVar143._8_4_ = auVar383._8_4_ + auVar122._8_4_ * auVar220._8_4_;
                          auVar143._12_4_ = auVar383._12_4_ + auVar122._12_4_ * auVar220._12_4_;
                          auVar225 = vshufps_avx(auVar220,auVar220,0xc9);
                          auVar250 = vshufps_avx(auVar383,auVar383,0xc9);
                          auVar221._0_4_ = auVar250._0_4_ * auVar220._0_4_;
                          auVar221._4_4_ = auVar250._4_4_ * auVar220._4_4_;
                          auVar221._8_4_ = auVar250._8_4_ * auVar220._8_4_;
                          auVar221._12_4_ = auVar250._12_4_ * auVar220._12_4_;
                          auVar248._0_4_ = auVar383._0_4_ * auVar225._0_4_;
                          auVar248._4_4_ = auVar383._4_4_ * auVar225._4_4_;
                          auVar248._8_4_ = auVar383._8_4_ * auVar225._8_4_;
                          auVar248._12_4_ = auVar383._12_4_ * auVar225._12_4_;
                          auVar146 = vsubps_avx(auVar248,auVar221);
                          auVar225 = vshufps_avx(auVar146,auVar146,0xc9);
                          auVar250 = vshufps_avx(auVar143,auVar143,0xc9);
                          auVar249._0_4_ = auVar250._0_4_ * auVar225._0_4_;
                          auVar249._4_4_ = auVar250._4_4_ * auVar225._4_4_;
                          auVar249._8_4_ = auVar250._8_4_ * auVar225._8_4_;
                          auVar249._12_4_ = auVar250._12_4_ * auVar225._12_4_;
                          auVar225 = vshufps_avx(auVar146,auVar146,0xd2);
                          auVar144._0_4_ = auVar143._0_4_ * auVar225._0_4_;
                          auVar144._4_4_ = auVar143._4_4_ * auVar225._4_4_;
                          auVar144._8_4_ = auVar143._8_4_ * auVar225._8_4_;
                          auVar144._12_4_ = auVar143._12_4_ * auVar225._12_4_;
                          auVar225 = vsubps_avx(auVar249,auVar144);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar214;
                            auVar250 = vshufps_avx(auVar225,auVar225,0xe9);
                            uVar9 = vmovlps_avx(auVar250);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                            (ray->Ng).field_0.field_0.z = auVar225._0_4_;
                            ray->u = fVar266;
                            ray->v = 0.0;
                            ray->primID = local_8a0._0_4_;
                            ray->geomID = uVar107;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar250 = vshufps_avx(auVar225,auVar225,0xe9);
                            local_8d0 = vmovlps_avx(auVar250);
                            local_8c8 = auVar225._0_4_;
                            local_8c4 = fVar266;
                            local_8c0 = 0;
                            local_8bc = local_8a0._0_4_;
                            local_8b8 = uVar107;
                            local_8b4 = context->user->instID[0];
                            local_8b0 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar214;
                            local_680._0_4_ = 0xffffffff;
                            local_a58.valid = (int *)local_680;
                            local_a58.geometryUserPtr = pGVar27->userPtr;
                            local_a58.context = context->user;
                            local_a58.hit = (RTCHitN *)&local_8d0;
                            local_a58.N = 1;
                            local_a58.ray = (RTCRayN *)ray;
                            if (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011a07bb:
                              p_Var30 = context->args->filter;
                              if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar395 = ZEXT1664(auVar395._0_16_);
                                (*p_Var30)(&local_a58);
                                if (*local_a58.valid == 0) goto LAB_011a084f;
                              }
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a58.hit;
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a58.hit + 4);
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a58.hit + 8);
                              *(float *)((long)local_a58.ray + 0x3c) =
                                   *(float *)(local_a58.hit + 0xc);
                              *(float *)((long)local_a58.ray + 0x40) =
                                   *(float *)(local_a58.hit + 0x10);
                              *(float *)((long)local_a58.ray + 0x44) =
                                   *(float *)(local_a58.hit + 0x14);
                              *(float *)((long)local_a58.ray + 0x48) =
                                   *(float *)(local_a58.hit + 0x18);
                              *(float *)((long)local_a58.ray + 0x4c) =
                                   *(float *)(local_a58.hit + 0x1c);
                              *(float *)((long)local_a58.ray + 0x50) =
                                   *(float *)(local_a58.hit + 0x20);
                            }
                            else {
                              auVar395 = ZEXT1664(auVar395._0_16_);
                              (*pGVar27->intersectionFilterN)(&local_a58);
                              if (*local_a58.valid != 0) goto LAB_011a07bb;
LAB_011a084f:
                              (ray->super_RayK<1>).tfar = fVar265;
                            }
                            auVar430 = ZEXT3264(_local_a20);
                            fVar237 = (float)local_980._0_4_;
                            fVar166 = (float)local_980._4_4_;
                            fVar211 = fStack_978;
                            fVar170 = fStack_974;
                            fVar167 = fStack_970;
                            fVar239 = fStack_96c;
                            fVar240 = fStack_968;
                            fVar162 = (float)local_960._0_4_;
                            fVar241 = (float)local_960._4_4_;
                            fVar243 = fStack_958;
                            fVar261 = fStack_954;
                            fVar262 = fStack_950;
                            fVar263 = fStack_94c;
                            fVar264 = fStack_948;
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar108 = lVar108 + -1;
                auVar430 = ZEXT3264(_local_a20);
              } while (lVar108 != 0);
              auVar185 = local_500;
              fVar214 = (ray->super_RayK<1>).tfar;
              auVar131._4_4_ = fVar214;
              auVar131._0_4_ = fVar214;
              auVar131._8_4_ = fVar214;
              auVar131._12_4_ = fVar214;
              auVar131._16_4_ = fVar214;
              auVar131._20_4_ = fVar214;
              auVar131._24_4_ = fVar214;
              auVar131._28_4_ = fVar214;
              auVar124 = vcmpps_avx(_local_700,auVar131,2);
              fVar214 = auVar124._28_4_;
              local_500 = vandps_avx(auVar124,local_500);
              auVar330 = ZEXT3264(local_500);
              auVar185 = auVar185 & auVar124;
              auVar322 = local_740._0_28_;
            } while ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar185 >> 0x7f,0) != '\0') ||
                       (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar185 >> 0xbf,0) != '\0') ||
                     (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar185[0x1f] < '\0');
            auVar330 = ZEXT3264(_local_4c0);
            local_7e0 = _local_4c0;
            auVar406 = ZEXT3264(_local_840);
            fVar238 = (float)local_660._0_4_;
            fVar265 = (float)local_660._4_4_;
            fVar266 = fStack_658;
            fVar268 = fStack_654;
            fVar278 = fStack_650;
            fVar279 = fStack_64c;
            fVar280 = fStack_648;
            fVar281 = fStack_644;
          }
          auVar159._0_4_ =
               auVar322._0_4_ * (float)local_620._0_4_ +
               fVar162 * (float)local_720._0_4_ + fVar237 * (float)local_640._0_4_;
          auVar159._4_4_ =
               auVar322._4_4_ * (float)local_620._4_4_ +
               fVar241 * (float)local_720._4_4_ + fVar166 * (float)local_640._4_4_;
          auVar159._8_4_ = auVar322._8_4_ * fStack_618 + fVar243 * fStack_718 + fVar211 * fStack_638
          ;
          auVar159._12_4_ =
               auVar322._12_4_ * fStack_614 + fVar261 * fStack_714 + fVar170 * fStack_634;
          auVar159._16_4_ =
               auVar322._16_4_ * fStack_610 + fVar262 * fStack_710 + fVar167 * fStack_630;
          auVar159._20_4_ =
               auVar322._20_4_ * fStack_60c + fVar263 * fStack_70c + fVar239 * fStack_62c;
          auVar159._24_4_ =
               auVar322._24_4_ * fStack_608 + fVar264 * fStack_708 + fVar240 * fStack_628;
          auVar159._28_4_ = fVar214 + fVar214 + auVar330._28_4_;
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar188._16_4_ = 0x7fffffff;
          auVar188._20_4_ = 0x7fffffff;
          auVar188._24_4_ = 0x7fffffff;
          auVar188._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar159,auVar188);
          auVar189._8_4_ = 0x3e99999a;
          auVar189._0_8_ = 0x3e99999a3e99999a;
          auVar189._12_4_ = 0x3e99999a;
          auVar189._16_4_ = 0x3e99999a;
          auVar189._20_4_ = 0x3e99999a;
          auVar189._24_4_ = 0x3e99999a;
          auVar189._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar189,1);
          auVar185 = vorps_avx(auVar124,local_5c0);
          auVar190._0_4_ = (float)local_6a0._0_4_ + fVar238;
          auVar190._4_4_ = (float)local_6a0._4_4_ + fVar265;
          auVar190._8_4_ = fStack_698 + fVar266;
          auVar190._12_4_ = fStack_694 + fVar268;
          auVar190._16_4_ = fStack_690 + fVar278;
          auVar190._20_4_ = fStack_68c + fVar279;
          auVar190._24_4_ = fStack_688 + fVar280;
          auVar190._28_4_ = fStack_684 + fVar281;
          auVar124 = vcmpps_avx(auVar190,auVar131,2);
          _local_700 = vandps_avx(auVar124,local_5a0);
          auVar191._8_4_ = 3;
          auVar191._0_8_ = 0x300000003;
          auVar191._12_4_ = 3;
          auVar191._16_4_ = 3;
          auVar191._20_4_ = 3;
          auVar191._24_4_ = 3;
          auVar191._28_4_ = 3;
          auVar236._8_4_ = 2;
          auVar236._0_8_ = 0x200000002;
          auVar236._12_4_ = 2;
          auVar236._16_4_ = 2;
          auVar236._20_4_ = 2;
          auVar236._24_4_ = 2;
          auVar236._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar236,auVar191,auVar185);
          auVar99._4_4_ = fStack_5fc;
          auVar99._0_4_ = local_600;
          auVar99._8_4_ = fStack_5f8;
          auVar99._12_4_ = fStack_5f4;
          auVar225 = vpcmpgtd_avx(auVar124._16_16_,auVar99);
          auVar250 = vpshufd_avx(_local_5e0,0);
          auVar250 = vpcmpgtd_avx(auVar124._0_16_,auVar250);
          auVar192._16_16_ = auVar225;
          auVar192._0_16_ = auVar131._0_16_;
          local_740 = vblendps_avx(ZEXT1632(auVar250),auVar192,0xf0);
          local_680 = vandnps_avx(local_740,_local_700);
          auVar124 = _local_700 & ~local_740;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            local_6c0._4_4_ = (float)local_6a0._4_4_ + local_4c0._4_4_;
            local_6c0._0_4_ = (float)local_6a0._0_4_ + local_4c0._0_4_;
            fStack_6b8 = fStack_698 + local_4c0._8_4_;
            fStack_6b4 = fStack_694 + local_4c0._12_4_;
            fStack_6b0 = fStack_690 + local_4c0._16_4_;
            fStack_6ac = fStack_68c + local_4c0._20_4_;
            fStack_6a8 = fStack_688 + local_4c0._24_4_;
            fStack_6a4 = fStack_684 + local_4c0._28_4_;
            local_7e0 = _local_4c0;
            do {
              auVar133._8_4_ = 0x7f800000;
              auVar133._0_8_ = 0x7f8000007f800000;
              auVar133._12_4_ = 0x7f800000;
              auVar133._16_4_ = 0x7f800000;
              auVar133._20_4_ = 0x7f800000;
              auVar133._24_4_ = 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar124 = vblendvps_avx(auVar133,local_7e0,local_680);
              auVar185 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar185 = vminps_avx(auVar124,auVar185);
              auVar31 = vshufpd_avx(auVar185,auVar185,5);
              auVar185 = vminps_avx(auVar185,auVar31);
              auVar31 = vperm2f128_avx(auVar185,auVar185,1);
              auVar185 = vminps_avx(auVar185,auVar31);
              auVar185 = vcmpps_avx(auVar124,auVar185,0);
              auVar31 = local_680 & auVar185;
              auVar124 = local_680;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar185,local_680);
              }
              uVar102 = vmovmskps_avx(auVar124);
              uVar105 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
                }
              }
              uVar103 = (ulong)uVar105;
              *(undefined4 *)(local_680 + uVar103 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_800 = aVar10.x;
              fStack_7fc = aVar10.y;
              fStack_7f8 = aVar10.z;
              aStack_7f4 = aVar10.field_3;
              auVar225 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar214 = local_1c0[uVar103];
              uVar105 = *(uint *)(local_4a0 + uVar103 * 4);
              if (auVar225._0_4_ < 0.0) {
                fVar162 = sqrtf(auVar225._0_4_);
              }
              else {
                auVar225 = vsqrtss_avx(auVar225,auVar225);
                fVar162 = auVar225._0_4_;
              }
              auVar250 = vminps_avx(_local_990,_local_9b0);
              auVar225 = vmaxps_avx(_local_990,_local_9b0);
              auVar146 = vminps_avx(_local_9a0,_local_9c0);
              auVar120 = vminps_avx(auVar250,auVar146);
              auVar250 = vmaxps_avx(_local_9a0,_local_9c0);
              auVar146 = vmaxps_avx(auVar225,auVar250);
              auVar222._8_4_ = 0x7fffffff;
              auVar222._0_8_ = 0x7fffffff7fffffff;
              auVar222._12_4_ = 0x7fffffff;
              auVar225 = vandps_avx(auVar120,auVar222);
              auVar250 = vandps_avx(auVar146,auVar222);
              auVar225 = vmaxps_avx(auVar225,auVar250);
              auVar250 = vmovshdup_avx(auVar225);
              auVar250 = vmaxss_avx(auVar250,auVar225);
              auVar225 = vshufpd_avx(auVar225,auVar225,1);
              auVar225 = vmaxss_avx(auVar225,auVar250);
              local_920._0_4_ = auVar225._0_4_ * 1.9073486e-06;
              local_820._0_4_ = fVar162 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar146,auVar146,0xff);
              auVar225 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar214),0x10);
              lVar108 = 5;
              do {
                auVar250 = vshufps_avx(auVar225,auVar225,0);
                auVar119._0_4_ = auVar250._0_4_ * local_800 + 0.0;
                auVar119._4_4_ = auVar250._4_4_ * fStack_7fc + 0.0;
                auVar119._8_4_ = auVar250._8_4_ * fStack_7f8 + 0.0;
                auVar119._12_4_ = auVar250._12_4_ * aStack_7f4.w + 0.0;
                auVar146 = vmovshdup_avx(auVar225);
                fVar238 = auVar146._0_4_;
                fVar211 = 1.0 - fVar238;
                fVar162 = fVar238 * fVar238;
                fVar237 = fVar238 * 3.0;
                fVar214 = fVar237 + -5.0;
                fVar166 = fVar211 * fVar211;
                auVar250 = ZEXT416((uint)(fVar238 * fVar238 * -fVar211 * 0.5));
                auVar250 = vshufps_avx(auVar250,auVar250,0);
                auVar120 = ZEXT416((uint)((fVar166 * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar116 = ZEXT416((uint)((fVar162 * fVar214 + 2.0) * 0.5));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar145 = ZEXT416((uint)(fVar211 * fVar211 * -fVar238 * 0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar178._0_4_ =
                     auVar145._0_4_ * (float)local_990._0_4_ +
                     auVar116._0_4_ * (float)local_9b0._0_4_ +
                     auVar120._0_4_ * (float)local_9a0._0_4_ +
                     auVar250._0_4_ * (float)local_9c0._0_4_;
                auVar178._4_4_ =
                     auVar145._4_4_ * (float)local_990._4_4_ +
                     auVar116._4_4_ * (float)local_9b0._4_4_ +
                     auVar120._4_4_ * (float)local_9a0._4_4_ +
                     auVar250._4_4_ * (float)local_9c0._4_4_;
                auVar178._8_4_ =
                     auVar145._8_4_ * fStack_988 +
                     auVar116._8_4_ * fStack_9a8 +
                     auVar120._8_4_ * fStack_998 + auVar250._8_4_ * fStack_9b8;
                auVar178._12_4_ =
                     auVar145._12_4_ * fStack_984 +
                     auVar116._12_4_ * fStack_9a4 +
                     auVar120._12_4_ * fStack_994 + auVar250._12_4_ * fStack_9b4;
                local_780._0_16_ = auVar178;
                auVar250 = vsubps_avx(auVar119,auVar178);
                _local_940 = auVar250;
                auVar250 = vdpps_avx(auVar250,auVar250,0x7f);
                local_9e0._0_16_ = ZEXT416((uint)(fVar237 + -1.0));
                fVar170 = auVar250._0_4_;
                local_a00._0_4_ = fVar166;
                if (fVar170 < 0.0) {
                  local_860._0_16_ = auVar146;
                  local_960._0_4_ = fVar162;
                  _local_980 = ZEXT416((uint)fVar211);
                  local_900._0_4_ = fVar237;
                  local_880._0_4_ = fVar214;
                  local_7a0._0_4_ = fVar211 * -2.0;
                  fVar166 = sqrtf(fVar170);
                  fVar214 = (float)local_880._0_4_;
                  fVar167 = (float)local_7a0._0_4_;
                  fVar162 = (float)local_960._0_4_;
                  fVar237 = (float)local_900._0_4_;
                  auVar146 = local_860._0_16_;
                  fVar211 = (float)local_980._0_4_;
                }
                else {
                  auVar120 = vsqrtss_avx(auVar250,auVar250);
                  fVar166 = auVar120._0_4_;
                  fVar167 = fVar211 * -2.0;
                }
                fVar239 = auVar146._0_4_;
                auVar146 = ZEXT416((uint)((fVar162 + fVar239 * fVar167) * 0.5));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar120 = ZEXT416((uint)(((fVar211 + fVar211) * (fVar237 + 2.0) +
                                          fVar211 * fVar211 * -3.0) * 0.5));
                auVar120 = vshufps_avx(auVar120,auVar120,0);
                auVar116 = ZEXT416((uint)((fVar214 * (fVar239 + fVar239) + fVar239 * fVar237) * 0.5)
                                  );
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar145 = ZEXT416((uint)((fVar239 * (fVar211 + fVar211) - (float)local_a00._0_4_) *
                                         0.5));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar384._0_4_ =
                     (float)local_990._0_4_ * auVar145._0_4_ +
                     (float)local_9b0._0_4_ * auVar116._0_4_ +
                     (float)local_9c0._0_4_ * auVar146._0_4_ +
                     (float)local_9a0._0_4_ * auVar120._0_4_;
                auVar384._4_4_ =
                     (float)local_990._4_4_ * auVar145._4_4_ +
                     (float)local_9b0._4_4_ * auVar116._4_4_ +
                     (float)local_9c0._4_4_ * auVar146._4_4_ +
                     (float)local_9a0._4_4_ * auVar120._4_4_;
                auVar384._8_4_ =
                     fStack_988 * auVar145._8_4_ +
                     fStack_9a8 * auVar116._8_4_ +
                     fStack_9b8 * auVar146._8_4_ + fStack_998 * auVar120._8_4_;
                auVar384._12_4_ =
                     fStack_984 * auVar145._12_4_ +
                     fStack_9a4 * auVar116._12_4_ +
                     fStack_9b4 * auVar146._12_4_ + fStack_994 * auVar120._12_4_;
                auVar395 = ZEXT1664(auVar384);
                auVar145 = vpermilps_avx(local_9e0._0_16_,0);
                auVar140 = vpermilps_avx(ZEXT416((uint)(fVar238 * -9.0 + 4.0)),0);
                auVar146 = ZEXT416((uint)(fVar238 * 9.0 + -5.0));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar120 = ZEXT416((uint)(fVar239 * -3.0 + 2.0));
                auVar116 = vshufps_avx(auVar120,auVar120,0);
                auVar120 = vdpps_avx(auVar384,auVar384,0x7f);
                auVar147._0_4_ =
                     (float)local_990._0_4_ * auVar116._0_4_ +
                     (float)local_9b0._0_4_ * auVar146._0_4_ +
                     (float)local_9a0._0_4_ * auVar140._0_4_ +
                     (float)local_9c0._0_4_ * auVar145._0_4_;
                auVar147._4_4_ =
                     (float)local_990._4_4_ * auVar116._4_4_ +
                     (float)local_9b0._4_4_ * auVar146._4_4_ +
                     (float)local_9a0._4_4_ * auVar140._4_4_ +
                     (float)local_9c0._4_4_ * auVar145._4_4_;
                auVar147._8_4_ =
                     fStack_988 * auVar116._8_4_ +
                     fStack_9a8 * auVar146._8_4_ +
                     fStack_998 * auVar140._8_4_ + fStack_9b8 * auVar145._8_4_;
                auVar147._12_4_ =
                     fStack_984 * auVar116._12_4_ +
                     fStack_9a4 * auVar146._12_4_ +
                     fStack_994 * auVar140._12_4_ + fStack_9b4 * auVar145._12_4_;
                auVar146 = vblendps_avx(auVar120,_DAT_01f7aa10,0xe);
                auVar116 = vrsqrtss_avx(auVar146,auVar146);
                fVar162 = auVar116._0_4_;
                fVar214 = auVar120._0_4_;
                auVar116 = vdpps_avx(auVar384,auVar147,0x7f);
                auVar145 = vshufps_avx(auVar120,auVar120,0);
                auVar148._0_4_ = auVar147._0_4_ * auVar145._0_4_;
                auVar148._4_4_ = auVar147._4_4_ * auVar145._4_4_;
                auVar148._8_4_ = auVar147._8_4_ * auVar145._8_4_;
                auVar148._12_4_ = auVar147._12_4_ * auVar145._12_4_;
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                auVar251._0_4_ = auVar384._0_4_ * auVar116._0_4_;
                auVar251._4_4_ = auVar384._4_4_ * auVar116._4_4_;
                auVar251._8_4_ = auVar384._8_4_ * auVar116._8_4_;
                auVar251._12_4_ = auVar384._12_4_ * auVar116._12_4_;
                auVar140 = vsubps_avx(auVar148,auVar251);
                auVar116 = vrcpss_avx(auVar146,auVar146);
                auVar146 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                      ZEXT416((uint)(auVar225._0_4_ * (float)local_820._0_4_)));
                auVar116 = ZEXT416((uint)(auVar116._0_4_ * (2.0 - fVar214 * auVar116._0_4_)));
                auVar116 = vshufps_avx(auVar116,auVar116,0);
                uVar103 = CONCAT44(auVar384._4_4_,auVar384._0_4_);
                auVar272._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar272._8_4_ = -auVar384._8_4_;
                auVar272._12_4_ = -auVar384._12_4_;
                auVar145 = ZEXT416((uint)(fVar162 * 1.5 +
                                         fVar214 * -0.5 * fVar162 * fVar162 * fVar162));
                auVar145 = vshufps_avx(auVar145,auVar145,0);
                auVar223._0_4_ = auVar145._0_4_ * auVar140._0_4_ * auVar116._0_4_;
                auVar223._4_4_ = auVar145._4_4_ * auVar140._4_4_ * auVar116._4_4_;
                auVar223._8_4_ = auVar145._8_4_ * auVar140._8_4_ * auVar116._8_4_;
                auVar223._12_4_ = auVar145._12_4_ * auVar140._12_4_ * auVar116._12_4_;
                auVar287._0_4_ = auVar384._0_4_ * auVar145._0_4_;
                auVar287._4_4_ = auVar384._4_4_ * auVar145._4_4_;
                auVar287._8_4_ = auVar384._8_4_ * auVar145._8_4_;
                auVar287._12_4_ = auVar384._12_4_ * auVar145._12_4_;
                local_9e0._0_4_ = auVar146._0_4_;
                local_a00._0_4_ = fVar166;
                if (fVar214 < 0.0) {
                  local_860._0_16_ = auVar272;
                  _local_960 = auVar287;
                  _local_980 = auVar223;
                  auVar395 = ZEXT1664(auVar384);
                  fVar162 = sqrtf(fVar214);
                  auVar223 = _local_980;
                  auVar272 = local_860._0_16_;
                  auVar287 = _local_960;
                  fVar214 = (float)local_9e0._0_4_;
                }
                else {
                  auVar120 = vsqrtss_avx(auVar120,auVar120);
                  fVar162 = auVar120._0_4_;
                  fVar214 = auVar146._0_4_;
                }
                auVar146 = vdpps_avx(_local_940,auVar287,0x7f);
                local_a00._0_4_ =
                     ((float)local_920._0_4_ / fVar162) * ((float)local_a00._0_4_ + 1.0) +
                     fVar214 + (float)local_a00._0_4_ * (float)local_920._0_4_;
                auVar120 = vdpps_avx(auVar272,auVar287,0x7f);
                auVar116 = vdpps_avx(_local_940,auVar223,0x7f);
                auVar96._4_4_ = fStack_7fc;
                auVar96._0_4_ = local_800;
                auVar96._8_4_ = fStack_7f8;
                auVar96._12_4_ = aStack_7f4.a;
                auVar145 = vdpps_avx(auVar96,auVar287,0x7f);
                auVar140 = vdpps_avx(_local_940,auVar272,0x7f);
                fVar162 = auVar120._0_4_ + auVar116._0_4_;
                fVar166 = auVar146._0_4_;
                auVar121._0_4_ = fVar166 * fVar166;
                auVar121._4_4_ = auVar146._4_4_ * auVar146._4_4_;
                auVar121._8_4_ = auVar146._8_4_ * auVar146._8_4_;
                auVar121._12_4_ = auVar146._12_4_ * auVar146._12_4_;
                auVar122 = vsubps_avx(auVar250,auVar121);
                auVar120 = vdpps_avx(_local_940,auVar96,0x7f);
                fVar211 = auVar140._0_4_ - fVar166 * fVar162;
                auVar116 = vrsqrtss_avx(auVar122,auVar122);
                fVar238 = auVar122._0_4_;
                fVar237 = auVar116._0_4_;
                fVar237 = fVar237 * 1.5 + fVar238 * -0.5 * fVar237 * fVar237 * fVar237;
                if (fVar238 < 0.0) {
                  local_860._0_16_ = auVar146;
                  _local_960 = auVar145;
                  _local_980 = ZEXT416((uint)fVar162);
                  local_900._0_4_ = fVar211;
                  local_880._0_4_ = fVar237;
                  auVar395 = ZEXT1664(auVar395._0_16_);
                  fVar238 = sqrtf(fVar238);
                  fVar237 = (float)local_880._0_4_;
                  fVar211 = (float)local_900._0_4_;
                  auVar116 = _local_960;
                  auVar146 = local_860._0_16_;
                  auVar140 = _local_980;
                  fVar214 = (float)local_9e0._0_4_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar122,auVar122);
                  fVar238 = auVar116._0_4_;
                  auVar116 = auVar145;
                  auVar140 = ZEXT416((uint)fVar162);
                }
                auVar430 = ZEXT3264(_local_a20);
                auVar406 = ZEXT3264(_local_840);
                auVar122 = vpermilps_avx(local_780._0_16_,0xff);
                auVar118 = vpermilps_avx(auVar384,0xff);
                fVar162 = fVar211 * fVar237 - auVar118._0_4_;
                fVar237 = (auVar120._0_4_ - fVar166 * auVar145._0_4_) * fVar237;
                auVar252._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar252._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar252._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar273._0_4_ = -fVar162;
                auVar273._4_4_ = 0x80000000;
                auVar273._8_4_ = 0x80000000;
                auVar273._12_4_ = 0x80000000;
                auVar120 = vinsertps_avx(auVar273,ZEXT416((uint)fVar237),0x1c);
                auVar145 = vmovsldup_avx(ZEXT416((uint)(auVar140._0_4_ * fVar237 -
                                                       auVar116._0_4_ * fVar162)));
                auVar120 = vdivps_avx(auVar120,auVar145);
                auVar116 = vinsertps_avx(auVar140,auVar252,0x10);
                auVar116 = vdivps_avx(auVar116,auVar145);
                auVar145 = vmovsldup_avx(auVar146);
                auVar122 = ZEXT416((uint)(fVar238 - auVar122._0_4_));
                auVar140 = vmovsldup_avx(auVar122);
                auVar179._0_4_ = auVar145._0_4_ * auVar120._0_4_ + auVar140._0_4_ * auVar116._0_4_;
                auVar179._4_4_ = auVar145._4_4_ * auVar120._4_4_ + auVar140._4_4_ * auVar116._4_4_;
                auVar179._8_4_ = auVar145._8_4_ * auVar120._8_4_ + auVar140._8_4_ * auVar116._8_4_;
                auVar179._12_4_ =
                     auVar145._12_4_ * auVar120._12_4_ + auVar140._12_4_ * auVar116._12_4_;
                auVar225 = vsubps_avx(auVar225,auVar179);
                auVar180._8_4_ = 0x7fffffff;
                auVar180._0_8_ = 0x7fffffff7fffffff;
                auVar180._12_4_ = 0x7fffffff;
                auVar146 = vandps_avx(auVar146,auVar180);
                if (auVar146._0_4_ < (float)local_a00._0_4_) {
                  auVar224._8_4_ = 0x7fffffff;
                  auVar224._0_8_ = 0x7fffffff7fffffff;
                  auVar224._12_4_ = 0x7fffffff;
                  auVar146 = vandps_avx(auVar122,auVar224);
                  if (auVar146._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + fVar214 + (float)local_a00._0_4_) {
                    fVar214 = auVar225._0_4_ + (float)local_750._0_4_;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar214) &&
                       (fVar162 = (ray->super_RayK<1>).tfar, fVar214 <= fVar162)) {
                      auVar225 = vmovshdup_avx(auVar225);
                      fVar237 = auVar225._0_4_;
                      if ((0.0 <= fVar237) && (fVar237 <= 1.0)) {
                        auVar225 = vrsqrtss_avx(auVar250,auVar250);
                        fVar166 = auVar225._0_4_;
                        pGVar27 = (context->scene->geometries).items[uVar107].ptr;
                        if ((pGVar27->mask & (ray->super_RayK<1>).mask) != 0) {
                          auVar225 = ZEXT416((uint)(fVar166 * 1.5 +
                                                   fVar170 * -0.5 * fVar166 * fVar166 * fVar166));
                          auVar225 = vshufps_avx(auVar225,auVar225,0);
                          auVar226._0_4_ = auVar225._0_4_ * (float)local_940._0_4_;
                          auVar226._4_4_ = auVar225._4_4_ * (float)local_940._4_4_;
                          auVar226._8_4_ = auVar225._8_4_ * fStack_938;
                          auVar226._12_4_ = auVar225._12_4_ * fStack_934;
                          auVar149._0_4_ = auVar384._0_4_ + auVar118._0_4_ * auVar226._0_4_;
                          auVar149._4_4_ = auVar384._4_4_ + auVar118._4_4_ * auVar226._4_4_;
                          auVar149._8_4_ = auVar384._8_4_ + auVar118._8_4_ * auVar226._8_4_;
                          auVar149._12_4_ = auVar384._12_4_ + auVar118._12_4_ * auVar226._12_4_;
                          auVar225 = vshufps_avx(auVar226,auVar226,0xc9);
                          auVar250 = vshufps_avx(auVar384,auVar384,0xc9);
                          auVar227._0_4_ = auVar250._0_4_ * auVar226._0_4_;
                          auVar227._4_4_ = auVar250._4_4_ * auVar226._4_4_;
                          auVar227._8_4_ = auVar250._8_4_ * auVar226._8_4_;
                          auVar227._12_4_ = auVar250._12_4_ * auVar226._12_4_;
                          auVar253._0_4_ = auVar384._0_4_ * auVar225._0_4_;
                          auVar253._4_4_ = auVar384._4_4_ * auVar225._4_4_;
                          auVar253._8_4_ = auVar384._8_4_ * auVar225._8_4_;
                          auVar253._12_4_ = auVar384._12_4_ * auVar225._12_4_;
                          auVar146 = vsubps_avx(auVar253,auVar227);
                          auVar225 = vshufps_avx(auVar146,auVar146,0xc9);
                          auVar250 = vshufps_avx(auVar149,auVar149,0xc9);
                          auVar254._0_4_ = auVar250._0_4_ * auVar225._0_4_;
                          auVar254._4_4_ = auVar250._4_4_ * auVar225._4_4_;
                          auVar254._8_4_ = auVar250._8_4_ * auVar225._8_4_;
                          auVar254._12_4_ = auVar250._12_4_ * auVar225._12_4_;
                          auVar225 = vshufps_avx(auVar146,auVar146,0xd2);
                          auVar150._0_4_ = auVar149._0_4_ * auVar225._0_4_;
                          auVar150._4_4_ = auVar149._4_4_ * auVar225._4_4_;
                          auVar150._8_4_ = auVar149._8_4_ * auVar225._8_4_;
                          auVar150._12_4_ = auVar149._12_4_ * auVar225._12_4_;
                          auVar225 = vsubps_avx(auVar254,auVar150);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar214;
                            auVar250 = vshufps_avx(auVar225,auVar225,0xe9);
                            uVar9 = vmovlps_avx(auVar250);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                            (ray->Ng).field_0.field_0.z = auVar225._0_4_;
                            ray->u = fVar237;
                            ray->v = 0.0;
                            ray->primID = local_8a0._0_4_;
                            ray->geomID = uVar107;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar250 = vshufps_avx(auVar225,auVar225,0xe9);
                            local_8d0 = vmovlps_avx(auVar250);
                            local_8c8 = auVar225._0_4_;
                            local_8c4 = fVar237;
                            local_8c0 = 0;
                            local_8bc = local_8a0._0_4_;
                            local_8b8 = uVar107;
                            local_8b4 = context->user->instID[0];
                            local_8b0 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar214;
                            local_a24 = -1;
                            local_a58.valid = &local_a24;
                            local_a58.geometryUserPtr = pGVar27->userPtr;
                            local_a58.context = context->user;
                            local_a58.hit = (RTCHitN *)&local_8d0;
                            local_a58.N = 1;
                            local_a58.ray = (RTCRayN *)ray;
                            if (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011a13a1:
                              p_Var30 = context->args->filter;
                              if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar395 = ZEXT1664(auVar395._0_16_);
                                (*p_Var30)(&local_a58);
                                if (*local_a58.valid == 0) goto LAB_011a1435;
                              }
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_a58.hit;
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_a58.hit + 4);
                              (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_a58.hit + 8);
                              *(float *)((long)local_a58.ray + 0x3c) =
                                   *(float *)(local_a58.hit + 0xc);
                              *(float *)((long)local_a58.ray + 0x40) =
                                   *(float *)(local_a58.hit + 0x10);
                              *(float *)((long)local_a58.ray + 0x44) =
                                   *(float *)(local_a58.hit + 0x14);
                              *(float *)((long)local_a58.ray + 0x48) =
                                   *(float *)(local_a58.hit + 0x18);
                              *(float *)((long)local_a58.ray + 0x4c) =
                                   *(float *)(local_a58.hit + 0x1c);
                              *(float *)((long)local_a58.ray + 0x50) =
                                   *(float *)(local_a58.hit + 0x20);
                            }
                            else {
                              auVar395 = ZEXT1664(auVar395._0_16_);
                              (*pGVar27->intersectionFilterN)(&local_a58);
                              if (*local_a58.valid != 0) goto LAB_011a13a1;
LAB_011a1435:
                              (ray->super_RayK<1>).tfar = fVar162;
                            }
                            auVar430 = ZEXT3264(_local_a20);
                            auVar406 = ZEXT3264(_local_840);
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar108 = lVar108 + -1;
              } while (lVar108 != 0);
              auVar185 = local_680;
              fVar214 = (ray->super_RayK<1>).tfar;
              auVar131._4_4_ = fVar214;
              auVar131._0_4_ = fVar214;
              auVar131._8_4_ = fVar214;
              auVar131._12_4_ = fVar214;
              auVar131._16_4_ = fVar214;
              auVar131._20_4_ = fVar214;
              auVar131._24_4_ = fVar214;
              auVar131._28_4_ = fVar214;
              auVar124 = vcmpps_avx(_local_6c0,auVar131,2);
              local_680 = vandps_avx(auVar124,local_680);
              auVar185 = auVar185 & auVar124;
            } while ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar185 >> 0x7f,0) != '\0') ||
                       (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar185 >> 0xbf,0) != '\0') ||
                     (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar185[0x1f] < '\0');
          }
          auVar330 = ZEXT3264(_local_4c0);
          auVar124 = vandps_avx(local_560,local_540);
          auVar185 = vandps_avx(_local_700,local_740);
          auVar259._0_4_ = (float)local_6a0._0_4_ + local_480._0_4_;
          auVar259._4_4_ = (float)local_6a0._4_4_ + local_480._4_4_;
          auVar259._8_4_ = fStack_698 + local_480._8_4_;
          auVar259._12_4_ = fStack_694 + local_480._12_4_;
          auVar259._16_4_ = fStack_690 + local_480._16_4_;
          auVar259._20_4_ = fStack_68c + local_480._20_4_;
          auVar259._24_4_ = fStack_688 + local_480._24_4_;
          auVar259._28_4_ = fStack_684 + local_480._28_4_;
          auVar31 = vcmpps_avx(auVar259,auVar131,2);
          auVar124 = vandps_avx(auVar31,auVar124);
          auVar260._0_4_ = local_4c0._0_4_ + (float)local_6a0._0_4_;
          auVar260._4_4_ = local_4c0._4_4_ + (float)local_6a0._4_4_;
          auVar260._8_4_ = local_4c0._8_4_ + fStack_698;
          auVar260._12_4_ = local_4c0._12_4_ + fStack_694;
          auVar260._16_4_ = local_4c0._16_4_ + fStack_690;
          auVar260._20_4_ = local_4c0._20_4_ + fStack_68c;
          auVar260._24_4_ = local_4c0._24_4_ + fStack_688;
          auVar260._28_4_ = local_4c0._28_4_ + fStack_684;
          auVar31 = vcmpps_avx(auVar260,auVar131,2);
          auVar185 = vandps_avx(auVar31,auVar185);
          auVar185 = vorps_avx(auVar124,auVar185);
          if ((((((((auVar185 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar185 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar185 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar185 >> 0x7f,0) != '\0') ||
                (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar185 >> 0xbf,0) != '\0') ||
              (auVar185 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar185[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar112 * 0x60) = auVar185;
            auVar124 = vblendvps_avx(_local_4c0,local_480,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar112 * 0x60) = auVar124;
            uVar9 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar112 * 0xc] = uVar9;
            aiStack_138[uVar112 * 0x18] = local_b0c + 1;
            iVar111 = iVar111 + 1;
          }
        }
      }
    }
    fVar214 = (ray->super_RayK<1>).tfar;
    auVar134._4_4_ = fVar214;
    auVar134._0_4_ = fVar214;
    auVar134._8_4_ = fVar214;
    auVar134._12_4_ = fVar214;
    auVar134._16_4_ = fVar214;
    auVar134._20_4_ = fVar214;
    auVar134._24_4_ = fVar214;
    auVar134._28_4_ = fVar214;
    if (iVar111 == 0) break;
    uVar105 = -iVar111;
    pauVar104 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar111 - 1) * 0x60);
    while( true ) {
      auVar124 = pauVar104[1];
      auVar160._0_4_ = auVar124._0_4_ + (float)local_6a0._0_4_;
      auVar160._4_4_ = auVar124._4_4_ + (float)local_6a0._4_4_;
      auVar160._8_4_ = auVar124._8_4_ + fStack_698;
      auVar160._12_4_ = auVar124._12_4_ + fStack_694;
      auVar160._16_4_ = auVar124._16_4_ + fStack_690;
      auVar160._20_4_ = auVar124._20_4_ + fStack_68c;
      auVar160._24_4_ = auVar124._24_4_ + fStack_688;
      auVar160._28_4_ = auVar124._28_4_ + fStack_684;
      auVar31 = vcmpps_avx(auVar160,auVar134,2);
      auVar185 = vandps_avx(auVar31,*pauVar104);
      local_480 = auVar185;
      auVar31 = *pauVar104 & auVar31;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0x7f,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0xbf,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar31[0x1f] < '\0') break;
      pauVar104 = pauVar104 + -3;
      uVar105 = uVar105 + 1;
      if (uVar105 == 0) goto LAB_011a172a;
    }
    auVar135._8_4_ = 0x7f800000;
    auVar135._0_8_ = 0x7f8000007f800000;
    auVar135._12_4_ = 0x7f800000;
    auVar135._16_4_ = 0x7f800000;
    auVar135._20_4_ = 0x7f800000;
    auVar135._24_4_ = 0x7f800000;
    auVar135._28_4_ = 0x7f800000;
    auVar124 = vblendvps_avx(auVar135,auVar124,auVar185);
    auVar31 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar31 = vminps_avx(auVar124,auVar31);
    auVar32 = vshufpd_avx(auVar31,auVar31,5);
    auVar31 = vminps_avx(auVar31,auVar32);
    auVar32 = vperm2f128_avx(auVar31,auVar31,1);
    auVar31 = vminps_avx(auVar31,auVar32);
    auVar124 = vcmpps_avx(auVar124,auVar31,0);
    auVar31 = auVar185 & auVar124;
    if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0x7f,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar31 >> 0xbf,0) != '\0') ||
        (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar31[0x1f] < '\0')
    {
      auVar185 = vandps_avx(auVar124,auVar185);
    }
    auVar123._8_8_ = 0;
    auVar123._0_8_ = *(ulong *)pauVar104[2];
    local_b0c = *(uint *)(pauVar104[2] + 8);
    uVar106 = vmovmskps_avx(auVar185);
    uVar102 = 0;
    if (uVar106 != 0) {
      for (; (uVar106 >> uVar102 & 1) == 0; uVar102 = uVar102 + 1) {
      }
    }
    *(undefined4 *)(local_480 + (ulong)uVar102 * 4) = 0;
    *pauVar104 = local_480;
    uVar106 = ~uVar105;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar106 = -uVar105;
    }
    uVar112 = (ulong)uVar106;
    auVar225 = vshufps_avx(auVar123,auVar123,0);
    auVar250 = vshufps_avx(auVar123,auVar123,0x55);
    auVar250 = vsubps_avx(auVar250,auVar225);
    local_4c0._4_4_ = auVar225._4_4_ + auVar250._4_4_ * 0.14285715;
    local_4c0._0_4_ = auVar225._0_4_ + auVar250._0_4_ * 0.0;
    fStack_4b8 = auVar225._8_4_ + auVar250._8_4_ * 0.2857143;
    fStack_4b4 = auVar225._12_4_ + auVar250._12_4_ * 0.42857146;
    fStack_4b0 = auVar225._0_4_ + auVar250._0_4_ * 0.5714286;
    fStack_4ac = auVar225._4_4_ + auVar250._4_4_ * 0.71428573;
    fStack_4a8 = auVar225._8_4_ + auVar250._8_4_ * 0.8571429;
    fStack_4a4 = auVar225._12_4_ + auVar250._12_4_;
    local_4d0._8_8_ = 0;
    local_4d0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar102 * 4);
    uVar103 = local_8a0._0_8_;
  } while( true );
LAB_011a172a:
  auVar124 = vcmpps_avx(local_2a0,auVar134,2);
  uVar107 = vmovmskps_avx(auVar124);
  uVar101 = uVar101 - 1 & uVar101 & uVar107;
  if (uVar101 == 0) {
    return;
  }
  goto LAB_0119eafb;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }